

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_a<ncnn::BinaryOp_x86_avx512_functor::binary_op_rpow>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [48];
  undefined1 auVar146 [24];
  undefined1 auVar147 [40];
  undefined1 auVar148 [56];
  undefined1 auVar149 [24];
  undefined1 auVar150 [40];
  undefined1 auVar151 [48];
  undefined1 auVar152 [56];
  int in_ECX;
  float *in_RDX;
  undefined1 (*in_RSI) [64];
  undefined1 (*in_RDI) [64];
  int in_R8D;
  undefined1 auVar153 [64];
  undefined1 auVar154 [64];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  float fVar158;
  float fVar159;
  undefined1 auVar157 [32];
  undefined1 auVar160 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m512 _outp;
  __m512 _b;
  __m512 _a_512;
  __m256 _a_256;
  __m128 _a_128;
  int i;
  float a;
  binary_op_rpow op;
  __m512 pow2n;
  __m512 y_1;
  __mmask16 mask_1;
  __m512 one_1;
  __m512i imm0_1;
  __m512 fx;
  __m512 tmp_1;
  __m512 y;
  __m512 z;
  __m512 tmp;
  __mmask16 mask;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one;
  __m512i imm0;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  undefined1 local_4780 [64];
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_46f0;
  undefined8 uStack_46e8;
  undefined8 local_46d0;
  undefined8 uStack_46c8;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 local_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined8 local_4680;
  undefined8 uStack_4678;
  undefined8 uStack_4670;
  undefined8 uStack_4668;
  undefined8 uStack_4660;
  undefined8 uStack_4658;
  undefined8 uStack_4650;
  undefined8 uStack_4648;
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 uStack_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 local_4590;
  undefined8 uStack_4588;
  int local_457c;
  float local_4578;
  undefined1 local_4571 [5];
  int local_456c;
  float *local_4568;
  undefined1 (*local_4560) [64];
  undefined1 (*local_4550) [64];
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 uStack_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  float *local_44f8;
  undefined1 (*local_44f0) [64];
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  float *local_44a8;
  undefined1 (*local_44a0) [64];
  undefined8 local_4490;
  undefined8 uStack_4488;
  float *local_4478;
  float local_4470;
  float fStack_446c;
  float fStack_4468;
  float fStack_4464;
  float local_4454;
  undefined8 local_4450;
  undefined8 uStack_4448;
  undefined8 local_4440;
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 *local_4418;
  undefined8 *local_4410;
  undefined1 *local_4408;
  undefined8 local_4400;
  undefined8 uStack_43f8;
  undefined8 uStack_43f0;
  undefined8 uStack_43e8;
  undefined8 uStack_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 uStack_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  undefined8 local_4380;
  undefined8 uStack_4378;
  undefined8 uStack_4370;
  undefined8 uStack_4368;
  undefined8 uStack_4360;
  undefined8 uStack_4358;
  undefined8 uStack_4350;
  undefined8 uStack_4348;
  undefined8 local_4340;
  undefined8 uStack_4338;
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined1 local_4300 [64];
  undefined1 local_42c0 [8];
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 uStack_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  ushort local_4242;
  float local_4240 [2];
  float afStack_4238 [2];
  float afStack_4230 [2];
  float afStack_4228 [2];
  float afStack_4220 [2];
  float afStack_4218 [2];
  float afStack_4210 [2];
  float afStack_4208 [2];
  undefined1 local_4200 [64];
  undefined1 local_41c0 [16];
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 uStack_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  undefined1 local_4180 [64];
  undefined1 local_4140 [64];
  float local_4100 [2];
  float afStack_40f8 [2];
  float afStack_40f0 [2];
  float afStack_40e8 [2];
  float afStack_40e0 [2];
  float afStack_40d8 [2];
  float afStack_40d0 [2];
  float afStack_40c8 [2];
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 uStack_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 uStack_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  undefined8 local_4000;
  undefined8 uStack_3ff8;
  undefined8 uStack_3ff0;
  undefined8 uStack_3fe8;
  undefined8 uStack_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 uStack_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  float local_3f80 [2];
  float afStack_3f78 [2];
  float afStack_3f70 [2];
  float afStack_3f68 [2];
  float afStack_3f60 [2];
  float afStack_3f58 [2];
  float afStack_3f50 [2];
  float afStack_3f48 [2];
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 uStack_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  float local_3f00 [2];
  float afStack_3ef8 [2];
  float afStack_3ef0 [2];
  float afStack_3ee8 [2];
  float afStack_3ee0 [2];
  float afStack_3ed8 [2];
  float afStack_3ed0 [2];
  float afStack_3ec8 [2];
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined1 local_3e80 [8];
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 uStack_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined1 local_3e40 [64];
  undefined1 local_3e00 [64];
  ushort local_3d82;
  undefined1 local_3d80 [16];
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined2 local_3d02;
  float local_3d00 [2];
  float afStack_3cf8 [2];
  float afStack_3cf0 [2];
  float afStack_3ce8 [2];
  float afStack_3ce0 [2];
  float afStack_3cd8 [2];
  float afStack_3cd0 [2];
  float afStack_3cc8 [2];
  undefined1 local_3cc0 [64];
  undefined1 local_3c80 [64];
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined8 uStack_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 uStack_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  float local_3bc0 [2];
  float afStack_3bb8 [2];
  float afStack_3bb0 [2];
  float afStack_3ba8 [2];
  float afStack_3ba0 [2];
  float afStack_3b98 [2];
  float afStack_3b90 [2];
  float afStack_3b88 [2];
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 uStack_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  float local_3b40 [2];
  float afStack_3b38 [2];
  float afStack_3b30 [2];
  float afStack_3b28 [2];
  float afStack_3b20 [2];
  float afStack_3b18 [2];
  float afStack_3b10 [2];
  float afStack_3b08 [2];
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 uStack_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 uStack_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 uStack_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 uStack_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 uStack_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 uStack_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  int local_3940 [2];
  int aiStack_3938 [2];
  int aiStack_3930 [2];
  int aiStack_3928 [2];
  int aiStack_3920 [2];
  int aiStack_3918 [2];
  int aiStack_3910 [2];
  int aiStack_3908 [2];
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 uStack_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined8 local_38c0;
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined8 uStack_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  undefined8 local_3880;
  undefined8 uStack_3878;
  undefined8 uStack_3870;
  undefined8 uStack_3868;
  undefined8 uStack_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  undefined8 local_3840;
  undefined8 uStack_3838;
  undefined8 uStack_3830;
  undefined8 uStack_3828;
  undefined8 uStack_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  float local_3800 [2];
  float afStack_37f8 [2];
  float afStack_37f0 [2];
  float afStack_37e8 [2];
  float afStack_37e0 [2];
  float afStack_37d8 [2];
  float afStack_37d0 [2];
  float afStack_37c8 [2];
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 uStack_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 uStack_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  float local_3740 [2];
  float afStack_3738 [2];
  float afStack_3730 [2];
  float afStack_3728 [2];
  float afStack_3720 [2];
  float afStack_3718 [2];
  float afStack_3710 [2];
  float afStack_3708 [2];
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 uStack_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  float local_36c0 [2];
  float afStack_36b8 [2];
  float afStack_36b0 [2];
  float afStack_36a8 [2];
  float afStack_36a0 [2];
  float afStack_3698 [2];
  float afStack_3690 [2];
  float afStack_3688 [2];
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 uStack_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 uStack_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  float local_3600 [2];
  float afStack_35f8 [2];
  float afStack_35f0 [2];
  float afStack_35e8 [2];
  float afStack_35e0 [2];
  float afStack_35d8 [2];
  float afStack_35d0 [2];
  float afStack_35c8 [2];
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 uStack_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 uStack_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  float local_3540 [2];
  float afStack_3538 [2];
  float afStack_3530 [2];
  float afStack_3528 [2];
  float afStack_3520 [2];
  float afStack_3518 [2];
  float afStack_3510 [2];
  float afStack_3508 [2];
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined8 uStack_34e0;
  undefined8 uStack_34d8;
  undefined8 uStack_34d0;
  undefined8 uStack_34c8;
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 uStack_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  float local_3480 [2];
  float afStack_3478 [2];
  float afStack_3470 [2];
  float afStack_3468 [2];
  float afStack_3460 [2];
  float afStack_3458 [2];
  float afStack_3450 [2];
  float afStack_3448 [2];
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 uStack_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 uStack_33f0;
  undefined8 uStack_33e8;
  undefined8 uStack_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  float local_33c0 [2];
  float afStack_33b8 [2];
  float afStack_33b0 [2];
  float afStack_33a8 [2];
  float afStack_33a0 [2];
  float afStack_3398 [2];
  float afStack_3390 [2];
  float afStack_3388 [2];
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined8 uStack_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 uStack_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  float local_3300 [2];
  float afStack_32f8 [2];
  float afStack_32f0 [2];
  float afStack_32e8 [2];
  float afStack_32e0 [2];
  float afStack_32d8 [2];
  float afStack_32d0 [2];
  float afStack_32c8 [2];
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 uStack_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 uStack_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  float local_3240 [2];
  float afStack_3238 [2];
  float afStack_3230 [2];
  float afStack_3228 [2];
  float afStack_3220 [2];
  float afStack_3218 [2];
  float afStack_3210 [2];
  float afStack_3208 [2];
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 uStack_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 uStack_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  float local_3180 [2];
  float afStack_3178 [2];
  float afStack_3170 [2];
  float afStack_3168 [2];
  float afStack_3160 [2];
  float afStack_3158 [2];
  float afStack_3150 [2];
  float afStack_3148 [2];
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 uStack_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  float local_3100 [2];
  float afStack_30f8 [2];
  float afStack_30f0 [2];
  float afStack_30e8 [2];
  float afStack_30e0 [2];
  float afStack_30d8 [2];
  float afStack_30d0 [2];
  float afStack_30c8 [2];
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined8 local_3080;
  undefined8 uStack_3078;
  undefined8 uStack_3070;
  undefined8 uStack_3068;
  undefined8 uStack_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 uStack_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  float local_3000 [2];
  float afStack_2ff8 [2];
  float afStack_2ff0 [2];
  float afStack_2fe8 [2];
  float afStack_2fe0 [2];
  float afStack_2fd8 [2];
  float afStack_2fd0 [2];
  float afStack_2fc8 [2];
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined8 local_2f80;
  undefined8 uStack_2f78;
  undefined8 uStack_2f70;
  undefined8 uStack_2f68;
  undefined8 uStack_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  float local_2f40 [2];
  float afStack_2f38 [2];
  float afStack_2f30 [2];
  float afStack_2f28 [2];
  float afStack_2f20 [2];
  float afStack_2f18 [2];
  float afStack_2f10 [2];
  float afStack_2f08 [2];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined8 uStack_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  float local_2e80 [2];
  float afStack_2e78 [2];
  float afStack_2e70 [2];
  float afStack_2e68 [2];
  float afStack_2e60 [2];
  float afStack_2e58 [2];
  float afStack_2e50 [2];
  float afStack_2e48 [2];
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 uStack_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 uStack_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  float local_2dc0 [2];
  float afStack_2db8 [2];
  float afStack_2db0 [2];
  float afStack_2da8 [2];
  float afStack_2da0 [2];
  float afStack_2d98 [2];
  float afStack_2d90 [2];
  float afStack_2d88 [2];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 uStack_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  float local_2d00 [2];
  float afStack_2cf8 [2];
  float afStack_2cf0 [2];
  float afStack_2ce8 [2];
  float afStack_2ce0 [2];
  float afStack_2cd8 [2];
  float afStack_2cd0 [2];
  float afStack_2cc8 [2];
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 uStack_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  float local_2c80 [2];
  float afStack_2c78 [2];
  float afStack_2c70 [2];
  float afStack_2c68 [2];
  float afStack_2c60 [2];
  float afStack_2c58 [2];
  float afStack_2c50 [2];
  float afStack_2c48 [2];
  float local_2c40 [2];
  float afStack_2c38 [2];
  float afStack_2c30 [2];
  float afStack_2c28 [2];
  float afStack_2c20 [2];
  float afStack_2c18 [2];
  float afStack_2c10 [2];
  float afStack_2c08 [2];
  float local_2c00 [2];
  float afStack_2bf8 [2];
  float afStack_2bf0 [2];
  float afStack_2be8 [2];
  float afStack_2be0 [2];
  float afStack_2bd8 [2];
  float afStack_2bd0 [2];
  float afStack_2bc8 [2];
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 uStack_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  float local_2b80 [2];
  float afStack_2b78 [2];
  float afStack_2b70 [2];
  float afStack_2b68 [2];
  float afStack_2b60 [2];
  float afStack_2b58 [2];
  float afStack_2b50 [2];
  float afStack_2b48 [2];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 uStack_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  ushort local_2ac2;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  float local_2a80 [2];
  float afStack_2a78 [2];
  float afStack_2a70 [2];
  float afStack_2a68 [2];
  float afStack_2a60 [2];
  float afStack_2a58 [2];
  float afStack_2a50 [2];
  float afStack_2a48 [2];
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  float local_2a00 [2];
  float afStack_29f8 [2];
  float afStack_29f0 [2];
  float afStack_29e8 [2];
  float afStack_29e0 [2];
  float afStack_29d8 [2];
  float afStack_29d0 [2];
  float afStack_29c8 [2];
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  ushort local_2942;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  float local_2900 [2];
  float afStack_28f8 [2];
  float afStack_28f0 [2];
  float afStack_28e8 [2];
  float afStack_28e0 [2];
  float afStack_28d8 [2];
  float afStack_28d0 [2];
  float afStack_28c8 [2];
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  float local_2840 [2];
  float afStack_2838 [2];
  float afStack_2830 [2];
  float afStack_2828 [2];
  float afStack_2820 [2];
  float afStack_2818 [2];
  float afStack_2810 [2];
  float afStack_2808 [2];
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  float local_2780 [2];
  float afStack_2778 [2];
  float afStack_2770 [2];
  float afStack_2768 [2];
  float afStack_2760 [2];
  float afStack_2758 [2];
  float afStack_2750 [2];
  float afStack_2748 [2];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  float local_26c0 [2];
  float afStack_26b8 [2];
  float afStack_26b0 [2];
  float afStack_26a8 [2];
  float afStack_26a0 [2];
  float afStack_2698 [2];
  float afStack_2690 [2];
  float afStack_2688 [2];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined1 local_2600 [64];
  undefined1 local_25c0 [64];
  undefined4 local_2544;
  undefined1 local_2540 [64];
  undefined1 local_2500 [64];
  undefined1 local_24c0 [64];
  undefined1 local_2480 [64];
  undefined4 local_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 uStack_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 uStack_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  int local_2380 [2];
  int aiStack_2378 [2];
  int aiStack_2370 [2];
  int aiStack_2368 [2];
  int aiStack_2360 [2];
  int aiStack_2358 [2];
  int aiStack_2350 [2];
  int aiStack_2348 [2];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [64];
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 uStack_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  float local_2280 [2];
  float afStack_2278 [2];
  float afStack_2270 [2];
  float afStack_2268 [2];
  float afStack_2260 [2];
  float afStack_2258 [2];
  float afStack_2250 [2];
  float afStack_2248 [2];
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined1 local_2200 [64];
  undefined1 local_21c0 [64];
  undefined1 local_2180 [64];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  ushort local_2082;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined2 local_1fba;
  undefined8 *local_1fb8;
  undefined8 *local_1fb0;
  undefined1 *local_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [8];
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [32];
  undefined4 local_1ec0;
  undefined4 uStack_1ebc;
  undefined4 uStack_1eb8;
  undefined4 uStack_1eb4;
  undefined4 uStack_1eb0;
  undefined4 uStack_1eac;
  undefined4 uStack_1ea8;
  undefined4 uStack_1ea4;
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [8];
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [8];
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined4 local_1d20;
  undefined4 uStack_1d1c;
  undefined4 uStack_1d18;
  undefined4 uStack_1d14;
  undefined4 uStack_1d10;
  undefined4 uStack_1d0c;
  undefined4 uStack_1d08;
  undefined4 uStack_1d04;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined4 local_1ce0;
  undefined4 uStack_1cdc;
  undefined4 uStack_1cd8;
  undefined4 uStack_1cd4;
  undefined4 uStack_1cd0;
  undefined4 uStack_1ccc;
  undefined4 uStack_1cc8;
  undefined4 uStack_1cc4;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined1 local_1ca0 [8];
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  float local_1c80;
  float fStack_1c7c;
  float fStack_1c78;
  float fStack_1c74;
  float fStack_1c70;
  float fStack_1c6c;
  float fStack_1c68;
  float fStack_1c64;
  undefined1 local_1c60 [32];
  undefined1 local_1c40 [32];
  undefined1 local_1c20 [8];
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined4 local_1be0;
  undefined4 uStack_1bdc;
  undefined4 uStack_1bd8;
  undefined4 uStack_1bd4;
  undefined4 uStack_1bd0;
  undefined4 uStack_1bcc;
  undefined4 uStack_1bc8;
  undefined4 uStack_1bc4;
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [8];
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined1 local_1ac0 [32];
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  ulong uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined4 local_1980;
  undefined4 uStack_197c;
  undefined4 uStack_1978;
  undefined4 uStack_1974;
  undefined4 uStack_1970;
  undefined4 uStack_196c;
  undefined4 uStack_1968;
  undefined4 uStack_1964;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined1 *local_18f8;
  float *local_18f0;
  undefined1 *local_18e8;
  undefined1 *local_18e0;
  float *local_18d8;
  undefined1 *local_18d0;
  float *local_18c8;
  undefined1 *local_18c0;
  undefined1 *local_18b8;
  float *local_18b0;
  undefined1 *local_18a8;
  undefined1 *local_18a0;
  float *local_1898;
  undefined1 *local_1890;
  undefined1 *local_1888;
  float *local_1880;
  undefined1 *local_1878;
  undefined1 *local_1870;
  float *local_1868;
  undefined1 *local_1860;
  undefined1 *local_1858;
  float *local_1850;
  undefined1 *local_1848;
  undefined1 *local_1840;
  float *local_1838;
  undefined1 *local_1830;
  undefined1 *local_1828;
  float *local_1820;
  undefined1 *local_1818;
  undefined1 *local_1810;
  undefined1 *local_1808;
  undefined1 *local_1800;
  undefined1 *local_17f8;
  float *local_17f0;
  undefined1 *local_17e8;
  undefined1 *local_17e0;
  float *local_17d8;
  undefined1 *local_17d0;
  undefined1 *local_17c8;
  float *local_17c0;
  undefined1 *local_17b8;
  undefined1 *local_17b0;
  float *local_17a8;
  undefined1 *local_17a0;
  undefined1 *local_1798;
  float *local_1790;
  undefined1 *local_1788;
  undefined1 *local_1780;
  float *local_1778;
  float *local_1770;
  undefined1 *local_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined4 local_16e0;
  undefined4 uStack_16dc;
  undefined4 uStack_16d8;
  undefined4 uStack_16d4;
  undefined4 uStack_16d0;
  undefined4 uStack_16cc;
  undefined4 uStack_16c8;
  undefined4 uStack_16c4;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined1 *local_1648;
  float *local_1640;
  float *local_1638;
  undefined1 *local_1630;
  float *local_1628;
  undefined1 *local_1620;
  undefined1 *local_1618;
  float *local_1610;
  undefined1 *local_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined4 local_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  float local_1540 [2];
  float afStack_1538 [2];
  float afStack_1530 [2];
  float afStack_1528 [2];
  float local_1520 [2];
  float afStack_1518 [2];
  float afStack_1510 [2];
  float afStack_1508 [2];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  float local_14e0 [2];
  float afStack_14d8 [2];
  float afStack_14d0 [2];
  float afStack_14c8 [2];
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  float local_1480 [2];
  float afStack_1478 [2];
  float afStack_1470 [2];
  float afStack_1468 [2];
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  float local_1420 [2];
  float afStack_1418 [2];
  float afStack_1410 [2];
  float afStack_1408 [2];
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  float local_13c0 [2];
  float afStack_13b8 [2];
  float afStack_13b0 [2];
  float afStack_13a8 [2];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  float local_1360 [2];
  float afStack_1358 [2];
  float afStack_1350 [2];
  float afStack_1348 [2];
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  float local_12a0 [2];
  float afStack_1298 [2];
  float afStack_1290 [2];
  float afStack_1288 [2];
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  float local_1240 [2];
  float afStack_1238 [2];
  float afStack_1230 [2];
  float afStack_1228 [2];
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0 [2];
  float afStack_11d8 [2];
  float afStack_11d0 [2];
  float afStack_11c8 [2];
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  float local_1180 [2];
  float afStack_1178 [2];
  float afStack_1170 [2];
  float afStack_1168 [2];
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  float local_1120 [2];
  float afStack_1118 [2];
  float afStack_1110 [2];
  float afStack_1108 [2];
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  float local_10c0 [2];
  float afStack_10b8 [2];
  float afStack_10b0 [2];
  float afStack_10a8 [2];
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  float local_1060 [2];
  float afStack_1058 [2];
  float afStack_1050 [2];
  float afStack_1048 [2];
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000 [2];
  float afStack_ff8 [2];
  float afStack_ff0 [2];
  float afStack_fe8 [2];
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  ulong uStack_f88;
  float local_f80 [2];
  float afStack_f78 [2];
  float afStack_f70 [2];
  float afStack_f68 [2];
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20 [2];
  float afStack_f18 [2];
  float afStack_f10 [2];
  float afStack_f08 [2];
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0 [2];
  float afStack_eb8 [2];
  float afStack_eb0 [2];
  float afStack_ea8 [2];
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  float local_e60 [2];
  float afStack_e58 [2];
  float afStack_e50 [2];
  float afStack_e48 [2];
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  float local_e00 [2];
  float afStack_df8 [2];
  float afStack_df0 [2];
  float afStack_de8 [2];
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined4 local_d64;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined4 local_d24;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined4 local_ca0;
  undefined4 uStack_c9c;
  undefined4 uStack_c98;
  undefined4 uStack_c94;
  undefined4 uStack_c90;
  undefined4 uStack_c8c;
  undefined4 uStack_c88;
  undefined4 uStack_c84;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined4 local_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 *local_b78;
  undefined8 *local_b70;
  undefined1 *local_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [8];
  undefined8 uStack_b08;
  undefined1 local_b00 [16];
  undefined4 local_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae8;
  undefined4 uStack_ae4;
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [8];
  undefined8 uStack_ac8;
  undefined1 local_ac0 [8];
  undefined8 uStack_ab8;
  undefined1 local_ab0 [8];
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined4 local_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a78;
  undefined4 uStack_a74;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined4 local_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f8;
  undefined4 uStack_9f4;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined4 local_9e0;
  undefined4 uStack_9dc;
  undefined4 uStack_9d8;
  undefined4 uStack_9d4;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [8];
  undefined8 uStack_998;
  float local_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [8];
  undefined8 uStack_958;
  undefined1 local_950 [16];
  undefined4 local_940;
  undefined4 uStack_93c;
  undefined4 uStack_938;
  undefined4 uStack_934;
  undefined1 local_930 [16];
  undefined1 local_920 [8];
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined1 local_8b0 [16];
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined1 local_7f0 [16];
  undefined1 local_7e0 [16];
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined4 local_730;
  undefined4 uStack_72c;
  undefined4 uStack_728;
  undefined4 uStack_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined1 *local_6e8;
  float *local_6e0;
  float *local_6d8;
  undefined1 *local_6d0;
  float *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  float *local_6b0;
  undefined1 *local_6a8;
  undefined1 *local_6a0;
  float *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  float *local_680;
  undefined1 *local_678;
  float *local_670;
  undefined1 *local_668;
  undefined1 *local_660;
  float *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  float *local_640;
  undefined1 *local_638;
  undefined1 *local_630;
  float *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  float *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  float *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  float *local_5e0;
  undefined1 *local_5d8;
  undefined1 *local_5d0;
  float *local_5c8;
  undefined1 *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  undefined1 *local_5a0;
  float *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  float *local_580;
  undefined1 *local_578;
  undefined1 *local_570;
  float *local_568;
  undefined1 *local_560;
  undefined1 *local_558;
  float *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  float *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined4 local_4f4;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  float local_4c0 [2];
  float afStack_4b8 [2];
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  float local_490 [2];
  float afStack_488 [2];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  float local_460 [2];
  float afStack_458 [2];
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410 [2];
  float afStack_408 [2];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  float local_2f0 [2];
  float afStack_2e8 [2];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  float local_2c0 [2];
  float afStack_2b8 [2];
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260 [2];
  float afStack_258 [2];
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_190 [2];
  float afStack_188 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160 [2];
  float afStack_158 [2];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined4 local_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined4 local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined1 (*local_68) [64];
  float *local_60;
  undefined1 *local_58;
  
  local_4578 = *(float *)*in_RDI;
  local_457c = 0;
  if (in_R8D == 4) {
    local_46f0 = *(undefined8 *)*in_RDI;
    uStack_46e8 = *(undefined8 *)(*in_RDI + 8);
  }
  else {
    local_46f0 = CONCAT44(local_4578,local_4578);
    uStack_46e8 = CONCAT44(local_4578,local_4578);
    local_4470 = local_4578;
    fStack_446c = local_4578;
    fStack_4468 = local_4578;
    fStack_4464 = local_4578;
    local_4454 = local_4578;
  }
  local_4590 = local_46f0;
  uStack_4588 = uStack_46e8;
  if (in_R8D == 8) {
    local_4720 = *(undefined8 *)*in_RDI;
    uStack_4718 = *(undefined8 *)(*in_RDI + 8);
    uStack_4710 = *(undefined8 *)(*in_RDI + 0x10);
    uStack_4708 = *(undefined8 *)(*in_RDI + 0x18);
  }
  else {
    local_4450 = local_46f0;
    uStack_4448 = uStack_46e8;
    local_4720 = local_46f0;
    uStack_4718 = uStack_46e8;
    uStack_4710 = local_46f0;
    uStack_4708 = uStack_46e8;
  }
  local_45c0 = local_4720;
  uStack_45b8 = uStack_4718;
  uStack_45b0 = uStack_4710;
  uStack_45a8 = uStack_4708;
  if (in_R8D == 0x10) {
    local_4780 = *in_RDI;
  }
  else {
    local_4440 = local_4720;
    uStack_4438 = uStack_4718;
    uStack_4430 = uStack_4710;
    uStack_4428 = uStack_4708;
    auVar16._8_8_ = uStack_4718;
    auVar16._0_8_ = local_4720;
    auVar16._16_8_ = uStack_4710;
    auVar16._24_8_ = uStack_4708;
    local_4780 = vinsertf64x4_avx512f
                           (ZEXT3264(CONCAT824(uStack_4708,
                                               CONCAT816(uStack_4710,
                                                         CONCAT88(uStack_4718,local_4720)))),auVar16
                            ,1);
  }
  local_4600 = local_4780._0_8_;
  uStack_45f8 = local_4780._8_8_;
  uStack_45f0 = local_4780._16_8_;
  uStack_45e8 = local_4780._24_8_;
  uStack_45e0 = local_4780._32_8_;
  uStack_45d8 = local_4780._40_8_;
  uStack_45d0 = local_4780._48_8_;
  uStack_45c8 = local_4780._56_8_;
  local_4568 = in_RDX;
  local_4560 = in_RSI;
  for (; local_457c + 0xf < in_ECX; local_457c = local_457c + 0x10) {
    local_4550 = local_4560;
    local_4640 = *(undefined8 *)*local_4560;
    uStack_4638 = *(undefined8 *)(*local_4560 + 8);
    uStack_4630 = *(undefined8 *)(*local_4560 + 0x10);
    uStack_4628 = *(undefined8 *)(*local_4560 + 0x18);
    uStack_4620 = *(undefined8 *)(*local_4560 + 0x20);
    uStack_4618 = *(undefined8 *)(*local_4560 + 0x28);
    auVar145 = *(undefined1 (*) [48])*local_4560;
    uStack_4610 = *(undefined8 *)(*local_4560 + 0x30);
    uStack_4608 = *(undefined8 *)(*local_4560 + 0x38);
    local_4408 = local_4571;
    local_4410 = &local_4600;
    local_4418 = &local_4640;
    local_4400 = local_4780._0_8_;
    uStack_43f8 = local_4780._8_8_;
    uStack_43f0 = local_4780._16_8_;
    uStack_43e8 = local_4780._24_8_;
    uStack_43e0 = local_4780._32_8_;
    uStack_43d8 = local_4780._40_8_;
    uStack_43d0 = local_4780._48_8_;
    uStack_43c8 = local_4780._56_8_;
    local_3d00[0] = 1.0;
    local_3d00[1] = 1.0;
    afStack_3cf8[0] = 1.0;
    afStack_3cf8[1] = 1.0;
    afStack_3cf0[0] = 1.0;
    afStack_3cf0[1] = 1.0;
    afStack_3ce8[0] = 1.0;
    afStack_3ce8[1] = 1.0;
    afStack_3ce0[0] = 1.0;
    afStack_3ce0[1] = 1.0;
    afStack_3cd8[0] = 1.0;
    afStack_3cd8[1] = 1.0;
    afStack_3cd0[0] = 1.0;
    afStack_3cd0[1] = 1.0;
    afStack_3cc8[0] = 1.0;
    afStack_3cc8[1] = 1.0;
    local_38c0 = 0;
    uStack_38b8 = 0;
    uStack_38b0 = 0;
    uStack_38a8 = 0;
    uStack_38a0 = 0;
    uStack_3898 = 0;
    uStack_3890 = 0;
    uStack_3888 = 0;
    uVar20 = vcmpps_avx512f(*local_4560,ZEXT1664(ZEXT816(0)),2);
    local_3d02 = (undefined2)uVar20;
    local_3c80._0_8_ = auVar145._0_8_;
    local_3900 = local_3c80._0_8_;
    local_3c80._8_8_ = auVar145._8_8_;
    uStack_38f8 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar145._16_8_;
    uStack_38f0 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar145._24_8_;
    uStack_38e8 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar145._32_8_;
    uStack_38e0 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar145._40_8_;
    uStack_38d8 = local_3c80._40_8_;
    local_3940[0] = 0x800000;
    local_3940[1] = 0x800000;
    aiStack_3938[0] = 0x800000;
    aiStack_3938[1] = 0x800000;
    aiStack_3930[0] = 0x800000;
    aiStack_3930[1] = 0x800000;
    aiStack_3928[0] = 0x800000;
    aiStack_3928[1] = 0x800000;
    aiStack_3920[0] = 0x800000;
    aiStack_3920[1] = 0x800000;
    aiStack_3918[0] = 0x800000;
    aiStack_3918[1] = 0x800000;
    aiStack_3910[0] = 0x800000;
    aiStack_3910[1] = 0x800000;
    aiStack_3908[0] = 0x800000;
    aiStack_3908[1] = 0x800000;
    auVar42._8_4_ = 0x800000;
    auVar42._12_4_ = 0x800000;
    auVar42._0_4_ = 0x800000;
    auVar42._4_4_ = 0x800000;
    auVar42._16_4_ = 0x800000;
    auVar42._20_4_ = 0x800000;
    auVar42._24_4_ = 0x800000;
    auVar42._28_4_ = 0x800000;
    auVar42._32_4_ = 0x800000;
    auVar42._36_4_ = 0x800000;
    auVar42._40_4_ = 0x800000;
    auVar42._44_4_ = 0x800000;
    auVar42._48_4_ = 0x800000;
    auVar42._52_4_ = 0x800000;
    auVar42._56_4_ = 0x800000;
    auVar42._60_4_ = 0x800000;
    auVar153 = vmaxps_avx512f(*local_4560,auVar42);
    local_3c80._0_8_ = auVar153._0_8_;
    local_23c0 = local_3c80._0_8_;
    local_3c80._8_8_ = auVar153._8_8_;
    uStack_23b8 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar153._16_8_;
    uStack_23b0 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar153._24_8_;
    uStack_23a8 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar153._32_8_;
    uStack_23a0 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar153._40_8_;
    uStack_2398 = local_3c80._40_8_;
    local_3c80._48_8_ = auVar153._48_8_;
    uStack_2390 = local_3c80._48_8_;
    local_3c80._56_8_ = auVar153._56_8_;
    uStack_2388 = local_3c80._56_8_;
    local_2400 = local_3c80._0_8_;
    uStack_23f8 = local_3c80._8_8_;
    uStack_23f0 = local_3c80._16_8_;
    uStack_23e8 = local_3c80._24_8_;
    uStack_23e0 = local_3c80._32_8_;
    uStack_23d8 = local_3c80._40_8_;
    uStack_23d0 = local_3c80._48_8_;
    uStack_23c8 = local_3c80._56_8_;
    local_2404 = 0x17;
    auVar154 = vmovdqa64_avx512f(auVar153);
    auVar154 = vpsrld_avx512f(auVar154,ZEXT416(0x17));
    auVar154 = vmovdqa64_avx512f(auVar154);
    local_2340 = local_3c80._0_8_;
    uStack_2338 = local_3c80._8_8_;
    uStack_2330 = local_3c80._16_8_;
    uStack_2328 = local_3c80._24_8_;
    uStack_2320 = local_3c80._32_8_;
    uStack_2318 = local_3c80._40_8_;
    uStack_2310 = local_3c80._48_8_;
    uStack_2308 = local_3c80._56_8_;
    local_2380[0] = -0x7f800001;
    local_2380[1] = -0x7f800001;
    aiStack_2378[0] = -0x7f800001;
    aiStack_2378[1] = -0x7f800001;
    aiStack_2370[0] = -0x7f800001;
    aiStack_2370[1] = -0x7f800001;
    aiStack_2368[0] = -0x7f800001;
    aiStack_2368[1] = -0x7f800001;
    aiStack_2360[0] = -0x7f800001;
    aiStack_2360[1] = -0x7f800001;
    aiStack_2358[0] = -0x7f800001;
    aiStack_2358[1] = -0x7f800001;
    aiStack_2350[0] = -0x7f800001;
    aiStack_2350[1] = -0x7f800001;
    aiStack_2348[0] = -0x7f800001;
    aiStack_2348[1] = -0x7f800001;
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar80._8_4_ = -0x7f800001;
    auVar80._12_4_ = -0x7f800001;
    auVar80._0_4_ = -0x7f800001;
    auVar80._4_4_ = -0x7f800001;
    auVar80._16_4_ = -0x7f800001;
    auVar80._20_4_ = -0x7f800001;
    auVar80._24_4_ = -0x7f800001;
    auVar80._28_4_ = -0x7f800001;
    auVar80._32_4_ = -0x7f800001;
    auVar80._36_4_ = -0x7f800001;
    auVar80._40_4_ = -0x7f800001;
    auVar80._44_4_ = -0x7f800001;
    auVar80._48_4_ = -0x7f800001;
    auVar80._52_4_ = -0x7f800001;
    auVar80._56_4_ = -0x7f800001;
    auVar80._60_4_ = -0x7f800001;
    auVar155 = vmovdqa64_avx512f(auVar80);
    auVar153 = vpandd_avx512f(auVar153,auVar155);
    auVar153 = vmovdqa64_avx512f(auVar153);
    local_3c80._0_8_ = auVar153._0_8_;
    local_2240 = local_3c80._0_8_;
    local_3c80._8_8_ = auVar153._8_8_;
    uStack_2238 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar153._16_8_;
    uStack_2230 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar153._24_8_;
    uStack_2228 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar153._32_8_;
    uStack_2220 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar153._40_8_;
    uStack_2218 = local_3c80._40_8_;
    local_3c80._48_8_ = auVar153._48_8_;
    uStack_2210 = local_3c80._48_8_;
    local_3c80._56_8_ = auVar153._56_8_;
    uStack_2208 = local_3c80._56_8_;
    local_2280[0] = 0.5;
    local_2280[1] = 0.5;
    afStack_2278[0] = 0.5;
    afStack_2278[1] = 0.5;
    afStack_2270[0] = 0.5;
    afStack_2270[1] = 0.5;
    afStack_2268[0] = 0.5;
    afStack_2268[1] = 0.5;
    afStack_2260[0] = 0.5;
    afStack_2260[1] = 0.5;
    afStack_2258[0] = 0.5;
    afStack_2258[1] = 0.5;
    afStack_2250[0] = 0.5;
    afStack_2250[1] = 0.5;
    afStack_2248[0] = 0.5;
    afStack_2248[1] = 0.5;
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar81._8_4_ = 0.5;
    auVar81._12_4_ = 0.5;
    auVar81._0_4_ = 0.5;
    auVar81._4_4_ = 0.5;
    auVar81._16_4_ = 0.5;
    auVar81._20_4_ = 0.5;
    auVar81._24_4_ = 0.5;
    auVar81._28_4_ = 0.5;
    auVar81._32_4_ = 0.5;
    auVar81._36_4_ = 0.5;
    auVar81._40_4_ = 0.5;
    auVar81._44_4_ = 0.5;
    auVar81._48_4_ = 0.5;
    auVar81._52_4_ = 0.5;
    auVar81._56_4_ = 0.5;
    auVar81._60_4_ = 0.5;
    auVar155 = vmovdqa64_avx512f(auVar81);
    auVar153 = vpord_avx512f(auVar153,auVar155);
    auVar153 = vmovdqa64_avx512f(auVar153);
    auVar154 = vmovdqa64_avx512f(auVar154);
    auVar155 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    local_21c0 = vmovdqa64_avx512f(auVar154);
    local_2200 = vmovdqa64_avx512f(auVar155);
    auVar154 = vmovdqa64_avx512f(local_21c0);
    auVar155 = vmovdqa64_avx512f(local_2200);
    auVar154 = vpsubd_avx512f(auVar154,auVar155);
    local_3cc0 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(local_3cc0);
    local_2180 = vmovdqa64_avx512f(auVar154);
    auVar154 = vcvtdq2ps_avx512f(local_2180);
    local_3d80._0_8_ = auVar154._0_8_;
    local_3b80 = local_3d80._0_8_;
    local_3d80._8_8_ = auVar154._8_8_;
    uStack_3b78 = local_3d80._8_8_;
    uStack_3d70 = auVar154._16_8_;
    uStack_3b70 = uStack_3d70;
    uStack_3d68 = auVar154._24_8_;
    uStack_3b68 = uStack_3d68;
    uStack_3d60 = auVar154._32_8_;
    uStack_3b60 = uStack_3d60;
    uStack_3d58 = auVar154._40_8_;
    uStack_3b58 = uStack_3d58;
    uStack_3d50 = auVar154._48_8_;
    uStack_3b50 = uStack_3d50;
    uStack_3d48 = auVar154._56_8_;
    uStack_3b48 = uStack_3d48;
    local_3bc0[0] = 1.0;
    local_3bc0[1] = 1.0;
    afStack_3bb8[0] = 1.0;
    afStack_3bb8[1] = 1.0;
    afStack_3bb0[0] = 1.0;
    afStack_3bb0[1] = 1.0;
    afStack_3ba8[0] = 1.0;
    afStack_3ba8[1] = 1.0;
    afStack_3ba0[0] = 1.0;
    afStack_3ba0[1] = 1.0;
    afStack_3b98[0] = 1.0;
    afStack_3b98[1] = 1.0;
    afStack_3b90[0] = 1.0;
    afStack_3b90[1] = 1.0;
    afStack_3b88[0] = 1.0;
    afStack_3b88[1] = 1.0;
    auVar37._8_4_ = 1.0;
    auVar37._12_4_ = 1.0;
    auVar37._0_4_ = 1.0;
    auVar37._4_4_ = 1.0;
    auVar37._16_4_ = 1.0;
    auVar37._20_4_ = 1.0;
    auVar37._24_4_ = 1.0;
    auVar37._28_4_ = 1.0;
    auVar37._32_4_ = 1.0;
    auVar37._36_4_ = 1.0;
    auVar37._40_4_ = 1.0;
    auVar37._44_4_ = 1.0;
    auVar37._48_4_ = 1.0;
    auVar37._52_4_ = 1.0;
    auVar37._56_4_ = 1.0;
    auVar37._60_4_ = 1.0;
    auVar154 = vaddps_avx512f(auVar154,auVar37);
    uVar21 = vcmpps_avx512f(auVar153,(undefined1  [64])_ps512_cephes_SQRTHF,1);
    local_3d82 = (ushort)uVar21;
    local_3c80._0_8_ = auVar153._0_8_;
    local_3b00 = local_3c80._0_8_;
    local_3c80._8_8_ = auVar153._8_8_;
    uStack_3af8 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar153._16_8_;
    uStack_3af0 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar153._24_8_;
    uStack_3ae8 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar153._32_8_;
    uStack_3ae0 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar153._40_8_;
    uStack_3ad8 = local_3c80._40_8_;
    local_3c80._48_8_ = auVar153._48_8_;
    uStack_3ad0 = local_3c80._48_8_;
    local_3c80._56_8_ = auVar153._56_8_;
    uStack_3ac8 = local_3c80._56_8_;
    local_3b40[0] = 1.0;
    local_3b40[1] = 1.0;
    afStack_3b38[0] = 1.0;
    afStack_3b38[1] = 1.0;
    afStack_3b30[0] = 1.0;
    afStack_3b30[1] = 1.0;
    afStack_3b28[0] = 1.0;
    afStack_3b28[1] = 1.0;
    afStack_3b20[0] = 1.0;
    afStack_3b20[1] = 1.0;
    afStack_3b18[0] = 1.0;
    afStack_3b18[1] = 1.0;
    afStack_3b10[0] = 1.0;
    afStack_3b10[1] = 1.0;
    afStack_3b08[0] = 1.0;
    afStack_3b08[1] = 1.0;
    auVar38._8_4_ = 1.0;
    auVar38._12_4_ = 1.0;
    auVar38._0_4_ = 1.0;
    auVar38._4_4_ = 1.0;
    auVar38._16_4_ = 1.0;
    auVar38._20_4_ = 1.0;
    auVar38._24_4_ = 1.0;
    auVar38._28_4_ = 1.0;
    auVar38._32_4_ = 1.0;
    auVar38._36_4_ = 1.0;
    auVar38._40_4_ = 1.0;
    auVar38._44_4_ = 1.0;
    auVar38._48_4_ = 1.0;
    auVar38._52_4_ = 1.0;
    auVar38._56_4_ = 1.0;
    auVar38._60_4_ = 1.0;
    local_3e00 = vsubps_avx512f(auVar153,auVar38);
    local_3d80._0_8_ = auVar154._0_8_;
    local_2b40 = local_3d80._0_8_;
    local_3d80._8_8_ = auVar154._8_8_;
    uStack_2b38 = local_3d80._8_8_;
    uStack_3d70 = auVar154._16_8_;
    uStack_2b30 = uStack_3d70;
    uStack_3d68 = auVar154._24_8_;
    uStack_2b28 = uStack_3d68;
    uStack_3d60 = auVar154._32_8_;
    uStack_2b20 = uStack_3d60;
    uStack_3d58 = auVar154._40_8_;
    uStack_2b18 = uStack_3d58;
    uStack_3d50 = auVar154._48_8_;
    uStack_2b10 = uStack_3d50;
    uStack_3d48 = auVar154._56_8_;
    uStack_2b08 = uStack_3d48;
    local_2b80[0] = 1.0;
    local_2b80[1] = 1.0;
    afStack_2b78[0] = 1.0;
    afStack_2b78[1] = 1.0;
    afStack_2b70[0] = 1.0;
    afStack_2b70[1] = 1.0;
    afStack_2b68[0] = 1.0;
    afStack_2b68[1] = 1.0;
    afStack_2b60[0] = 1.0;
    afStack_2b60[1] = 1.0;
    afStack_2b58[0] = 1.0;
    afStack_2b58[1] = 1.0;
    afStack_2b50[0] = 1.0;
    afStack_2b50[1] = 1.0;
    afStack_2b48[0] = 1.0;
    afStack_2b48[1] = 1.0;
    local_2a40 = local_3d80._0_8_;
    uStack_2a38 = local_3d80._8_8_;
    uStack_2a30 = uStack_3d70;
    uStack_2a28 = uStack_3d68;
    uStack_2a20 = uStack_3d60;
    uStack_2a18 = uStack_3d58;
    uStack_2a10 = uStack_3d50;
    uStack_2a08 = uStack_3d48;
    local_2a80[0] = 1.0;
    local_2a80[1] = 1.0;
    afStack_2a78[0] = 1.0;
    afStack_2a78[1] = 1.0;
    afStack_2a70[0] = 1.0;
    afStack_2a70[1] = 1.0;
    afStack_2a68[0] = 1.0;
    afStack_2a68[1] = 1.0;
    afStack_2a60[0] = 1.0;
    afStack_2a60[1] = 1.0;
    afStack_2a58[0] = 1.0;
    afStack_2a58[1] = 1.0;
    afStack_2a50[0] = 1.0;
    afStack_2a50[1] = 1.0;
    afStack_2a48[0] = 1.0;
    afStack_2a48[1] = 1.0;
    auVar72._8_4_ = 1.0;
    auVar72._12_4_ = 1.0;
    auVar72._0_4_ = 1.0;
    auVar72._4_4_ = 1.0;
    auVar72._16_4_ = 1.0;
    auVar72._20_4_ = 1.0;
    auVar72._24_4_ = 1.0;
    auVar72._28_4_ = 1.0;
    auVar72._32_4_ = 1.0;
    auVar72._36_4_ = 1.0;
    auVar72._40_4_ = 1.0;
    auVar72._44_4_ = 1.0;
    auVar72._48_4_ = 1.0;
    auVar72._52_4_ = 1.0;
    auVar72._56_4_ = 1.0;
    auVar72._60_4_ = 1.0;
    local_2ac0._0_4_ = auVar154._0_4_;
    local_2ac0._4_4_ = auVar154._4_4_;
    uStack_2ab8._0_4_ = auVar154._8_4_;
    uStack_2ab8._4_4_ = auVar154._12_4_;
    uStack_2ab0._0_4_ = auVar154._16_4_;
    uStack_2ab0._4_4_ = auVar154._20_4_;
    uStack_2aa8._0_4_ = auVar154._24_4_;
    uStack_2aa8._4_4_ = auVar154._28_4_;
    uStack_2aa0._0_4_ = auVar154._32_4_;
    uStack_2aa0._4_4_ = auVar154._36_4_;
    uStack_2a98._0_4_ = auVar154._40_4_;
    uStack_2a98._4_4_ = auVar154._44_4_;
    uStack_2a90._0_4_ = auVar154._48_4_;
    uStack_2a90._4_4_ = auVar154._52_4_;
    uStack_2a88._0_4_ = auVar154._56_4_;
    uStack_2a88._4_4_ = auVar154._60_4_;
    auVar154 = vsubps_avx512f(auVar154,auVar72);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_3d82 >> 1) & 1);
    bVar3 = (bool)((byte)(local_3d82 >> 2) & 1);
    bVar4 = (bool)((byte)(local_3d82 >> 3) & 1);
    bVar5 = (bool)((byte)(local_3d82 >> 4) & 1);
    bVar6 = (bool)((byte)(local_3d82 >> 5) & 1);
    bVar7 = (bool)((byte)(local_3d82 >> 6) & 1);
    bVar8 = (bool)((byte)(local_3d82 >> 7) & 1);
    bVar9 = (byte)((ulong)uVar21 >> 8);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_3d80._4_4_ = (uint)bVar2 * auVar154._4_4_ | (uint)!bVar2 * local_2ac0._4_4_;
    local_3d80._0_4_ = (uint)bVar1 * auVar154._0_4_ | (uint)!bVar1 * (int)local_2ac0;
    local_3d80._8_4_ = (uint)bVar3 * auVar154._8_4_ | (uint)!bVar3 * (int)uStack_2ab8;
    local_3d80._12_4_ = (uint)bVar4 * auVar154._12_4_ | (uint)!bVar4 * uStack_2ab8._4_4_;
    uStack_3d70._0_4_ = (uint)bVar5 * auVar154._16_4_ | (uint)!bVar5 * (int)uStack_2ab0;
    uStack_3d70._4_4_ = (uint)bVar6 * auVar154._20_4_ | (uint)!bVar6 * uStack_2ab0._4_4_;
    auVar146 = _local_3d80;
    uStack_3d68._0_4_ = (uint)bVar7 * auVar154._24_4_ | (uint)!bVar7 * (int)uStack_2aa8;
    uStack_3d68._4_4_ = (uint)bVar8 * auVar154._28_4_ | (uint)!bVar8 * uStack_2aa8._4_4_;
    auVar16 = _local_3d80;
    uStack_3d60._0_4_ =
         (uint)(bVar9 & 1) * auVar154._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2aa0;
    uStack_3d60._4_4_ = (uint)bVar10 * auVar154._36_4_ | (uint)!bVar10 * uStack_2aa0._4_4_;
    auVar147 = _local_3d80;
    uStack_3d58._0_4_ = (uint)bVar11 * auVar154._40_4_ | (uint)!bVar11 * (int)uStack_2a98;
    uStack_3d58._4_4_ = (uint)bVar12 * auVar154._44_4_ | (uint)!bVar12 * uStack_2a98._4_4_;
    auVar145 = _local_3d80;
    uStack_3d50._0_4_ = (uint)bVar13 * auVar154._48_4_ | (uint)!bVar13 * (int)uStack_2a90;
    uStack_3d50._4_4_ = (uint)bVar14 * auVar154._52_4_ | (uint)!bVar14 * uStack_2a90._4_4_;
    auVar148 = _local_3d80;
    uStack_3d48._0_4_ = (uint)bVar15 * auVar154._56_4_ | (uint)!bVar15 * (int)uStack_2a88;
    uStack_3d48._4_4_ =
         (uint)(bVar9 >> 7) * auVar154._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2a88._4_4_;
    auVar37 = _local_3d80;
    local_2100 = local_3e00._0_8_;
    uStack_20f8 = local_3e00._8_8_;
    uStack_20f0 = local_3e00._16_8_;
    uStack_20e8 = local_3e00._24_8_;
    uStack_20e0 = local_3e00._32_8_;
    uStack_20d8 = local_3e00._40_8_;
    uStack_20d0 = local_3e00._48_8_;
    uStack_20c8 = local_3e00._56_8_;
    local_2140 = local_3c80._0_8_;
    uStack_2138 = local_3c80._8_8_;
    uStack_2130 = local_3c80._16_8_;
    uStack_2128 = local_3c80._24_8_;
    uStack_2120 = local_3c80._32_8_;
    uStack_2118 = local_3c80._40_8_;
    uStack_2110 = local_3c80._48_8_;
    uStack_2108 = local_3c80._56_8_;
    local_2000 = local_3e00._0_8_;
    uStack_1ff8 = local_3e00._8_8_;
    uStack_1ff0 = local_3e00._16_8_;
    uStack_1fe8 = local_3e00._24_8_;
    uStack_1fe0 = local_3e00._32_8_;
    uStack_1fd8 = local_3e00._40_8_;
    uStack_1fd0 = local_3e00._48_8_;
    uStack_1fc8 = local_3e00._56_8_;
    local_2040 = local_3c80._0_8_;
    uStack_2038 = local_3c80._8_8_;
    uStack_2030 = local_3c80._16_8_;
    uStack_2028 = local_3c80._24_8_;
    uStack_2020 = local_3c80._32_8_;
    uStack_2018 = local_3c80._40_8_;
    uStack_2010 = local_3c80._48_8_;
    uStack_2008 = local_3c80._56_8_;
    local_2080._0_4_ = local_3e00._0_4_;
    local_2080._4_4_ = local_3e00._4_4_;
    uStack_2078._0_4_ = local_3e00._8_4_;
    uStack_2078._4_4_ = local_3e00._12_4_;
    uStack_2070._0_4_ = local_3e00._16_4_;
    uStack_2070._4_4_ = local_3e00._20_4_;
    uStack_2068._0_4_ = local_3e00._24_4_;
    uStack_2068._4_4_ = local_3e00._28_4_;
    uStack_2060._0_4_ = local_3e00._32_4_;
    uStack_2060._4_4_ = local_3e00._36_4_;
    uStack_2058._0_4_ = local_3e00._40_4_;
    uStack_2058._4_4_ = local_3e00._44_4_;
    uStack_2050._0_4_ = local_3e00._48_4_;
    uStack_2050._4_4_ = local_3e00._52_4_;
    uStack_2048._0_4_ = local_3e00._56_4_;
    uStack_2048._4_4_ = local_3e00._60_4_;
    auVar154 = vaddps_avx512f(local_3e00,auVar153);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_3d82 >> 1) & 1);
    bVar3 = (bool)((byte)(local_3d82 >> 2) & 1);
    bVar4 = (bool)((byte)(local_3d82 >> 3) & 1);
    bVar5 = (bool)((byte)(local_3d82 >> 4) & 1);
    bVar6 = (bool)((byte)(local_3d82 >> 5) & 1);
    bVar7 = (bool)((byte)(local_3d82 >> 6) & 1);
    bVar8 = (bool)((byte)(local_3d82 >> 7) & 1);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_3c80._4_4_ = (uint)bVar2 * auVar154._4_4_ | (uint)!bVar2 * local_2080._4_4_;
    local_3c80._0_4_ = (uint)bVar1 * auVar154._0_4_ | (uint)!bVar1 * (int)local_2080;
    local_3c80._8_4_ = (uint)bVar3 * auVar154._8_4_ | (uint)!bVar3 * (int)uStack_2078;
    local_3c80._12_4_ = (uint)bVar4 * auVar154._12_4_ | (uint)!bVar4 * uStack_2078._4_4_;
    local_3c80._16_4_ = (uint)bVar5 * auVar154._16_4_ | (uint)!bVar5 * (int)uStack_2070;
    local_3c80._20_4_ = (uint)bVar6 * auVar154._20_4_ | (uint)!bVar6 * uStack_2070._4_4_;
    auVar149 = local_3c80._0_24_;
    local_3c80._24_4_ = (uint)bVar7 * auVar154._24_4_ | (uint)!bVar7 * (int)uStack_2068;
    local_3c80._28_4_ = (uint)bVar8 * auVar154._28_4_ | (uint)!bVar8 * uStack_2068._4_4_;
    auVar18 = local_3c80._0_32_;
    local_3c80._32_4_ =
         (uint)(bVar9 & 1) * auVar154._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2060;
    local_3c80._36_4_ = (uint)bVar10 * auVar154._36_4_ | (uint)!bVar10 * uStack_2060._4_4_;
    auVar150 = local_3c80._0_40_;
    local_3c80._40_4_ = (uint)bVar11 * auVar154._40_4_ | (uint)!bVar11 * (int)uStack_2058;
    local_3c80._44_4_ = (uint)bVar12 * auVar154._44_4_ | (uint)!bVar12 * uStack_2058._4_4_;
    auVar151 = local_3c80._0_48_;
    local_3c80._48_4_ = (uint)bVar13 * auVar154._48_4_ | (uint)!bVar13 * (int)uStack_2050;
    local_3c80._52_4_ = (uint)bVar14 * auVar154._52_4_ | (uint)!bVar14 * uStack_2050._4_4_;
    auVar152 = local_3c80._0_56_;
    local_3c80._56_4_ = (uint)bVar15 * auVar154._56_4_ | (uint)!bVar15 * (int)uStack_2048;
    local_3c80._60_4_ =
         (uint)(bVar9 >> 7) * auVar154._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2048._4_4_;
    auVar154 = local_3c80;
    local_39c0 = local_3c80._0_8_;
    uStack_39b8 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar149._16_8_;
    uStack_39b0 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar18._24_8_;
    uStack_39a8 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar150._32_8_;
    uStack_39a0 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar151._40_8_;
    uStack_3998 = local_3c80._40_8_;
    local_3c80._48_8_ = auVar152._48_8_;
    uStack_3990 = local_3c80._48_8_;
    local_3c80._56_8_ = auVar154._56_8_;
    uStack_3988 = local_3c80._56_8_;
    auVar41._16_8_ = local_3c80._16_8_;
    auVar41._0_16_ = local_3c80._0_16_;
    auVar41._24_8_ = local_3c80._24_8_;
    auVar41._32_8_ = local_3c80._32_8_;
    auVar41._40_8_ = local_3c80._40_8_;
    auVar41._48_8_ = local_3c80._48_8_;
    auVar41._56_8_ = local_3c80._56_8_;
    auVar40._16_8_ = local_3c80._16_8_;
    auVar40._0_16_ = local_3c80._0_16_;
    auVar40._24_8_ = local_3c80._24_8_;
    auVar40._32_8_ = local_3c80._32_8_;
    auVar40._40_8_ = local_3c80._40_8_;
    auVar40._48_8_ = local_3c80._48_8_;
    auVar40._56_8_ = local_3c80._56_8_;
    local_3e40 = vmulps_avx512f(auVar41,auVar40);
    uStack_3e78._0_4_ = 0.070376836;
    uStack_3e78._4_4_ = 0.070376836;
    local_3e80._0_4_ = 0.070376836;
    local_3e80._4_4_ = 0.070376836;
    local_3100[0] = 0.070376836;
    local_3100[1] = 0.070376836;
    afStack_30f8[0] = 0.070376836;
    afStack_30f8[1] = 0.070376836;
    afStack_30f0[0] = 0.070376836;
    afStack_30f0[1] = 0.070376836;
    afStack_30e8[0] = 0.070376836;
    afStack_30e8[1] = 0.070376836;
    afStack_30e0[0] = 0.070376836;
    afStack_30e0[1] = 0.070376836;
    afStack_30d8[0] = 0.070376836;
    afStack_30d8[1] = 0.070376836;
    afStack_30d0[0] = 0.070376836;
    afStack_30d0[1] = 0.070376836;
    afStack_30c8[0] = 0.070376836;
    afStack_30c8[1] = 0.070376836;
    local_3140 = local_3c80._0_8_;
    uStack_3138 = local_3c80._8_8_;
    uStack_3130 = local_3c80._16_8_;
    uStack_3128 = local_3c80._24_8_;
    uStack_3120 = local_3c80._32_8_;
    uStack_3118 = local_3c80._40_8_;
    uStack_3110 = local_3c80._48_8_;
    uStack_3108 = local_3c80._56_8_;
    local_3180[0] = -0.1151461;
    local_3180[1] = -0.1151461;
    afStack_3178[0] = -0.1151461;
    afStack_3178[1] = -0.1151461;
    afStack_3170[0] = -0.1151461;
    afStack_3170[1] = -0.1151461;
    afStack_3168[0] = -0.1151461;
    afStack_3168[1] = -0.1151461;
    afStack_3160[0] = -0.1151461;
    afStack_3160[1] = -0.1151461;
    afStack_3158[0] = -0.1151461;
    afStack_3158[1] = -0.1151461;
    afStack_3150[0] = -0.1151461;
    afStack_3150[1] = -0.1151461;
    afStack_3148[0] = -0.1151461;
    afStack_3148[1] = -0.1151461;
    auVar63._16_4_ = 0.070376836;
    auVar63._20_4_ = 0.070376836;
    auVar63._0_16_ = _local_3e80;
    auVar63._24_4_ = 0.070376836;
    auVar63._28_4_ = 0.070376836;
    auVar63._32_4_ = 0.070376836;
    auVar63._36_4_ = 0.070376836;
    auVar63._40_4_ = 0.070376836;
    auVar63._44_4_ = 0.070376836;
    auVar63._48_4_ = 0.070376836;
    auVar63._52_4_ = 0.070376836;
    auVar63._56_4_ = 0.070376836;
    auVar63._60_4_ = 0.070376836;
    auVar62._16_8_ = local_3c80._16_8_;
    auVar62._0_16_ = local_3c80._0_16_;
    auVar62._24_8_ = local_3c80._24_8_;
    auVar62._32_8_ = local_3c80._32_8_;
    auVar62._40_8_ = local_3c80._40_8_;
    auVar62._48_8_ = local_3c80._48_8_;
    auVar62._56_8_ = local_3c80._56_8_;
    auVar61._8_4_ = -0.1151461;
    auVar61._12_4_ = -0.1151461;
    auVar61._0_4_ = -0.1151461;
    auVar61._4_4_ = -0.1151461;
    auVar61._16_4_ = -0.1151461;
    auVar61._20_4_ = -0.1151461;
    auVar61._24_4_ = -0.1151461;
    auVar61._28_4_ = -0.1151461;
    auVar61._32_4_ = -0.1151461;
    auVar61._36_4_ = -0.1151461;
    auVar61._40_4_ = -0.1151461;
    auVar61._44_4_ = -0.1151461;
    auVar61._48_4_ = -0.1151461;
    auVar61._52_4_ = -0.1151461;
    auVar61._56_4_ = -0.1151461;
    auVar61._60_4_ = -0.1151461;
    auVar154 = vfmadd213ps_avx512f(auVar62,auVar63,auVar61);
    local_3e80 = auVar154._0_8_;
    local_31c0 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_31b8 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_31b0 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_31a8 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_31a0 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3198 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3190 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3188 = uStack_3e48;
    local_3200 = local_3c80._0_8_;
    uStack_31f8 = local_3c80._8_8_;
    uStack_31f0 = local_3c80._16_8_;
    uStack_31e8 = local_3c80._24_8_;
    uStack_31e0 = local_3c80._32_8_;
    uStack_31d8 = local_3c80._40_8_;
    uStack_31d0 = local_3c80._48_8_;
    uStack_31c8 = local_3c80._56_8_;
    local_3240[0] = 0.116769984;
    local_3240[1] = 0.116769984;
    afStack_3238[0] = 0.116769984;
    afStack_3238[1] = 0.116769984;
    afStack_3230[0] = 0.116769984;
    afStack_3230[1] = 0.116769984;
    afStack_3228[0] = 0.116769984;
    afStack_3228[1] = 0.116769984;
    afStack_3220[0] = 0.116769984;
    afStack_3220[1] = 0.116769984;
    afStack_3218[0] = 0.116769984;
    afStack_3218[1] = 0.116769984;
    afStack_3210[0] = 0.116769984;
    afStack_3210[1] = 0.116769984;
    afStack_3208[0] = 0.116769984;
    afStack_3208[1] = 0.116769984;
    auVar60._16_8_ = local_3c80._16_8_;
    auVar60._0_16_ = local_3c80._0_16_;
    auVar60._24_8_ = local_3c80._24_8_;
    auVar60._32_8_ = local_3c80._32_8_;
    auVar60._40_8_ = local_3c80._40_8_;
    auVar60._48_8_ = local_3c80._48_8_;
    auVar60._56_8_ = local_3c80._56_8_;
    auVar59._8_4_ = 0.116769984;
    auVar59._12_4_ = 0.116769984;
    auVar59._0_4_ = 0.116769984;
    auVar59._4_4_ = 0.116769984;
    auVar59._16_4_ = 0.116769984;
    auVar59._20_4_ = 0.116769984;
    auVar59._24_4_ = 0.116769984;
    auVar59._28_4_ = 0.116769984;
    auVar59._32_4_ = 0.116769984;
    auVar59._36_4_ = 0.116769984;
    auVar59._40_4_ = 0.116769984;
    auVar59._44_4_ = 0.116769984;
    auVar59._48_4_ = 0.116769984;
    auVar59._52_4_ = 0.116769984;
    auVar59._56_4_ = 0.116769984;
    auVar59._60_4_ = 0.116769984;
    auVar154 = vfmadd213ps_avx512f(auVar60,auVar154,auVar59);
    local_3e80 = auVar154._0_8_;
    local_3280 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3278 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3270 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3268 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3260 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3258 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3250 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3248 = uStack_3e48;
    local_32c0 = local_3c80._0_8_;
    uStack_32b8 = local_3c80._8_8_;
    uStack_32b0 = local_3c80._16_8_;
    uStack_32a8 = local_3c80._24_8_;
    uStack_32a0 = local_3c80._32_8_;
    uStack_3298 = local_3c80._40_8_;
    uStack_3290 = local_3c80._48_8_;
    uStack_3288 = local_3c80._56_8_;
    local_3300[0] = -0.12420141;
    local_3300[1] = -0.12420141;
    afStack_32f8[0] = -0.12420141;
    afStack_32f8[1] = -0.12420141;
    afStack_32f0[0] = -0.12420141;
    afStack_32f0[1] = -0.12420141;
    afStack_32e8[0] = -0.12420141;
    afStack_32e8[1] = -0.12420141;
    afStack_32e0[0] = -0.12420141;
    afStack_32e0[1] = -0.12420141;
    afStack_32d8[0] = -0.12420141;
    afStack_32d8[1] = -0.12420141;
    afStack_32d0[0] = -0.12420141;
    afStack_32d0[1] = -0.12420141;
    afStack_32c8[0] = -0.12420141;
    afStack_32c8[1] = -0.12420141;
    auVar58._16_8_ = local_3c80._16_8_;
    auVar58._0_16_ = local_3c80._0_16_;
    auVar58._24_8_ = local_3c80._24_8_;
    auVar58._32_8_ = local_3c80._32_8_;
    auVar58._40_8_ = local_3c80._40_8_;
    auVar58._48_8_ = local_3c80._48_8_;
    auVar58._56_8_ = local_3c80._56_8_;
    auVar57._8_4_ = -0.12420141;
    auVar57._12_4_ = -0.12420141;
    auVar57._0_4_ = -0.12420141;
    auVar57._4_4_ = -0.12420141;
    auVar57._16_4_ = -0.12420141;
    auVar57._20_4_ = -0.12420141;
    auVar57._24_4_ = -0.12420141;
    auVar57._28_4_ = -0.12420141;
    auVar57._32_4_ = -0.12420141;
    auVar57._36_4_ = -0.12420141;
    auVar57._40_4_ = -0.12420141;
    auVar57._44_4_ = -0.12420141;
    auVar57._48_4_ = -0.12420141;
    auVar57._52_4_ = -0.12420141;
    auVar57._56_4_ = -0.12420141;
    auVar57._60_4_ = -0.12420141;
    auVar154 = vfmadd213ps_avx512f(auVar58,auVar154,auVar57);
    local_3e80 = auVar154._0_8_;
    local_3340 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3338 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3330 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3328 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3320 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3318 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3310 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3308 = uStack_3e48;
    local_3380 = local_3c80._0_8_;
    uStack_3378 = local_3c80._8_8_;
    uStack_3370 = local_3c80._16_8_;
    uStack_3368 = local_3c80._24_8_;
    uStack_3360 = local_3c80._32_8_;
    uStack_3358 = local_3c80._40_8_;
    uStack_3350 = local_3c80._48_8_;
    uStack_3348 = local_3c80._56_8_;
    local_33c0[0] = 0.14249323;
    local_33c0[1] = 0.14249323;
    afStack_33b8[0] = 0.14249323;
    afStack_33b8[1] = 0.14249323;
    afStack_33b0[0] = 0.14249323;
    afStack_33b0[1] = 0.14249323;
    afStack_33a8[0] = 0.14249323;
    afStack_33a8[1] = 0.14249323;
    afStack_33a0[0] = 0.14249323;
    afStack_33a0[1] = 0.14249323;
    afStack_3398[0] = 0.14249323;
    afStack_3398[1] = 0.14249323;
    afStack_3390[0] = 0.14249323;
    afStack_3390[1] = 0.14249323;
    afStack_3388[0] = 0.14249323;
    afStack_3388[1] = 0.14249323;
    auVar56._16_8_ = local_3c80._16_8_;
    auVar56._0_16_ = local_3c80._0_16_;
    auVar56._24_8_ = local_3c80._24_8_;
    auVar56._32_8_ = local_3c80._32_8_;
    auVar56._40_8_ = local_3c80._40_8_;
    auVar56._48_8_ = local_3c80._48_8_;
    auVar56._56_8_ = local_3c80._56_8_;
    auVar55._8_4_ = 0.14249323;
    auVar55._12_4_ = 0.14249323;
    auVar55._0_4_ = 0.14249323;
    auVar55._4_4_ = 0.14249323;
    auVar55._16_4_ = 0.14249323;
    auVar55._20_4_ = 0.14249323;
    auVar55._24_4_ = 0.14249323;
    auVar55._28_4_ = 0.14249323;
    auVar55._32_4_ = 0.14249323;
    auVar55._36_4_ = 0.14249323;
    auVar55._40_4_ = 0.14249323;
    auVar55._44_4_ = 0.14249323;
    auVar55._48_4_ = 0.14249323;
    auVar55._52_4_ = 0.14249323;
    auVar55._56_4_ = 0.14249323;
    auVar55._60_4_ = 0.14249323;
    auVar154 = vfmadd213ps_avx512f(auVar56,auVar154,auVar55);
    local_3e80 = auVar154._0_8_;
    local_3400 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_33f8 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_33f0 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_33e8 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_33e0 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_33d8 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_33d0 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_33c8 = uStack_3e48;
    local_3440 = local_3c80._0_8_;
    uStack_3438 = local_3c80._8_8_;
    uStack_3430 = local_3c80._16_8_;
    uStack_3428 = local_3c80._24_8_;
    uStack_3420 = local_3c80._32_8_;
    uStack_3418 = local_3c80._40_8_;
    uStack_3410 = local_3c80._48_8_;
    uStack_3408 = local_3c80._56_8_;
    local_3480[0] = -0.16668057;
    local_3480[1] = -0.16668057;
    afStack_3478[0] = -0.16668057;
    afStack_3478[1] = -0.16668057;
    afStack_3470[0] = -0.16668057;
    afStack_3470[1] = -0.16668057;
    afStack_3468[0] = -0.16668057;
    afStack_3468[1] = -0.16668057;
    afStack_3460[0] = -0.16668057;
    afStack_3460[1] = -0.16668057;
    afStack_3458[0] = -0.16668057;
    afStack_3458[1] = -0.16668057;
    afStack_3450[0] = -0.16668057;
    afStack_3450[1] = -0.16668057;
    afStack_3448[0] = -0.16668057;
    afStack_3448[1] = -0.16668057;
    auVar54._16_8_ = local_3c80._16_8_;
    auVar54._0_16_ = local_3c80._0_16_;
    auVar54._24_8_ = local_3c80._24_8_;
    auVar54._32_8_ = local_3c80._32_8_;
    auVar54._40_8_ = local_3c80._40_8_;
    auVar54._48_8_ = local_3c80._48_8_;
    auVar54._56_8_ = local_3c80._56_8_;
    auVar53._8_4_ = -0.16668057;
    auVar53._12_4_ = -0.16668057;
    auVar53._0_4_ = -0.16668057;
    auVar53._4_4_ = -0.16668057;
    auVar53._16_4_ = -0.16668057;
    auVar53._20_4_ = -0.16668057;
    auVar53._24_4_ = -0.16668057;
    auVar53._28_4_ = -0.16668057;
    auVar53._32_4_ = -0.16668057;
    auVar53._36_4_ = -0.16668057;
    auVar53._40_4_ = -0.16668057;
    auVar53._44_4_ = -0.16668057;
    auVar53._48_4_ = -0.16668057;
    auVar53._52_4_ = -0.16668057;
    auVar53._56_4_ = -0.16668057;
    auVar53._60_4_ = -0.16668057;
    auVar154 = vfmadd213ps_avx512f(auVar54,auVar154,auVar53);
    local_3e80 = auVar154._0_8_;
    local_34c0 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_34b8 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_34b0 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_34a8 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_34a0 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3498 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3490 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3488 = uStack_3e48;
    local_3500 = local_3c80._0_8_;
    uStack_34f8 = local_3c80._8_8_;
    uStack_34f0 = local_3c80._16_8_;
    uStack_34e8 = local_3c80._24_8_;
    uStack_34e0 = local_3c80._32_8_;
    uStack_34d8 = local_3c80._40_8_;
    uStack_34d0 = local_3c80._48_8_;
    uStack_34c8 = local_3c80._56_8_;
    local_3540[0] = 0.20000714;
    local_3540[1] = 0.20000714;
    afStack_3538[0] = 0.20000714;
    afStack_3538[1] = 0.20000714;
    afStack_3530[0] = 0.20000714;
    afStack_3530[1] = 0.20000714;
    afStack_3528[0] = 0.20000714;
    afStack_3528[1] = 0.20000714;
    afStack_3520[0] = 0.20000714;
    afStack_3520[1] = 0.20000714;
    afStack_3518[0] = 0.20000714;
    afStack_3518[1] = 0.20000714;
    afStack_3510[0] = 0.20000714;
    afStack_3510[1] = 0.20000714;
    afStack_3508[0] = 0.20000714;
    afStack_3508[1] = 0.20000714;
    auVar52._16_8_ = local_3c80._16_8_;
    auVar52._0_16_ = local_3c80._0_16_;
    auVar52._24_8_ = local_3c80._24_8_;
    auVar52._32_8_ = local_3c80._32_8_;
    auVar52._40_8_ = local_3c80._40_8_;
    auVar52._48_8_ = local_3c80._48_8_;
    auVar52._56_8_ = local_3c80._56_8_;
    auVar51._8_4_ = 0.20000714;
    auVar51._12_4_ = 0.20000714;
    auVar51._0_4_ = 0.20000714;
    auVar51._4_4_ = 0.20000714;
    auVar51._16_4_ = 0.20000714;
    auVar51._20_4_ = 0.20000714;
    auVar51._24_4_ = 0.20000714;
    auVar51._28_4_ = 0.20000714;
    auVar51._32_4_ = 0.20000714;
    auVar51._36_4_ = 0.20000714;
    auVar51._40_4_ = 0.20000714;
    auVar51._44_4_ = 0.20000714;
    auVar51._48_4_ = 0.20000714;
    auVar51._52_4_ = 0.20000714;
    auVar51._56_4_ = 0.20000714;
    auVar51._60_4_ = 0.20000714;
    auVar154 = vfmadd213ps_avx512f(auVar52,auVar154,auVar51);
    local_3e80 = auVar154._0_8_;
    local_3580 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3578 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3570 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3568 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3560 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3558 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3550 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3548 = uStack_3e48;
    local_35c0 = local_3c80._0_8_;
    uStack_35b8 = local_3c80._8_8_;
    uStack_35b0 = local_3c80._16_8_;
    uStack_35a8 = local_3c80._24_8_;
    uStack_35a0 = local_3c80._32_8_;
    uStack_3598 = local_3c80._40_8_;
    uStack_3590 = local_3c80._48_8_;
    uStack_3588 = local_3c80._56_8_;
    local_3600[0] = -0.24999994;
    local_3600[1] = -0.24999994;
    afStack_35f8[0] = -0.24999994;
    afStack_35f8[1] = -0.24999994;
    afStack_35f0[0] = -0.24999994;
    afStack_35f0[1] = -0.24999994;
    afStack_35e8[0] = -0.24999994;
    afStack_35e8[1] = -0.24999994;
    afStack_35e0[0] = -0.24999994;
    afStack_35e0[1] = -0.24999994;
    afStack_35d8[0] = -0.24999994;
    afStack_35d8[1] = -0.24999994;
    afStack_35d0[0] = -0.24999994;
    afStack_35d0[1] = -0.24999994;
    afStack_35c8[0] = -0.24999994;
    afStack_35c8[1] = -0.24999994;
    auVar50._16_8_ = local_3c80._16_8_;
    auVar50._0_16_ = local_3c80._0_16_;
    auVar50._24_8_ = local_3c80._24_8_;
    auVar50._32_8_ = local_3c80._32_8_;
    auVar50._40_8_ = local_3c80._40_8_;
    auVar50._48_8_ = local_3c80._48_8_;
    auVar50._56_8_ = local_3c80._56_8_;
    auVar49._8_4_ = -0.24999994;
    auVar49._12_4_ = -0.24999994;
    auVar49._0_4_ = -0.24999994;
    auVar49._4_4_ = -0.24999994;
    auVar49._16_4_ = -0.24999994;
    auVar49._20_4_ = -0.24999994;
    auVar49._24_4_ = -0.24999994;
    auVar49._28_4_ = -0.24999994;
    auVar49._32_4_ = -0.24999994;
    auVar49._36_4_ = -0.24999994;
    auVar49._40_4_ = -0.24999994;
    auVar49._44_4_ = -0.24999994;
    auVar49._48_4_ = -0.24999994;
    auVar49._52_4_ = -0.24999994;
    auVar49._56_4_ = -0.24999994;
    auVar49._60_4_ = -0.24999994;
    auVar154 = vfmadd213ps_avx512f(auVar50,auVar154,auVar49);
    local_3e80 = auVar154._0_8_;
    local_3640 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3638 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3630 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3628 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3620 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3618 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3610 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3608 = uStack_3e48;
    local_3680 = local_3c80._0_8_;
    uStack_3678 = local_3c80._8_8_;
    uStack_3670 = local_3c80._16_8_;
    uStack_3668 = local_3c80._24_8_;
    uStack_3660 = local_3c80._32_8_;
    uStack_3658 = local_3c80._40_8_;
    uStack_3650 = local_3c80._48_8_;
    uStack_3648 = local_3c80._56_8_;
    local_36c0[0] = 0.3333333;
    local_36c0[1] = 0.3333333;
    afStack_36b8[0] = 0.3333333;
    afStack_36b8[1] = 0.3333333;
    afStack_36b0[0] = 0.3333333;
    afStack_36b0[1] = 0.3333333;
    afStack_36a8[0] = 0.3333333;
    afStack_36a8[1] = 0.3333333;
    afStack_36a0[0] = 0.3333333;
    afStack_36a0[1] = 0.3333333;
    afStack_3698[0] = 0.3333333;
    afStack_3698[1] = 0.3333333;
    afStack_3690[0] = 0.3333333;
    afStack_3690[1] = 0.3333333;
    afStack_3688[0] = 0.3333333;
    afStack_3688[1] = 0.3333333;
    auVar48._16_8_ = local_3c80._16_8_;
    auVar48._0_16_ = local_3c80._0_16_;
    auVar48._24_8_ = local_3c80._24_8_;
    auVar48._32_8_ = local_3c80._32_8_;
    auVar48._40_8_ = local_3c80._40_8_;
    auVar48._48_8_ = local_3c80._48_8_;
    auVar48._56_8_ = local_3c80._56_8_;
    auVar47._8_4_ = 0.3333333;
    auVar47._12_4_ = 0.3333333;
    auVar47._0_4_ = 0.3333333;
    auVar47._4_4_ = 0.3333333;
    auVar47._16_4_ = 0.3333333;
    auVar47._20_4_ = 0.3333333;
    auVar47._24_4_ = 0.3333333;
    auVar47._28_4_ = 0.3333333;
    auVar47._32_4_ = 0.3333333;
    auVar47._36_4_ = 0.3333333;
    auVar47._40_4_ = 0.3333333;
    auVar47._44_4_ = 0.3333333;
    auVar47._48_4_ = 0.3333333;
    auVar47._52_4_ = 0.3333333;
    auVar47._56_4_ = 0.3333333;
    auVar47._60_4_ = 0.3333333;
    auVar154 = vfmadd213ps_avx512f(auVar48,auVar154,auVar47);
    local_3e80 = auVar154._0_8_;
    local_3a00 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_39f8 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_39f0 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_39e8 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_39e0 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_39d8 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_39d0 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_39c8 = uStack_3e48;
    local_3a40 = local_3c80._0_8_;
    uStack_3a38 = local_3c80._8_8_;
    uStack_3a30 = local_3c80._16_8_;
    uStack_3a28 = local_3c80._24_8_;
    uStack_3a20 = local_3c80._32_8_;
    uStack_3a18 = local_3c80._40_8_;
    uStack_3a10 = local_3c80._48_8_;
    uStack_3a08 = local_3c80._56_8_;
    auVar39._16_8_ = local_3c80._16_8_;
    auVar39._0_16_ = local_3c80._0_16_;
    auVar39._24_8_ = local_3c80._24_8_;
    auVar39._32_8_ = local_3c80._32_8_;
    auVar39._40_8_ = local_3c80._40_8_;
    auVar39._48_8_ = local_3c80._48_8_;
    auVar39._56_8_ = local_3c80._56_8_;
    auVar154 = vmulps_avx512f(auVar154,auVar39);
    local_3e80 = auVar154._0_8_;
    local_3a80 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3a78 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3a70 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3a68 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3a60 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3a58 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3a50 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3a48 = uStack_3e48;
    local_3ac0 = local_3e40._0_8_;
    uStack_3ab8 = local_3e40._8_8_;
    uStack_3ab0 = local_3e40._16_8_;
    uStack_3aa8 = local_3e40._24_8_;
    uStack_3aa0 = local_3e40._32_8_;
    uStack_3a98 = local_3e40._40_8_;
    uStack_3a90 = local_3e40._48_8_;
    uStack_3a88 = local_3e40._56_8_;
    auVar154 = vmulps_avx512f(auVar154,local_3e40);
    local_3700 = local_3d80._0_8_;
    uStack_36f8 = local_3d80._8_8_;
    uStack_3d70 = auVar146._16_8_;
    uStack_36f0 = uStack_3d70;
    uStack_3d68 = auVar16._24_8_;
    uStack_36e8 = uStack_3d68;
    uStack_3d60 = auVar147._32_8_;
    uStack_36e0 = uStack_3d60;
    uStack_3d58 = auVar145._40_8_;
    uStack_36d8 = uStack_3d58;
    uStack_3d50 = auVar148._48_8_;
    uStack_36d0 = uStack_3d50;
    uStack_3d48 = auVar37._56_8_;
    uStack_36c8 = uStack_3d48;
    local_3740[0] = -0.00021219444;
    local_3740[1] = -0.00021219444;
    afStack_3738[0] = -0.00021219444;
    afStack_3738[1] = -0.00021219444;
    afStack_3730[0] = -0.00021219444;
    afStack_3730[1] = -0.00021219444;
    afStack_3728[0] = -0.00021219444;
    afStack_3728[1] = -0.00021219444;
    afStack_3720[0] = -0.00021219444;
    afStack_3720[1] = -0.00021219444;
    afStack_3718[0] = -0.00021219444;
    afStack_3718[1] = -0.00021219444;
    afStack_3710[0] = -0.00021219444;
    afStack_3710[1] = -0.00021219444;
    afStack_3708[0] = -0.00021219444;
    afStack_3708[1] = -0.00021219444;
    local_3e80 = auVar154._0_8_;
    local_3780 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3778 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3770 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3768 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3760 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3758 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3750 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3748 = uStack_3e48;
    auVar46._16_8_ = uStack_3d70;
    auVar46._0_16_ = local_3d80;
    auVar46._24_8_ = uStack_3d68;
    auVar46._32_8_ = uStack_3d60;
    auVar46._40_8_ = uStack_3d58;
    auVar46._48_8_ = uStack_3d50;
    auVar46._56_8_ = uStack_3d48;
    auVar45._8_4_ = -0.00021219444;
    auVar45._12_4_ = -0.00021219444;
    auVar45._0_4_ = -0.00021219444;
    auVar45._4_4_ = -0.00021219444;
    auVar45._16_4_ = -0.00021219444;
    auVar45._20_4_ = -0.00021219444;
    auVar45._24_4_ = -0.00021219444;
    auVar45._28_4_ = -0.00021219444;
    auVar45._32_4_ = -0.00021219444;
    auVar45._36_4_ = -0.00021219444;
    auVar45._40_4_ = -0.00021219444;
    auVar45._44_4_ = -0.00021219444;
    auVar45._48_4_ = -0.00021219444;
    auVar45._52_4_ = -0.00021219444;
    auVar45._56_4_ = -0.00021219444;
    auVar45._60_4_ = -0.00021219444;
    auVar154 = vfmadd213ps_avx512f(auVar45,auVar46,auVar154);
    local_2800 = local_3e40._0_8_;
    uStack_27f8 = local_3e40._8_8_;
    uStack_27f0 = local_3e40._16_8_;
    uStack_27e8 = local_3e40._24_8_;
    uStack_27e0 = local_3e40._32_8_;
    uStack_27d8 = local_3e40._40_8_;
    uStack_27d0 = local_3e40._48_8_;
    uStack_27c8 = local_3e40._56_8_;
    local_2840[0] = 0.5;
    local_2840[1] = 0.5;
    afStack_2838[0] = 0.5;
    afStack_2838[1] = 0.5;
    afStack_2830[0] = 0.5;
    afStack_2830[1] = 0.5;
    afStack_2828[0] = 0.5;
    afStack_2828[1] = 0.5;
    afStack_2820[0] = 0.5;
    afStack_2820[1] = 0.5;
    afStack_2818[0] = 0.5;
    afStack_2818[1] = 0.5;
    afStack_2810[0] = 0.5;
    afStack_2810[1] = 0.5;
    afStack_2808[0] = 0.5;
    afStack_2808[1] = 0.5;
    local_3e80 = auVar154._0_8_;
    local_2880 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_2878 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_2870 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_2868 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_2860 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_2858 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_2850 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_2848 = uStack_3e48;
    auVar74._8_4_ = 0.5;
    auVar74._12_4_ = 0.5;
    auVar74._0_4_ = 0.5;
    auVar74._4_4_ = 0.5;
    auVar74._16_4_ = 0.5;
    auVar74._20_4_ = 0.5;
    auVar74._24_4_ = 0.5;
    auVar74._28_4_ = 0.5;
    auVar74._32_4_ = 0.5;
    auVar74._36_4_ = 0.5;
    auVar74._40_4_ = 0.5;
    auVar74._44_4_ = 0.5;
    auVar74._48_4_ = 0.5;
    auVar74._52_4_ = 0.5;
    auVar74._56_4_ = 0.5;
    auVar74._60_4_ = 0.5;
    auVar154 = vfnmadd213ps_avx512f(auVar74,local_3e40,auVar154);
    local_3c00 = local_3c80._0_8_;
    uStack_3bf8 = local_3c80._8_8_;
    uStack_3bf0 = local_3c80._16_8_;
    uStack_3be8 = local_3c80._24_8_;
    uStack_3be0 = local_3c80._32_8_;
    uStack_3bd8 = local_3c80._40_8_;
    uStack_3bd0 = local_3c80._48_8_;
    uStack_3bc8 = local_3c80._56_8_;
    local_3e80 = auVar154._0_8_;
    local_3c40 = local_3e80;
    uStack_3e78 = auVar154._8_8_;
    uStack_3c38 = uStack_3e78;
    uStack_3e70 = auVar154._16_8_;
    uStack_3c30 = uStack_3e70;
    uStack_3e68 = auVar154._24_8_;
    uStack_3c28 = uStack_3e68;
    uStack_3e60 = auVar154._32_8_;
    uStack_3c20 = uStack_3e60;
    uStack_3e58 = auVar154._40_8_;
    uStack_3c18 = uStack_3e58;
    uStack_3e50 = auVar154._48_8_;
    uStack_3c10 = uStack_3e50;
    uStack_3e48 = auVar154._56_8_;
    uStack_3c08 = uStack_3e48;
    auVar156._16_8_ = local_3c80._16_8_;
    auVar156._0_16_ = local_3c80._0_16_;
    auVar156._24_8_ = local_3c80._24_8_;
    auVar156._32_8_ = local_3c80._32_8_;
    auVar156._40_8_ = local_3c80._40_8_;
    auVar156._48_8_ = local_3c80._48_8_;
    auVar156._56_8_ = local_3c80._56_8_;
    auVar154 = vaddps_avx512f(auVar156,auVar154);
    local_37c0 = local_3d80._0_8_;
    uStack_37b8 = local_3d80._8_8_;
    uStack_37b0 = uStack_3d70;
    uStack_37a8 = uStack_3d68;
    uStack_37a0 = uStack_3d60;
    uStack_3798 = uStack_3d58;
    uStack_3790 = uStack_3d50;
    uStack_3788 = uStack_3d48;
    local_3800[0] = 0.6933594;
    local_3800[1] = 0.6933594;
    afStack_37f8[0] = 0.6933594;
    afStack_37f8[1] = 0.6933594;
    afStack_37f0[0] = 0.6933594;
    afStack_37f0[1] = 0.6933594;
    afStack_37e8[0] = 0.6933594;
    afStack_37e8[1] = 0.6933594;
    afStack_37e0[0] = 0.6933594;
    afStack_37e0[1] = 0.6933594;
    afStack_37d8[0] = 0.6933594;
    afStack_37d8[1] = 0.6933594;
    afStack_37d0[0] = 0.6933594;
    afStack_37d0[1] = 0.6933594;
    afStack_37c8[0] = 0.6933594;
    afStack_37c8[1] = 0.6933594;
    local_3c80._0_8_ = auVar154._0_8_;
    local_3840 = local_3c80._0_8_;
    local_3c80._8_8_ = auVar154._8_8_;
    uStack_3838 = local_3c80._8_8_;
    local_3c80._16_8_ = auVar154._16_8_;
    uStack_3830 = local_3c80._16_8_;
    local_3c80._24_8_ = auVar154._24_8_;
    uStack_3828 = local_3c80._24_8_;
    local_3c80._32_8_ = auVar154._32_8_;
    uStack_3820 = local_3c80._32_8_;
    local_3c80._40_8_ = auVar154._40_8_;
    uStack_3818 = local_3c80._40_8_;
    local_3c80._48_8_ = auVar154._48_8_;
    uStack_3810 = local_3c80._48_8_;
    local_3c80._56_8_ = auVar154._56_8_;
    uStack_3808 = local_3c80._56_8_;
    auVar44._16_8_ = uStack_3d70;
    auVar44._0_16_ = local_3d80;
    auVar44._24_8_ = uStack_3d68;
    auVar44._32_8_ = uStack_3d60;
    auVar44._40_8_ = uStack_3d58;
    auVar44._48_8_ = uStack_3d50;
    auVar44._56_8_ = uStack_3d48;
    auVar43._8_4_ = 0.6933594;
    auVar43._12_4_ = 0.6933594;
    auVar43._0_4_ = 0.6933594;
    auVar43._4_4_ = 0.6933594;
    auVar43._16_4_ = 0.6933594;
    auVar43._20_4_ = 0.6933594;
    auVar43._24_4_ = 0.6933594;
    auVar43._28_4_ = 0.6933594;
    auVar43._32_4_ = 0.6933594;
    auVar43._36_4_ = 0.6933594;
    auVar43._40_4_ = 0.6933594;
    auVar43._44_4_ = 0.6933594;
    auVar43._48_4_ = 0.6933594;
    auVar43._52_4_ = 0.6933594;
    auVar43._56_4_ = 0.6933594;
    auVar43._60_4_ = 0.6933594;
    local_3c80 = vfmadd213ps_avx512f(auVar43,auVar44,auVar154);
    local_22c0 = local_3c80._0_8_;
    uStack_22b8 = local_3c80._8_8_;
    uStack_22b0 = local_3c80._16_8_;
    uStack_22a8 = local_3c80._24_8_;
    uStack_22a0 = local_3c80._32_8_;
    uStack_2298 = local_3c80._40_8_;
    uStack_2290 = local_3c80._48_8_;
    uStack_2288 = local_3c80._56_8_;
    auVar154 = vpmovm2d_avx512dq(uVar20 & 0xffff);
    local_2500 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(local_2500);
    local_2300 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(local_3c80);
    auVar153 = vmovdqa64_avx512f(local_2300);
    auVar154 = vpord_avx512f(auVar154,auVar153);
    _local_3e80 = vmovdqa64_avx512f(auVar154);
    local_4380 = local_3e80;
    uStack_4378 = uStack_3e78;
    uStack_4370 = uStack_3e70;
    uStack_4368 = uStack_3e68;
    uStack_4360 = uStack_3e60;
    uStack_4358 = uStack_3e58;
    uStack_4350 = uStack_3e50;
    uStack_4348 = uStack_3e48;
    auVar154 = vmulps_avx512f(local_4780,_local_3e80);
    local_3880 = 0;
    uStack_3878 = 0;
    uStack_3870 = 0;
    uStack_3868 = 0;
    uStack_3860 = 0;
    uStack_3858 = 0;
    uStack_3850 = 0;
    uStack_3848 = 0;
    local_4240[0] = 1.0;
    local_4240[1] = 1.0;
    afStack_4238[0] = 1.0;
    afStack_4238[1] = 1.0;
    afStack_4230[0] = 1.0;
    afStack_4230[1] = 1.0;
    afStack_4228[0] = 1.0;
    afStack_4228[1] = 1.0;
    afStack_4220[0] = 1.0;
    afStack_4220[1] = 1.0;
    afStack_4218[0] = 1.0;
    afStack_4218[1] = 1.0;
    afStack_4210[0] = 1.0;
    afStack_4210[1] = 1.0;
    afStack_4208[0] = 1.0;
    afStack_4208[1] = 1.0;
    local_4140._0_8_ = auVar154._0_8_;
    local_3ec0 = local_4140._0_8_;
    local_4140._8_8_ = auVar154._8_8_;
    uStack_3eb8 = local_4140._8_8_;
    local_4140._16_8_ = auVar154._16_8_;
    uStack_3eb0 = local_4140._16_8_;
    local_4140._24_8_ = auVar154._24_8_;
    uStack_3ea8 = local_4140._24_8_;
    local_4140._32_8_ = auVar154._32_8_;
    uStack_3ea0 = local_4140._32_8_;
    local_4140._40_8_ = auVar154._40_8_;
    uStack_3e98 = local_4140._40_8_;
    local_4140._48_8_ = auVar154._48_8_;
    uStack_3e90 = local_4140._48_8_;
    local_4140._56_8_ = auVar154._56_8_;
    uStack_3e88 = local_4140._56_8_;
    local_3f00[0] = 88.37626;
    local_3f00[1] = 88.37626;
    afStack_3ef8[0] = 88.37626;
    afStack_3ef8[1] = 88.37626;
    afStack_3ef0[0] = 88.37626;
    afStack_3ef0[1] = 88.37626;
    afStack_3ee8[0] = 88.37626;
    afStack_3ee8[1] = 88.37626;
    afStack_3ee0[0] = 88.37626;
    afStack_3ee0[1] = 88.37626;
    afStack_3ed8[0] = 88.37626;
    afStack_3ed8[1] = 88.37626;
    afStack_3ed0[0] = 88.37626;
    afStack_3ed0[1] = 88.37626;
    afStack_3ec8[0] = 88.37626;
    afStack_3ec8[1] = 88.37626;
    auVar155._8_4_ = 88.37626;
    auVar155._12_4_ = 88.37626;
    auVar155._0_4_ = 88.37626;
    auVar155._4_4_ = 88.37626;
    auVar155._16_4_ = 88.37626;
    auVar155._20_4_ = 88.37626;
    auVar155._24_4_ = 88.37626;
    auVar155._28_4_ = 88.37626;
    auVar155._32_4_ = 88.37626;
    auVar155._36_4_ = 88.37626;
    auVar155._40_4_ = 88.37626;
    auVar155._44_4_ = 88.37626;
    auVar155._48_4_ = 88.37626;
    auVar155._52_4_ = 88.37626;
    auVar155._56_4_ = 88.37626;
    auVar155._60_4_ = 88.37626;
    auVar154 = vminps_avx512f(auVar154,auVar155);
    local_4140._0_8_ = auVar154._0_8_;
    local_3f40 = local_4140._0_8_;
    local_4140._8_8_ = auVar154._8_8_;
    uStack_3f38 = local_4140._8_8_;
    local_4140._16_8_ = auVar154._16_8_;
    uStack_3f30 = local_4140._16_8_;
    local_4140._24_8_ = auVar154._24_8_;
    uStack_3f28 = local_4140._24_8_;
    local_4140._32_8_ = auVar154._32_8_;
    uStack_3f20 = local_4140._32_8_;
    local_4140._40_8_ = auVar154._40_8_;
    uStack_3f18 = local_4140._40_8_;
    local_4140._48_8_ = auVar154._48_8_;
    uStack_3f10 = local_4140._48_8_;
    local_4140._56_8_ = auVar154._56_8_;
    uStack_3f08 = local_4140._56_8_;
    local_3f80[0] = -88.37626;
    local_3f80[1] = -88.37626;
    afStack_3f78[0] = -88.37626;
    afStack_3f78[1] = -88.37626;
    afStack_3f70[0] = -88.37626;
    afStack_3f70[1] = -88.37626;
    afStack_3f68[0] = -88.37626;
    afStack_3f68[1] = -88.37626;
    afStack_3f60[0] = -88.37626;
    afStack_3f60[1] = -88.37626;
    afStack_3f58[0] = -88.37626;
    afStack_3f58[1] = -88.37626;
    afStack_3f50[0] = -88.37626;
    afStack_3f50[1] = -88.37626;
    afStack_3f48[0] = -88.37626;
    afStack_3f48[1] = -88.37626;
    auVar153._8_4_ = -88.37626;
    auVar153._12_4_ = -88.37626;
    auVar153._0_4_ = -88.37626;
    auVar153._4_4_ = -88.37626;
    auVar153._16_4_ = -88.37626;
    auVar153._20_4_ = -88.37626;
    auVar153._24_4_ = -88.37626;
    auVar153._28_4_ = -88.37626;
    auVar153._32_4_ = -88.37626;
    auVar153._36_4_ = -88.37626;
    auVar153._40_4_ = -88.37626;
    auVar153._44_4_ = -88.37626;
    auVar153._48_4_ = -88.37626;
    auVar153._52_4_ = -88.37626;
    auVar153._56_4_ = -88.37626;
    auVar153._60_4_ = -88.37626;
    auVar154 = vmaxps_avx512f(auVar154,auVar153);
    local_4140._0_8_ = auVar154._0_8_;
    local_2bc0 = local_4140._0_8_;
    local_4140._8_8_ = auVar154._8_8_;
    uStack_2bb8 = local_4140._8_8_;
    local_4140._16_8_ = auVar154._16_8_;
    uStack_2bb0 = local_4140._16_8_;
    local_4140._24_8_ = auVar154._24_8_;
    uStack_2ba8 = local_4140._24_8_;
    local_4140._32_8_ = auVar154._32_8_;
    uStack_2ba0 = local_4140._32_8_;
    local_4140._40_8_ = auVar154._40_8_;
    uStack_2b98 = local_4140._40_8_;
    local_4140._48_8_ = auVar154._48_8_;
    uStack_2b90 = local_4140._48_8_;
    local_4140._56_8_ = auVar154._56_8_;
    uStack_2b88 = local_4140._56_8_;
    local_2c00[0] = 1.442695;
    local_2c00[1] = 1.442695;
    afStack_2bf8[0] = 1.442695;
    afStack_2bf8[1] = 1.442695;
    afStack_2bf0[0] = 1.442695;
    afStack_2bf0[1] = 1.442695;
    afStack_2be8[0] = 1.442695;
    afStack_2be8[1] = 1.442695;
    afStack_2be0[0] = 1.442695;
    afStack_2be0[1] = 1.442695;
    afStack_2bd8[0] = 1.442695;
    afStack_2bd8[1] = 1.442695;
    afStack_2bd0[0] = 1.442695;
    afStack_2bd0[1] = 1.442695;
    afStack_2bc8[0] = 1.442695;
    afStack_2bc8[1] = 1.442695;
    local_2c40[0] = 0.5;
    local_2c40[1] = 0.5;
    afStack_2c38[0] = 0.5;
    afStack_2c38[1] = 0.5;
    afStack_2c30[0] = 0.5;
    afStack_2c30[1] = 0.5;
    afStack_2c28[0] = 0.5;
    afStack_2c28[1] = 0.5;
    afStack_2c20[0] = 0.5;
    afStack_2c20[1] = 0.5;
    afStack_2c18[0] = 0.5;
    afStack_2c18[1] = 0.5;
    afStack_2c10[0] = 0.5;
    afStack_2c10[1] = 0.5;
    afStack_2c08[0] = 0.5;
    afStack_2c08[1] = 0.5;
    auVar71._8_4_ = 1.442695;
    auVar71._12_4_ = 1.442695;
    auVar71._0_4_ = 1.442695;
    auVar71._4_4_ = 1.442695;
    auVar71._16_4_ = 1.442695;
    auVar71._20_4_ = 1.442695;
    auVar71._24_4_ = 1.442695;
    auVar71._28_4_ = 1.442695;
    auVar71._32_4_ = 1.442695;
    auVar71._36_4_ = 1.442695;
    auVar71._40_4_ = 1.442695;
    auVar71._44_4_ = 1.442695;
    auVar71._48_4_ = 1.442695;
    auVar71._52_4_ = 1.442695;
    auVar71._56_4_ = 1.442695;
    auVar71._60_4_ = 1.442695;
    auVar70._8_4_ = 0.5;
    auVar70._12_4_ = 0.5;
    auVar70._0_4_ = 0.5;
    auVar70._4_4_ = 0.5;
    auVar70._16_4_ = 0.5;
    auVar70._20_4_ = 0.5;
    auVar70._24_4_ = 0.5;
    auVar70._28_4_ = 0.5;
    auVar70._32_4_ = 0.5;
    auVar70._36_4_ = 0.5;
    auVar70._40_4_ = 0.5;
    auVar70._44_4_ = 0.5;
    auVar70._48_4_ = 0.5;
    auVar70._52_4_ = 0.5;
    auVar70._56_4_ = 0.5;
    auVar70._60_4_ = 0.5;
    auVar153 = vfmadd213ps_avx512f(auVar71,auVar154,auVar70);
    auVar155 = vrndscaleps_avx512f(auVar153,1);
    uVar21 = vcmpps_avx512f(auVar153,auVar155,1);
    local_4242 = (ushort)uVar21;
    local_4180._0_8_ = auVar155._0_8_;
    local_29c0 = local_4180._0_8_;
    local_4180._8_8_ = auVar155._8_8_;
    uStack_29b8 = local_4180._8_8_;
    local_4180._16_8_ = auVar155._16_8_;
    uStack_29b0 = local_4180._16_8_;
    local_4180._24_8_ = auVar155._24_8_;
    uStack_29a8 = local_4180._24_8_;
    local_4180._32_8_ = auVar155._32_8_;
    uStack_29a0 = local_4180._32_8_;
    local_4180._40_8_ = auVar155._40_8_;
    uStack_2998 = local_4180._40_8_;
    local_4180._48_8_ = auVar155._48_8_;
    uStack_2990 = local_4180._48_8_;
    local_4180._56_8_ = auVar155._56_8_;
    uStack_2988 = local_4180._56_8_;
    local_2a00[0] = 1.0;
    local_2a00[1] = 1.0;
    afStack_29f8[0] = 1.0;
    afStack_29f8[1] = 1.0;
    afStack_29f0[0] = 1.0;
    afStack_29f0[1] = 1.0;
    afStack_29e8[0] = 1.0;
    afStack_29e8[1] = 1.0;
    afStack_29e0[0] = 1.0;
    afStack_29e0[1] = 1.0;
    afStack_29d8[0] = 1.0;
    afStack_29d8[1] = 1.0;
    afStack_29d0[0] = 1.0;
    afStack_29d0[1] = 1.0;
    afStack_29c8[0] = 1.0;
    afStack_29c8[1] = 1.0;
    local_28c0 = local_4180._0_8_;
    uStack_28b8 = local_4180._8_8_;
    uStack_28b0 = local_4180._16_8_;
    uStack_28a8 = local_4180._24_8_;
    uStack_28a0 = local_4180._32_8_;
    uStack_2898 = local_4180._40_8_;
    uStack_2890 = local_4180._48_8_;
    uStack_2888 = local_4180._56_8_;
    local_2900[0] = 1.0;
    local_2900[1] = 1.0;
    afStack_28f8[0] = 1.0;
    afStack_28f8[1] = 1.0;
    afStack_28f0[0] = 1.0;
    afStack_28f0[1] = 1.0;
    afStack_28e8[0] = 1.0;
    afStack_28e8[1] = 1.0;
    afStack_28e0[0] = 1.0;
    afStack_28e0[1] = 1.0;
    afStack_28d8[0] = 1.0;
    afStack_28d8[1] = 1.0;
    afStack_28d0[0] = 1.0;
    afStack_28d0[1] = 1.0;
    afStack_28c8[0] = 1.0;
    afStack_28c8[1] = 1.0;
    auVar73._8_4_ = 1.0;
    auVar73._12_4_ = 1.0;
    auVar73._0_4_ = 1.0;
    auVar73._4_4_ = 1.0;
    auVar73._16_4_ = 1.0;
    auVar73._20_4_ = 1.0;
    auVar73._24_4_ = 1.0;
    auVar73._28_4_ = 1.0;
    auVar73._32_4_ = 1.0;
    auVar73._36_4_ = 1.0;
    auVar73._40_4_ = 1.0;
    auVar73._44_4_ = 1.0;
    auVar73._48_4_ = 1.0;
    auVar73._52_4_ = 1.0;
    auVar73._56_4_ = 1.0;
    auVar73._60_4_ = 1.0;
    local_2940._0_4_ = auVar155._0_4_;
    local_2940._4_4_ = auVar155._4_4_;
    uStack_2938._0_4_ = auVar155._8_4_;
    uStack_2938._4_4_ = auVar155._12_4_;
    uStack_2930._0_4_ = auVar155._16_4_;
    uStack_2930._4_4_ = auVar155._20_4_;
    uStack_2928._0_4_ = auVar155._24_4_;
    uStack_2928._4_4_ = auVar155._28_4_;
    uStack_2920._0_4_ = auVar155._32_4_;
    uStack_2920._4_4_ = auVar155._36_4_;
    uStack_2918._0_4_ = auVar155._40_4_;
    uStack_2918._4_4_ = auVar155._44_4_;
    uStack_2910._0_4_ = auVar155._48_4_;
    uStack_2910._4_4_ = auVar155._52_4_;
    uStack_2908._0_4_ = auVar155._56_4_;
    uStack_2908._4_4_ = auVar155._60_4_;
    auVar153 = vsubps_avx512f(auVar155,auVar73);
    bVar1 = (bool)((byte)uVar21 & 1);
    bVar2 = (bool)((byte)(local_4242 >> 1) & 1);
    bVar3 = (bool)((byte)(local_4242 >> 2) & 1);
    bVar4 = (bool)((byte)(local_4242 >> 3) & 1);
    bVar5 = (bool)((byte)(local_4242 >> 4) & 1);
    bVar6 = (bool)((byte)(local_4242 >> 5) & 1);
    bVar7 = (bool)((byte)(local_4242 >> 6) & 1);
    bVar8 = (bool)((byte)(local_4242 >> 7) & 1);
    bVar9 = (byte)((ulong)uVar21 >> 8);
    bVar10 = (bool)(bVar9 >> 1 & 1);
    bVar11 = (bool)(bVar9 >> 2 & 1);
    bVar12 = (bool)(bVar9 >> 3 & 1);
    bVar13 = (bool)(bVar9 >> 4 & 1);
    bVar14 = (bool)(bVar9 >> 5 & 1);
    bVar15 = (bool)(bVar9 >> 6 & 1);
    local_41c0._4_4_ = (uint)bVar2 * auVar153._4_4_ | (uint)!bVar2 * local_2940._4_4_;
    local_41c0._0_4_ = (uint)bVar1 * auVar153._0_4_ | (uint)!bVar1 * (int)local_2940;
    local_41c0._8_4_ = (uint)bVar3 * auVar153._8_4_ | (uint)!bVar3 * (int)uStack_2938;
    local_41c0._12_4_ = (uint)bVar4 * auVar153._12_4_ | (uint)!bVar4 * uStack_2938._4_4_;
    uStack_41b0._0_4_ = (uint)bVar5 * auVar153._16_4_ | (uint)!bVar5 * (int)uStack_2930;
    uStack_41b0._4_4_ = (uint)bVar6 * auVar153._20_4_ | (uint)!bVar6 * uStack_2930._4_4_;
    auVar146 = _local_41c0;
    uStack_41a8._0_4_ = (uint)bVar7 * auVar153._24_4_ | (uint)!bVar7 * (int)uStack_2928;
    uStack_41a8._4_4_ = (uint)bVar8 * auVar153._28_4_ | (uint)!bVar8 * uStack_2928._4_4_;
    auVar16 = _local_41c0;
    uStack_41a0._0_4_ =
         (uint)(bVar9 & 1) * auVar153._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2920;
    uStack_41a0._4_4_ = (uint)bVar10 * auVar153._36_4_ | (uint)!bVar10 * uStack_2920._4_4_;
    auVar147 = _local_41c0;
    uStack_4198._0_4_ = (uint)bVar11 * auVar153._40_4_ | (uint)!bVar11 * (int)uStack_2918;
    uStack_4198._4_4_ = (uint)bVar12 * auVar153._44_4_ | (uint)!bVar12 * uStack_2918._4_4_;
    auVar145 = _local_41c0;
    uStack_4190._0_4_ = (uint)bVar13 * auVar153._48_4_ | (uint)!bVar13 * (int)uStack_2910;
    uStack_4190._4_4_ = (uint)bVar14 * auVar153._52_4_ | (uint)!bVar14 * uStack_2910._4_4_;
    auVar148 = _local_41c0;
    uStack_4188._0_4_ = (uint)bVar15 * auVar153._56_4_ | (uint)!bVar15 * (int)uStack_2908;
    uStack_4188._4_4_ =
         (uint)(bVar9 >> 7) * auVar153._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2908._4_4_;
    auVar153 = _local_41c0;
    local_2680 = local_41c0._0_8_;
    uStack_2678 = local_41c0._8_8_;
    uStack_41b0 = auVar146._16_8_;
    uStack_2670 = uStack_41b0;
    uStack_41a8 = auVar16._24_8_;
    uStack_2668 = uStack_41a8;
    uStack_41a0 = auVar147._32_8_;
    uStack_2660 = uStack_41a0;
    uStack_4198 = auVar145._40_8_;
    uStack_2658 = uStack_4198;
    uStack_4190 = auVar148._48_8_;
    uStack_2650 = uStack_4190;
    uStack_4188 = auVar153._56_8_;
    uStack_2648 = uStack_4188;
    local_26c0[0] = 0.6933594;
    local_26c0[1] = 0.6933594;
    afStack_26b8[0] = 0.6933594;
    afStack_26b8[1] = 0.6933594;
    afStack_26b0[0] = 0.6933594;
    afStack_26b0[1] = 0.6933594;
    afStack_26a8[0] = 0.6933594;
    afStack_26a8[1] = 0.6933594;
    afStack_26a0[0] = 0.6933594;
    afStack_26a0[1] = 0.6933594;
    afStack_2698[0] = 0.6933594;
    afStack_2698[1] = 0.6933594;
    afStack_2690[0] = 0.6933594;
    afStack_2690[1] = 0.6933594;
    afStack_2688[0] = 0.6933594;
    afStack_2688[1] = 0.6933594;
    local_2700 = local_4140._0_8_;
    uStack_26f8 = local_4140._8_8_;
    uStack_26f0 = local_4140._16_8_;
    uStack_26e8 = local_4140._24_8_;
    uStack_26e0 = local_4140._32_8_;
    uStack_26d8 = local_4140._40_8_;
    uStack_26d0 = local_4140._48_8_;
    uStack_26c8 = local_4140._56_8_;
    auVar78._16_8_ = uStack_41b0;
    auVar78._0_16_ = local_41c0;
    auVar78._24_8_ = uStack_41a8;
    auVar78._32_8_ = uStack_41a0;
    auVar78._40_8_ = uStack_4198;
    auVar78._48_8_ = uStack_4190;
    auVar78._56_8_ = uStack_4188;
    auVar77._8_4_ = 0.6933594;
    auVar77._12_4_ = 0.6933594;
    auVar77._0_4_ = 0.6933594;
    auVar77._4_4_ = 0.6933594;
    auVar77._16_4_ = 0.6933594;
    auVar77._20_4_ = 0.6933594;
    auVar77._24_4_ = 0.6933594;
    auVar77._28_4_ = 0.6933594;
    auVar77._32_4_ = 0.6933594;
    auVar77._36_4_ = 0.6933594;
    auVar77._40_4_ = 0.6933594;
    auVar77._44_4_ = 0.6933594;
    auVar77._48_4_ = 0.6933594;
    auVar77._52_4_ = 0.6933594;
    auVar77._56_4_ = 0.6933594;
    auVar77._60_4_ = 0.6933594;
    auVar154 = vfnmadd213ps_avx512f(auVar77,auVar78,auVar154);
    local_2740 = local_41c0._0_8_;
    uStack_2738 = local_41c0._8_8_;
    uStack_2730 = uStack_41b0;
    uStack_2728 = uStack_41a8;
    uStack_2720 = uStack_41a0;
    uStack_2718 = uStack_4198;
    uStack_2710 = uStack_4190;
    uStack_2708 = uStack_4188;
    local_2780[0] = -0.00021219444;
    local_2780[1] = -0.00021219444;
    afStack_2778[0] = -0.00021219444;
    afStack_2778[1] = -0.00021219444;
    afStack_2770[0] = -0.00021219444;
    afStack_2770[1] = -0.00021219444;
    afStack_2768[0] = -0.00021219444;
    afStack_2768[1] = -0.00021219444;
    afStack_2760[0] = -0.00021219444;
    afStack_2760[1] = -0.00021219444;
    afStack_2758[0] = -0.00021219444;
    afStack_2758[1] = -0.00021219444;
    afStack_2750[0] = -0.00021219444;
    afStack_2750[1] = -0.00021219444;
    afStack_2748[0] = -0.00021219444;
    afStack_2748[1] = -0.00021219444;
    local_4140._0_8_ = auVar154._0_8_;
    local_27c0 = local_4140._0_8_;
    local_4140._8_8_ = auVar154._8_8_;
    uStack_27b8 = local_4140._8_8_;
    local_4140._16_8_ = auVar154._16_8_;
    uStack_27b0 = local_4140._16_8_;
    local_4140._24_8_ = auVar154._24_8_;
    uStack_27a8 = local_4140._24_8_;
    local_4140._32_8_ = auVar154._32_8_;
    uStack_27a0 = local_4140._32_8_;
    local_4140._40_8_ = auVar154._40_8_;
    uStack_2798 = local_4140._40_8_;
    local_4140._48_8_ = auVar154._48_8_;
    uStack_2790 = local_4140._48_8_;
    local_4140._56_8_ = auVar154._56_8_;
    uStack_2788 = local_4140._56_8_;
    auVar76._16_8_ = uStack_41b0;
    auVar76._0_16_ = local_41c0;
    auVar76._24_8_ = uStack_41a8;
    auVar76._32_8_ = uStack_41a0;
    auVar76._40_8_ = uStack_4198;
    auVar76._48_8_ = uStack_4190;
    auVar76._56_8_ = uStack_4188;
    auVar75._8_4_ = -0.00021219444;
    auVar75._12_4_ = -0.00021219444;
    auVar75._0_4_ = -0.00021219444;
    auVar75._4_4_ = -0.00021219444;
    auVar75._16_4_ = -0.00021219444;
    auVar75._20_4_ = -0.00021219444;
    auVar75._24_4_ = -0.00021219444;
    auVar75._28_4_ = -0.00021219444;
    auVar75._32_4_ = -0.00021219444;
    auVar75._36_4_ = -0.00021219444;
    auVar75._40_4_ = -0.00021219444;
    auVar75._44_4_ = -0.00021219444;
    auVar75._48_4_ = -0.00021219444;
    auVar75._52_4_ = -0.00021219444;
    auVar75._56_4_ = -0.00021219444;
    auVar75._60_4_ = -0.00021219444;
    local_4140 = vfnmadd213ps_avx512f(auVar75,auVar76,auVar154);
    local_4000 = local_4140._0_8_;
    uStack_3ff8 = local_4140._8_8_;
    uStack_3ff0 = local_4140._16_8_;
    uStack_3fe8 = local_4140._24_8_;
    uStack_3fe0 = local_4140._32_8_;
    uStack_3fd8 = local_4140._40_8_;
    uStack_3fd0 = local_4140._48_8_;
    uStack_3fc8 = local_4140._56_8_;
    local_4180 = vmulps_avx512f(local_4140,local_4140);
    uStack_42b8._0_4_ = 0.00019875691;
    uStack_42b8._4_4_ = 0.00019875691;
    local_42c0._0_4_ = 0.00019875691;
    local_42c0._4_4_ = 0.00019875691;
    local_2c80[0] = 0.00019875691;
    local_2c80[1] = 0.00019875691;
    afStack_2c78[0] = 0.00019875691;
    afStack_2c78[1] = 0.00019875691;
    afStack_2c70[0] = 0.00019875691;
    afStack_2c70[1] = 0.00019875691;
    afStack_2c68[0] = 0.00019875691;
    afStack_2c68[1] = 0.00019875691;
    afStack_2c60[0] = 0.00019875691;
    afStack_2c60[1] = 0.00019875691;
    afStack_2c58[0] = 0.00019875691;
    afStack_2c58[1] = 0.00019875691;
    afStack_2c50[0] = 0.00019875691;
    afStack_2c50[1] = 0.00019875691;
    afStack_2c48[0] = 0.00019875691;
    afStack_2c48[1] = 0.00019875691;
    local_2cc0 = local_4140._0_8_;
    uStack_2cb8 = local_4140._8_8_;
    uStack_2cb0 = local_4140._16_8_;
    uStack_2ca8 = local_4140._24_8_;
    uStack_2ca0 = local_4140._32_8_;
    uStack_2c98 = local_4140._40_8_;
    uStack_2c90 = local_4140._48_8_;
    uStack_2c88 = local_4140._56_8_;
    local_2d00[0] = 0.0013981999;
    local_2d00[1] = 0.0013981999;
    afStack_2cf8[0] = 0.0013981999;
    afStack_2cf8[1] = 0.0013981999;
    afStack_2cf0[0] = 0.0013981999;
    afStack_2cf0[1] = 0.0013981999;
    afStack_2ce8[0] = 0.0013981999;
    afStack_2ce8[1] = 0.0013981999;
    afStack_2ce0[0] = 0.0013981999;
    afStack_2ce0[1] = 0.0013981999;
    afStack_2cd8[0] = 0.0013981999;
    afStack_2cd8[1] = 0.0013981999;
    afStack_2cd0[0] = 0.0013981999;
    afStack_2cd0[1] = 0.0013981999;
    afStack_2cc8[0] = 0.0013981999;
    afStack_2cc8[1] = 0.0013981999;
    auVar69._16_4_ = 0.00019875691;
    auVar69._20_4_ = 0.00019875691;
    auVar69._0_16_ = _local_42c0;
    auVar69._24_4_ = 0.00019875691;
    auVar69._28_4_ = 0.00019875691;
    auVar69._32_4_ = 0.00019875691;
    auVar69._36_4_ = 0.00019875691;
    auVar69._40_4_ = 0.00019875691;
    auVar69._44_4_ = 0.00019875691;
    auVar69._48_4_ = 0.00019875691;
    auVar69._52_4_ = 0.00019875691;
    auVar69._56_4_ = 0.00019875691;
    auVar69._60_4_ = 0.00019875691;
    auVar68._8_4_ = 0.0013981999;
    auVar68._12_4_ = 0.0013981999;
    auVar68._0_4_ = 0.0013981999;
    auVar68._4_4_ = 0.0013981999;
    auVar68._16_4_ = 0.0013981999;
    auVar68._20_4_ = 0.0013981999;
    auVar68._24_4_ = 0.0013981999;
    auVar68._28_4_ = 0.0013981999;
    auVar68._32_4_ = 0.0013981999;
    auVar68._36_4_ = 0.0013981999;
    auVar68._40_4_ = 0.0013981999;
    auVar68._44_4_ = 0.0013981999;
    auVar68._48_4_ = 0.0013981999;
    auVar68._52_4_ = 0.0013981999;
    auVar68._56_4_ = 0.0013981999;
    auVar68._60_4_ = 0.0013981999;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar69,auVar68);
    local_42c0 = auVar154._0_8_;
    local_2d40 = local_42c0;
    uStack_42b8 = auVar154._8_8_;
    uStack_2d38 = uStack_42b8;
    uStack_42b0 = auVar154._16_8_;
    uStack_2d30 = uStack_42b0;
    uStack_42a8 = auVar154._24_8_;
    uStack_2d28 = uStack_42a8;
    uStack_42a0 = auVar154._32_8_;
    uStack_2d20 = uStack_42a0;
    uStack_4298 = auVar154._40_8_;
    uStack_2d18 = uStack_4298;
    uStack_4290 = auVar154._48_8_;
    uStack_2d10 = uStack_4290;
    uStack_4288 = auVar154._56_8_;
    uStack_2d08 = uStack_4288;
    local_2d80 = local_4140._0_8_;
    uStack_2d78 = local_4140._8_8_;
    uStack_2d70 = local_4140._16_8_;
    uStack_2d68 = local_4140._24_8_;
    uStack_2d60 = local_4140._32_8_;
    uStack_2d58 = local_4140._40_8_;
    uStack_2d50 = local_4140._48_8_;
    uStack_2d48 = local_4140._56_8_;
    local_2dc0[0] = 0.008333452;
    local_2dc0[1] = 0.008333452;
    afStack_2db8[0] = 0.008333452;
    afStack_2db8[1] = 0.008333452;
    afStack_2db0[0] = 0.008333452;
    afStack_2db0[1] = 0.008333452;
    afStack_2da8[0] = 0.008333452;
    afStack_2da8[1] = 0.008333452;
    afStack_2da0[0] = 0.008333452;
    afStack_2da0[1] = 0.008333452;
    afStack_2d98[0] = 0.008333452;
    afStack_2d98[1] = 0.008333452;
    afStack_2d90[0] = 0.008333452;
    afStack_2d90[1] = 0.008333452;
    afStack_2d88[0] = 0.008333452;
    afStack_2d88[1] = 0.008333452;
    auVar67._8_4_ = 0.008333452;
    auVar67._12_4_ = 0.008333452;
    auVar67._0_4_ = 0.008333452;
    auVar67._4_4_ = 0.008333452;
    auVar67._16_4_ = 0.008333452;
    auVar67._20_4_ = 0.008333452;
    auVar67._24_4_ = 0.008333452;
    auVar67._28_4_ = 0.008333452;
    auVar67._32_4_ = 0.008333452;
    auVar67._36_4_ = 0.008333452;
    auVar67._40_4_ = 0.008333452;
    auVar67._44_4_ = 0.008333452;
    auVar67._48_4_ = 0.008333452;
    auVar67._52_4_ = 0.008333452;
    auVar67._56_4_ = 0.008333452;
    auVar67._60_4_ = 0.008333452;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar154,auVar67);
    local_42c0 = auVar154._0_8_;
    local_2e00 = local_42c0;
    uStack_42b8 = auVar154._8_8_;
    uStack_2df8 = uStack_42b8;
    uStack_42b0 = auVar154._16_8_;
    uStack_2df0 = uStack_42b0;
    uStack_42a8 = auVar154._24_8_;
    uStack_2de8 = uStack_42a8;
    uStack_42a0 = auVar154._32_8_;
    uStack_2de0 = uStack_42a0;
    uStack_4298 = auVar154._40_8_;
    uStack_2dd8 = uStack_4298;
    uStack_4290 = auVar154._48_8_;
    uStack_2dd0 = uStack_4290;
    uStack_4288 = auVar154._56_8_;
    uStack_2dc8 = uStack_4288;
    local_2e40 = local_4140._0_8_;
    uStack_2e38 = local_4140._8_8_;
    uStack_2e30 = local_4140._16_8_;
    uStack_2e28 = local_4140._24_8_;
    uStack_2e20 = local_4140._32_8_;
    uStack_2e18 = local_4140._40_8_;
    uStack_2e10 = local_4140._48_8_;
    uStack_2e08 = local_4140._56_8_;
    local_2e80[0] = 0.041665796;
    local_2e80[1] = 0.041665796;
    afStack_2e78[0] = 0.041665796;
    afStack_2e78[1] = 0.041665796;
    afStack_2e70[0] = 0.041665796;
    afStack_2e70[1] = 0.041665796;
    afStack_2e68[0] = 0.041665796;
    afStack_2e68[1] = 0.041665796;
    afStack_2e60[0] = 0.041665796;
    afStack_2e60[1] = 0.041665796;
    afStack_2e58[0] = 0.041665796;
    afStack_2e58[1] = 0.041665796;
    afStack_2e50[0] = 0.041665796;
    afStack_2e50[1] = 0.041665796;
    afStack_2e48[0] = 0.041665796;
    afStack_2e48[1] = 0.041665796;
    auVar66._8_4_ = 0.041665796;
    auVar66._12_4_ = 0.041665796;
    auVar66._0_4_ = 0.041665796;
    auVar66._4_4_ = 0.041665796;
    auVar66._16_4_ = 0.041665796;
    auVar66._20_4_ = 0.041665796;
    auVar66._24_4_ = 0.041665796;
    auVar66._28_4_ = 0.041665796;
    auVar66._32_4_ = 0.041665796;
    auVar66._36_4_ = 0.041665796;
    auVar66._40_4_ = 0.041665796;
    auVar66._44_4_ = 0.041665796;
    auVar66._48_4_ = 0.041665796;
    auVar66._52_4_ = 0.041665796;
    auVar66._56_4_ = 0.041665796;
    auVar66._60_4_ = 0.041665796;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar154,auVar66);
    local_42c0 = auVar154._0_8_;
    local_2ec0 = local_42c0;
    uStack_42b8 = auVar154._8_8_;
    uStack_2eb8 = uStack_42b8;
    uStack_42b0 = auVar154._16_8_;
    uStack_2eb0 = uStack_42b0;
    uStack_42a8 = auVar154._24_8_;
    uStack_2ea8 = uStack_42a8;
    uStack_42a0 = auVar154._32_8_;
    uStack_2ea0 = uStack_42a0;
    uStack_4298 = auVar154._40_8_;
    uStack_2e98 = uStack_4298;
    uStack_4290 = auVar154._48_8_;
    uStack_2e90 = uStack_4290;
    uStack_4288 = auVar154._56_8_;
    uStack_2e88 = uStack_4288;
    local_2f00 = local_4140._0_8_;
    uStack_2ef8 = local_4140._8_8_;
    uStack_2ef0 = local_4140._16_8_;
    uStack_2ee8 = local_4140._24_8_;
    uStack_2ee0 = local_4140._32_8_;
    uStack_2ed8 = local_4140._40_8_;
    uStack_2ed0 = local_4140._48_8_;
    uStack_2ec8 = local_4140._56_8_;
    local_2f40[0] = 0.16666666;
    local_2f40[1] = 0.16666666;
    afStack_2f38[0] = 0.16666666;
    afStack_2f38[1] = 0.16666666;
    afStack_2f30[0] = 0.16666666;
    afStack_2f30[1] = 0.16666666;
    afStack_2f28[0] = 0.16666666;
    afStack_2f28[1] = 0.16666666;
    afStack_2f20[0] = 0.16666666;
    afStack_2f20[1] = 0.16666666;
    afStack_2f18[0] = 0.16666666;
    afStack_2f18[1] = 0.16666666;
    afStack_2f10[0] = 0.16666666;
    afStack_2f10[1] = 0.16666666;
    afStack_2f08[0] = 0.16666666;
    afStack_2f08[1] = 0.16666666;
    auVar65._8_4_ = 0.16666666;
    auVar65._12_4_ = 0.16666666;
    auVar65._0_4_ = 0.16666666;
    auVar65._4_4_ = 0.16666666;
    auVar65._16_4_ = 0.16666666;
    auVar65._20_4_ = 0.16666666;
    auVar65._24_4_ = 0.16666666;
    auVar65._28_4_ = 0.16666666;
    auVar65._32_4_ = 0.16666666;
    auVar65._36_4_ = 0.16666666;
    auVar65._40_4_ = 0.16666666;
    auVar65._44_4_ = 0.16666666;
    auVar65._48_4_ = 0.16666666;
    auVar65._52_4_ = 0.16666666;
    auVar65._56_4_ = 0.16666666;
    auVar65._60_4_ = 0.16666666;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar154,auVar65);
    local_42c0 = auVar154._0_8_;
    local_2f80 = local_42c0;
    uStack_42b8 = auVar154._8_8_;
    uStack_2f78 = uStack_42b8;
    uStack_42b0 = auVar154._16_8_;
    uStack_2f70 = uStack_42b0;
    uStack_42a8 = auVar154._24_8_;
    uStack_2f68 = uStack_42a8;
    uStack_42a0 = auVar154._32_8_;
    uStack_2f60 = uStack_42a0;
    uStack_4298 = auVar154._40_8_;
    uStack_2f58 = uStack_4298;
    uStack_4290 = auVar154._48_8_;
    uStack_2f50 = uStack_4290;
    uStack_4288 = auVar154._56_8_;
    uStack_2f48 = uStack_4288;
    local_2fc0 = local_4140._0_8_;
    uStack_2fb8 = local_4140._8_8_;
    uStack_2fb0 = local_4140._16_8_;
    uStack_2fa8 = local_4140._24_8_;
    uStack_2fa0 = local_4140._32_8_;
    uStack_2f98 = local_4140._40_8_;
    uStack_2f90 = local_4140._48_8_;
    uStack_2f88 = local_4140._56_8_;
    local_3000[0] = 0.5;
    local_3000[1] = 0.5;
    afStack_2ff8[0] = 0.5;
    afStack_2ff8[1] = 0.5;
    afStack_2ff0[0] = 0.5;
    afStack_2ff0[1] = 0.5;
    afStack_2fe8[0] = 0.5;
    afStack_2fe8[1] = 0.5;
    afStack_2fe0[0] = 0.5;
    afStack_2fe0[1] = 0.5;
    afStack_2fd8[0] = 0.5;
    afStack_2fd8[1] = 0.5;
    afStack_2fd0[0] = 0.5;
    afStack_2fd0[1] = 0.5;
    afStack_2fc8[0] = 0.5;
    afStack_2fc8[1] = 0.5;
    auVar64._8_4_ = 0.5;
    auVar64._12_4_ = 0.5;
    auVar64._0_4_ = 0.5;
    auVar64._4_4_ = 0.5;
    auVar64._16_4_ = 0.5;
    auVar64._20_4_ = 0.5;
    auVar64._24_4_ = 0.5;
    auVar64._28_4_ = 0.5;
    auVar64._32_4_ = 0.5;
    auVar64._36_4_ = 0.5;
    auVar64._40_4_ = 0.5;
    auVar64._44_4_ = 0.5;
    auVar64._48_4_ = 0.5;
    auVar64._52_4_ = 0.5;
    auVar64._56_4_ = 0.5;
    auVar64._60_4_ = 0.5;
    auVar154 = vfmadd213ps_avx512f(local_4140,auVar154,auVar64);
    local_42c0 = auVar154._0_8_;
    local_3040 = local_42c0;
    uStack_42b8 = auVar154._8_8_;
    uStack_3038 = uStack_42b8;
    uStack_42b0 = auVar154._16_8_;
    uStack_3030 = uStack_42b0;
    uStack_42a8 = auVar154._24_8_;
    uStack_3028 = uStack_42a8;
    uStack_42a0 = auVar154._32_8_;
    uStack_3020 = uStack_42a0;
    uStack_4298 = auVar154._40_8_;
    uStack_3018 = uStack_4298;
    uStack_4290 = auVar154._48_8_;
    uStack_3010 = uStack_4290;
    uStack_4288 = auVar154._56_8_;
    uStack_3008 = uStack_4288;
    local_3080 = local_4180._0_8_;
    uStack_3078 = local_4180._8_8_;
    uStack_3070 = local_4180._16_8_;
    uStack_3068 = local_4180._24_8_;
    uStack_3060 = local_4180._32_8_;
    uStack_3058 = local_4180._40_8_;
    uStack_3050 = local_4180._48_8_;
    uStack_3048 = local_4180._56_8_;
    local_30c0 = local_4140._0_8_;
    uStack_30b8 = local_4140._8_8_;
    uStack_30b0 = local_4140._16_8_;
    uStack_30a8 = local_4140._24_8_;
    uStack_30a0 = local_4140._32_8_;
    uStack_3098 = local_4140._40_8_;
    uStack_3090 = local_4140._48_8_;
    uStack_3088 = local_4140._56_8_;
    auVar155 = vfmadd213ps_avx512f(local_4180,auVar154,local_4140);
    local_42c0 = auVar155._0_8_;
    local_40c0 = local_42c0;
    uStack_42b8 = auVar155._8_8_;
    uStack_40b8 = uStack_42b8;
    uStack_42b0 = auVar155._16_8_;
    uStack_40b0 = uStack_42b0;
    uStack_42a8 = auVar155._24_8_;
    uStack_40a8 = uStack_42a8;
    uStack_42a0 = auVar155._32_8_;
    uStack_40a0 = uStack_42a0;
    uStack_4298 = auVar155._40_8_;
    uStack_4098 = uStack_4298;
    uStack_4290 = auVar155._48_8_;
    uStack_4090 = uStack_4290;
    uStack_4288 = auVar155._56_8_;
    uStack_4088 = uStack_4288;
    local_4100[0] = 1.0;
    local_4100[1] = 1.0;
    afStack_40f8[0] = 1.0;
    afStack_40f8[1] = 1.0;
    afStack_40f0[0] = 1.0;
    afStack_40f0[1] = 1.0;
    afStack_40e8[0] = 1.0;
    afStack_40e8[1] = 1.0;
    afStack_40e0[0] = 1.0;
    afStack_40e0[1] = 1.0;
    afStack_40d8[0] = 1.0;
    afStack_40d8[1] = 1.0;
    afStack_40d0[0] = 1.0;
    afStack_40d0[1] = 1.0;
    afStack_40c8[0] = 1.0;
    afStack_40c8[1] = 1.0;
    auVar154._8_4_ = 1.0;
    auVar154._12_4_ = 1.0;
    auVar154._0_4_ = 1.0;
    auVar154._4_4_ = 1.0;
    auVar154._16_4_ = 1.0;
    auVar154._20_4_ = 1.0;
    auVar154._24_4_ = 1.0;
    auVar154._28_4_ = 1.0;
    auVar154._32_4_ = 1.0;
    auVar154._36_4_ = 1.0;
    auVar154._40_4_ = 1.0;
    auVar154._44_4_ = 1.0;
    auVar154._48_4_ = 1.0;
    auVar154._52_4_ = 1.0;
    auVar154._56_4_ = 1.0;
    auVar154._60_4_ = 1.0;
    auVar155 = vaddps_avx512f(auVar155,auVar154);
    local_2640 = local_41c0._0_8_;
    uStack_2638 = local_41c0._8_8_;
    uStack_2630 = uStack_41b0;
    uStack_2628 = uStack_41a8;
    uStack_2620 = uStack_41a0;
    uStack_2618 = uStack_4198;
    uStack_2610 = uStack_4190;
    uStack_2608 = uStack_4188;
    auVar79._16_8_ = uStack_41b0;
    auVar79._0_16_ = local_41c0;
    auVar79._24_8_ = uStack_41a8;
    auVar79._32_8_ = uStack_41a0;
    auVar79._40_8_ = uStack_4198;
    auVar79._48_8_ = uStack_4190;
    auVar79._56_8_ = uStack_4188;
    local_2480 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    vmovdqa64_avx512f(local_2480);
    auVar154 = vcvttps2dq_avx512f(auVar79);
    auVar154 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(auVar154);
    auVar156 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
    local_25c0 = vmovdqa64_avx512f(auVar154);
    local_2600 = vmovdqa64_avx512f(auVar156);
    auVar154 = vmovdqa64_avx512f(local_25c0);
    auVar156 = vmovdqa64_avx512f(local_2600);
    auVar154 = vpaddd_avx512f(auVar154,auVar156);
    auVar154 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(auVar154);
    local_2540 = vmovdqa64_avx512f(auVar154);
    local_2544 = 0x17;
    auVar154 = vmovdqa64_avx512f(local_2540);
    auVar154 = vpslld_avx512f(auVar154,ZEXT416(0x17));
    local_4200 = vmovdqa64_avx512f(auVar154);
    auVar154 = vmovdqa64_avx512f(local_4200);
    local_24c0 = vmovdqa64_avx512f(auVar154);
    local_4300 = vmovdqa64_avx512f(local_24c0);
    local_42c0 = auVar155._0_8_;
    local_4040 = local_42c0;
    uStack_42b8 = auVar155._8_8_;
    uStack_4038 = uStack_42b8;
    uStack_42b0 = auVar155._16_8_;
    uStack_4030 = uStack_42b0;
    uStack_42a8 = auVar155._24_8_;
    uStack_4028 = uStack_42a8;
    uStack_42a0 = auVar155._32_8_;
    uStack_4020 = uStack_42a0;
    uStack_4298 = auVar155._40_8_;
    uStack_4018 = uStack_4298;
    uStack_4290 = auVar155._48_8_;
    uStack_4010 = uStack_4290;
    uStack_4288 = auVar155._56_8_;
    uStack_4008 = uStack_4288;
    local_4080 = local_4300._0_8_;
    uStack_4078 = local_4300._8_8_;
    uStack_4070 = local_4300._16_8_;
    uStack_4068 = local_4300._24_8_;
    uStack_4060 = local_4300._32_8_;
    uStack_4058 = local_4300._40_8_;
    uStack_4050 = local_4300._48_8_;
    uStack_4048 = local_4300._56_8_;
    _local_42c0 = vmulps_avx512f(auVar155,local_4300);
    local_4680 = local_42c0;
    uStack_4678 = uStack_42b8;
    uStack_4670 = uStack_42b0;
    uStack_4668 = uStack_42a8;
    uStack_4660 = uStack_42a0;
    uStack_4658 = uStack_4298;
    uStack_4650 = uStack_4290;
    uStack_4648 = uStack_4288;
    local_44f8 = local_4568;
    local_4540 = local_42c0;
    uStack_4538 = uStack_42b8;
    uStack_4530 = uStack_42b0;
    uStack_4528 = uStack_42a8;
    uStack_4520 = uStack_42a0;
    uStack_4518 = uStack_4298;
    uStack_4510 = uStack_4290;
    uStack_4508 = uStack_4288;
    *(undefined1 (*) [8])local_4568 = local_42c0;
    *(undefined8 *)(local_4568 + 2) = uStack_42b8;
    *(undefined8 *)(local_4568 + 4) = uStack_42b0;
    *(undefined8 *)(local_4568 + 6) = uStack_42a8;
    *(undefined8 *)(local_4568 + 8) = uStack_42a0;
    *(undefined8 *)(local_4568 + 10) = uStack_4298;
    *(undefined8 *)(local_4568 + 0xc) = uStack_4290;
    *(undefined8 *)(local_4568 + 0xe) = uStack_4288;
    local_4560 = local_4560 + 1;
    local_4568 = local_4568 + 0x10;
    local_43c0 = local_4640;
    uStack_43b8 = uStack_4638;
    uStack_43b0 = uStack_4630;
    uStack_43a8 = uStack_4628;
    uStack_43a0 = uStack_4620;
    uStack_4398 = uStack_4618;
    uStack_4390 = uStack_4610;
    uStack_4388 = uStack_4608;
    local_4340 = local_4400;
    uStack_4338 = uStack_43f8;
    uStack_4330 = uStack_43f0;
    uStack_4328 = uStack_43e8;
    uStack_4320 = uStack_43e0;
    uStack_4318 = uStack_43d8;
    uStack_4310 = uStack_43d0;
    uStack_4308 = uStack_43c8;
    _local_41c0 = auVar153;
    local_3fc0 = local_4000;
    uStack_3fb8 = uStack_3ff8;
    uStack_3fb0 = uStack_3ff0;
    uStack_3fa8 = uStack_3fe8;
    uStack_3fa0 = uStack_3fe0;
    uStack_3f98 = uStack_3fd8;
    uStack_3f90 = uStack_3fd0;
    uStack_3f88 = uStack_3fc8;
    _local_3d80 = auVar37;
    local_3980 = local_39c0;
    uStack_3978 = uStack_39b8;
    uStack_3970 = uStack_39b0;
    uStack_3968 = uStack_39a8;
    uStack_3960 = uStack_39a0;
    uStack_3958 = uStack_3998;
    uStack_3950 = uStack_3990;
    uStack_3948 = uStack_3988;
    uStack_38d0 = uStack_4610;
    uStack_38c8 = uStack_4608;
    local_2ac2 = local_3d82;
    local_2ac0 = local_2b40;
    uStack_2ab8 = uStack_2b38;
    uStack_2ab0 = uStack_2b30;
    uStack_2aa8 = uStack_2b28;
    uStack_2aa0 = uStack_2b20;
    uStack_2a98 = uStack_2b18;
    uStack_2a90 = uStack_2b10;
    uStack_2a88 = uStack_2b08;
    local_2942 = local_4242;
    local_2940 = local_29c0;
    uStack_2938 = uStack_29b8;
    uStack_2930 = uStack_29b0;
    uStack_2928 = uStack_29a8;
    uStack_2920 = uStack_29a0;
    uStack_2918 = uStack_2998;
    uStack_2910 = uStack_2990;
    uStack_2908 = uStack_2988;
    local_2082 = local_3d82;
    local_2080 = local_2100;
    uStack_2078 = uStack_20f8;
    uStack_2070 = uStack_20f0;
    uStack_2068 = uStack_20e8;
    uStack_2060 = uStack_20e0;
    uStack_2058 = uStack_20d8;
    uStack_2050 = uStack_20d0;
    uStack_2048 = uStack_20c8;
    local_1fba = local_3d02;
  }
  for (; local_457c + 7 < in_ECX; local_457c = local_457c + 8) {
    local_44f0 = local_4560;
    local_46a0 = *(undefined8 *)*local_4560;
    uStack_4698 = *(undefined8 *)(*local_4560 + 8);
    uStack_4690 = *(undefined8 *)(*local_4560 + 0x10);
    uStack_4688 = *(undefined8 *)(*local_4560 + 0x18);
    local_1fa8 = local_4571;
    local_1fb0 = &local_45c0;
    local_1fb8 = &local_46a0;
    local_1fa0 = local_4720;
    uStack_1f98 = uStack_4718;
    uStack_1f90 = uStack_4710;
    uStack_1f88 = uStack_4708;
    local_1be0 = 0x3f800000;
    uStack_1bdc = 0x3f800000;
    uStack_1bd8 = 0x3f800000;
    uStack_1bd4 = 0x3f800000;
    uStack_1bd0 = 0x3f800000;
    uStack_1bcc = 0x3f800000;
    uStack_1bc8 = 0x3f800000;
    uStack_1bc4 = 0x3f800000;
    local_1940 = 0;
    uStack_1938 = 0;
    uStack_1930 = 0;
    uStack_1928 = 0;
    local_1c00 = vcmpps_avx(*(undefined1 (*) [32])*local_4560,ZEXT1632(ZEXT816(0)),2);
    local_1ba0 = SUB168(*(undefined1 (*) [16])*local_4560,0);
    local_1960 = local_1ba0;
    uStack_1b98 = SUB168(*(undefined1 (*) [16])*local_4560,8);
    uStack_1958 = uStack_1b98;
    local_1980 = 0x800000;
    uStack_197c = 0x800000;
    uStack_1978 = 0x800000;
    uStack_1974 = 0x800000;
    uStack_1970 = 0x800000;
    uStack_196c = 0x800000;
    uStack_1968 = 0x800000;
    uStack_1964 = 0x800000;
    auVar84._8_4_ = 0x800000;
    auVar84._0_8_ = 0x80000000800000;
    auVar84._12_4_ = 0x800000;
    auVar84._16_4_ = 0x800000;
    auVar84._20_4_ = 0x800000;
    auVar84._24_4_ = 0x800000;
    auVar84._28_4_ = 0x800000;
    auVar16 = vmaxps_avx(*(undefined1 (*) [32])*local_4560,auVar84);
    local_1ba0 = auVar16._0_8_;
    local_d00 = local_1ba0;
    uStack_1b98 = auVar16._8_8_;
    uStack_cf8 = uStack_1b98;
    uStack_1b90 = auVar16._16_8_;
    uStack_cf0 = uStack_1b90;
    uStack_1b88 = auVar16._24_8_;
    uStack_ce8 = uStack_1b88;
    local_d20 = local_1ba0;
    uStack_d18 = uStack_1b98;
    uStack_d10 = uStack_1b90;
    uStack_d08 = uStack_1b88;
    local_d24 = 0x17;
    local_be0 = local_1ba0;
    uStack_bd8 = uStack_1b98;
    uStack_bd0 = uStack_1b90;
    uStack_bc8 = uStack_1b88;
    local_be4 = 0x17;
    auVar19 = vpsrld_avx2(auVar16,ZEXT416(0x17));
    local_16c0 = local_1ba0;
    uStack_16b8 = uStack_1b98;
    uStack_16b0 = uStack_1b90;
    uStack_16a8 = uStack_1b88;
    local_16e0 = 0x807fffff;
    uStack_16dc = 0x807fffff;
    uStack_16d8 = 0x807fffff;
    uStack_16d4 = 0x807fffff;
    uStack_16d0 = 0x807fffff;
    uStack_16cc = 0x807fffff;
    uStack_16c8 = 0x807fffff;
    uStack_16c4 = 0x807fffff;
    auVar86._8_4_ = 0x807fffff;
    auVar86._0_8_ = 0x807fffff807fffff;
    auVar86._12_4_ = 0x807fffff;
    auVar86._16_4_ = 0x807fffff;
    auVar86._20_4_ = 0x807fffff;
    auVar86._24_4_ = 0x807fffff;
    auVar86._28_4_ = 0x807fffff;
    auVar16 = vpand_avx2(auVar16,auVar86);
    local_1ba0 = auVar16._0_8_;
    local_c80 = local_1ba0;
    uStack_1b98 = auVar16._8_8_;
    uStack_c78 = uStack_1b98;
    uStack_1b90 = auVar16._16_8_;
    uStack_c70 = uStack_1b90;
    uStack_1b88 = auVar16._24_8_;
    uStack_c68 = uStack_1b88;
    local_ca0 = 0x3f000000;
    uStack_c9c = 0x3f000000;
    uStack_c98 = 0x3f000000;
    uStack_c94 = 0x3f000000;
    uStack_c90 = 0x3f000000;
    uStack_c8c = 0x3f000000;
    uStack_c88 = 0x3f000000;
    uStack_c84 = 0x3f000000;
    auVar110._8_4_ = 0x3f000000;
    auVar110._0_8_ = 0x3f0000003f000000;
    auVar110._12_4_ = 0x3f000000;
    auVar110._16_4_ = 0x3f000000;
    auVar110._20_4_ = 0x3f000000;
    auVar110._24_4_ = 0x3f000000;
    auVar110._28_4_ = 0x3f000000;
    auVar18 = vpor_avx2(auVar16,auVar110);
    local_1bc0._0_8_ = auVar19._0_8_;
    local_c40 = local_1bc0._0_8_;
    local_1bc0._8_8_ = auVar19._8_8_;
    uStack_c38 = local_1bc0._8_8_;
    local_1bc0._16_8_ = auVar19._16_8_;
    uStack_c30 = local_1bc0._16_8_;
    local_1bc0._24_8_ = auVar19._24_8_;
    uStack_c28 = local_1bc0._24_8_;
    local_c60 = 0x7f0000007f;
    uStack_c58 = 0x7f0000007f;
    uStack_c50 = 0x7f0000007f;
    uStack_c48 = 0x7f0000007f;
    local_ba0 = local_1bc0._0_8_;
    uStack_b98 = local_1bc0._8_8_;
    uStack_b90 = local_1bc0._16_8_;
    uStack_b88 = local_1bc0._24_8_;
    local_bc0 = 0x7f0000007f;
    uStack_bb8 = 0x7f0000007f;
    uStack_bb0 = 0x7f0000007f;
    uStack_ba8 = 0x7f0000007f;
    auVar111._8_8_ = 0x7f0000007f;
    auVar111._0_8_ = 0x7f0000007f;
    auVar111._16_8_ = 0x7f0000007f;
    auVar111._24_8_ = 0x7f0000007f;
    local_1bc0 = vpsubd_avx2(auVar19,auVar111);
    local_c20 = local_1bc0._0_8_;
    uStack_c18 = local_1bc0._8_8_;
    uStack_c10 = local_1bc0._16_8_;
    uStack_c08 = local_1bc0._24_8_;
    auVar16 = vcvtdq2ps_avx(local_1bc0);
    local_1c20 = auVar16._0_8_;
    uVar21 = local_1c20;
    uStack_1c18 = auVar16._8_8_;
    uVar24 = uStack_1c18;
    uStack_1c10 = auVar16._16_8_;
    uVar25 = uStack_1c10;
    uStack_1c08 = auVar16._24_8_;
    uVar26 = uStack_1c08;
    local_1b00 = 0x3f8000003f800000;
    uStack_1af8 = 0x3f8000003f800000;
    uStack_1af0 = 0x3f8000003f800000;
    uStack_1ae8 = 0x3f8000003f800000;
    local_1ae0._0_4_ = auVar16._0_4_;
    local_1ae0._4_4_ = auVar16._4_4_;
    uStack_1ad8._0_4_ = auVar16._8_4_;
    uStack_1ad8._4_4_ = auVar16._12_4_;
    uStack_1ad0._0_4_ = auVar16._16_4_;
    uStack_1ad0._4_4_ = auVar16._20_4_;
    uStack_1ac8._0_4_ = auVar16._24_4_;
    uStack_1ac8._4_4_ = auVar16._28_4_;
    local_1c20._4_4_ = local_1ae0._4_4_ + 1.0;
    local_1c20._0_4_ = (float)local_1ae0 + 1.0;
    uStack_1c18._0_4_ = (float)uStack_1ad8 + 1.0;
    uStack_1c18._4_4_ = uStack_1ad8._4_4_ + 1.0;
    uStack_1c10._0_4_ = (float)uStack_1ad0 + 1.0;
    uStack_1c10._4_4_ = uStack_1ad0._4_4_ + 1.0;
    auVar146 = _local_1c20;
    uStack_1c08._0_4_ = (float)uStack_1ac8 + 1.0;
    uStack_1c08._4_4_ = uStack_1ac8._4_4_ + 1.0;
    auVar19 = _local_1c20;
    auVar160._8_4_ = 0x3f3504f3;
    auVar160._0_8_ = 0x3f3504f33f3504f3;
    auVar160._12_4_ = 0x3f3504f3;
    auVar160._16_4_ = 0x3f3504f3;
    auVar160._20_4_ = 0x3f3504f3;
    auVar160._24_4_ = 0x3f3504f3;
    auVar160._28_4_ = 0x3f3504f3;
    local_1c40 = vcmpps_avx(auVar18,auVar160,1);
    local_1ba0 = auVar18._0_8_;
    local_1700 = local_1ba0;
    uStack_1b98 = auVar18._8_8_;
    uStack_16f8 = uStack_1b98;
    uStack_1b90 = auVar18._16_8_;
    uStack_16f0 = uStack_1b90;
    uStack_1b88 = auVar18._24_8_;
    uStack_16e8 = uStack_1b88;
    local_1720 = local_1c40._0_8_;
    uStack_1718 = local_1c40._8_8_;
    uStack_1710 = local_1c40._16_8_;
    uStack_1708 = local_1c40._24_8_;
    local_1c60 = vpand_avx2(auVar18,local_1c40);
    local_1a60 = local_1ba0;
    uStack_1a58 = uStack_1b98;
    uStack_1a50 = uStack_1b90;
    uStack_1a48 = uStack_1b88;
    local_1a80 = 0x3f8000003f800000;
    uStack_1a78 = 0x3f8000003f800000;
    uStack_1a70 = 0x3f8000003f800000;
    uStack_1a68 = 0x3f8000003f800000;
    auVar83._8_8_ = 0x3f8000003f800000;
    auVar83._0_8_ = 0x3f8000003f800000;
    auVar83._16_8_ = 0x3f8000003f800000;
    auVar83._24_8_ = 0x3f8000003f800000;
    auVar16 = vsubps_avx(auVar18,auVar83);
    local_1aa0 = local_1c20;
    uStack_1a98 = uStack_1c18;
    uStack_1c10 = auVar146._16_8_;
    uStack_1a90 = uStack_1c10;
    uStack_1c08 = auVar19._24_8_;
    uStack_1a88 = uStack_1c08;
    local_1740 = 0x3f8000003f800000;
    uStack_1738 = 0x3f8000003f800000;
    uStack_1730 = 0x3f8000003f800000;
    uStack_1728 = 0x3f8000003f800000;
    local_1760 = local_1c40._0_8_;
    uStack_1758 = local_1c40._8_8_;
    uStack_1750 = local_1c40._16_8_;
    uStack_1748 = local_1c40._24_8_;
    auVar85._8_8_ = 0x3f8000003f800000;
    auVar85._0_8_ = 0x3f8000003f800000;
    auVar85._16_8_ = 0x3f8000003f800000;
    auVar85._24_8_ = 0x3f8000003f800000;
    local_1ac0 = vpand_avx2(auVar85,local_1c40);
    auVar82._16_8_ = uStack_1c10;
    auVar82._0_16_ = _local_1c20;
    auVar82._24_8_ = uStack_1c08;
    _local_1c20 = vsubps_avx(auVar82,local_1ac0);
    local_1ba0 = auVar16._0_8_;
    uVar27 = local_1ba0;
    uStack_1b98 = auVar16._8_8_;
    uVar28 = uStack_1b98;
    uStack_1b90 = auVar16._16_8_;
    uVar29 = uStack_1b90;
    uStack_1b88 = auVar16._24_8_;
    uVar30 = uStack_1b88;
    local_1b20._0_4_ = auVar16._0_4_;
    local_1b20._4_4_ = auVar16._4_4_;
    uStack_1b18._0_4_ = auVar16._8_4_;
    uStack_1b18._4_4_ = auVar16._12_4_;
    uStack_1b10._0_4_ = auVar16._16_4_;
    uStack_1b10._4_4_ = auVar16._20_4_;
    uStack_1b08._0_4_ = auVar16._24_4_;
    uStack_1b08._4_4_ = auVar16._28_4_;
    local_1b40._0_4_ = local_1c60._0_4_;
    local_1b40._4_4_ = local_1c60._4_4_;
    uStack_1b38._0_4_ = local_1c60._8_4_;
    uStack_1b38._4_4_ = local_1c60._12_4_;
    uStack_1b30._0_4_ = local_1c60._16_4_;
    uStack_1b30._4_4_ = local_1c60._20_4_;
    uStack_1b28._0_4_ = local_1c60._24_4_;
    uStack_1b28._4_4_ = local_1c60._28_4_;
    local_1ba0._0_4_ = (float)local_1b20 + (float)local_1b40;
    local_1ba0._4_4_ = local_1b20._4_4_ + local_1b40._4_4_;
    uStack_1b18._0_4_ = (float)uStack_1b18 + (float)uStack_1b38;
    uStack_1b18._4_4_ = uStack_1b18._4_4_ + uStack_1b38._4_4_;
    uStack_1b10._0_4_ = (float)uStack_1b10 + (float)uStack_1b30;
    uStack_1b10._4_4_ = uStack_1b10._4_4_ + uStack_1b30._4_4_;
    uStack_1b08._0_4_ = (float)uStack_1b08 + (float)uStack_1b28;
    fStack_1c64 = uStack_1b08._4_4_ + uStack_1b28._4_4_;
    uStack_1b98._0_4_ = (float)uStack_1b18;
    uStack_1b98._4_4_ = uStack_1b18._4_4_;
    uStack_1b90._0_4_ = (float)uStack_1b10;
    uStack_1b90._4_4_ = uStack_1b10._4_4_;
    auVar146 = _local_1ba0;
    uStack_1b88._0_4_ = (float)uStack_1b08;
    uStack_1b88._4_4_ = fStack_1c64;
    auVar18 = _local_1ba0;
    local_19c0 = local_1ba0;
    uStack_19b8 = uStack_1b98;
    uStack_1b90 = auVar146._16_8_;
    uStack_19b0 = uStack_1b90;
    uStack_1b88 = auVar18._24_8_;
    uStack_19a8 = uStack_1b88;
    local_1c80 = (float)local_1ba0._0_4_ * (float)local_1ba0._0_4_;
    fStack_1c7c = (float)local_1ba0._4_4_ * (float)local_1ba0._4_4_;
    fStack_1c78 = (float)uStack_1b18 * (float)uStack_1b18;
    fStack_1c74 = uStack_1b18._4_4_ * uStack_1b18._4_4_;
    fStack_1c70 = (float)uStack_1b10 * (float)uStack_1b10;
    fStack_1c6c = uStack_1b10._4_4_ * uStack_1b10._4_4_;
    fStack_1c68 = (float)uStack_1b08 * (float)uStack_1b08;
    uStack_1c98._0_4_ = 0x3d9021bb;
    local_1ca0 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_1c98._4_4_ = 0x3d9021bb;
    uStack_1c90._0_4_ = 0x3d9021bb;
    uStack_1c90._4_4_ = 0x3d9021bb;
    auVar146 = _local_1ca0;
    uStack_1c88._0_4_ = 0.070376836;
    uStack_1c88._4_4_ = 0x3d9021bb;
    auVar16 = _local_1ca0;
    local_18e0 = local_1ca0;
    local_18f8 = local_1ba0;
    local_1820 = ::_ps256_cephes_log_p1;
    local_1260 = 0x3d9021bb3d9021bb;
    uStack_1258 = uStack_1c98;
    uStack_1c90 = auVar146._16_8_;
    uStack_1250 = uStack_1c90;
    uStack_1c88 = auVar16._24_8_;
    uStack_1248 = uStack_1c88;
    local_1280 = local_1ba0;
    uStack_1278 = uStack_1b98;
    uStack_1270 = uStack_1b90;
    uStack_1268 = uStack_1b88;
    local_12a0[0] = -0.1151461;
    local_12a0[1] = -0.1151461;
    afStack_1298[0] = -0.1151461;
    afStack_1298[1] = -0.1151461;
    afStack_1290[0] = -0.1151461;
    afStack_1290[1] = -0.1151461;
    afStack_1288[0] = -0.1151461;
    afStack_1288[1] = -0.1151461;
    auVar95._8_4_ = -0.1151461;
    auVar95._12_4_ = -0.1151461;
    auVar95._0_4_ = -0.1151461;
    auVar95._4_4_ = -0.1151461;
    auVar95._16_4_ = -0.1151461;
    auVar95._20_4_ = -0.1151461;
    auVar95._24_4_ = -0.1151461;
    auVar95._28_4_ = -0.1151461;
    auVar22 = vfmadd213ps_fma(auVar18,auVar16,auVar95);
    local_1838 = ::_ps256_cephes_log_p2;
    local_1ca0 = auVar22._0_8_;
    local_1200 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_11f8 = uStack_1c98;
    uStack_11f0 = 0;
    uStack_11e8 = 0;
    local_1220 = local_1ba0;
    uStack_1218 = uStack_1b98;
    uStack_1210 = uStack_1b90;
    uStack_1208 = uStack_1b88;
    local_1240[0] = 0.116769984;
    local_1240[1] = 0.116769984;
    afStack_1238[0] = 0.116769984;
    afStack_1238[1] = 0.116769984;
    afStack_1230[0] = 0.116769984;
    afStack_1230[1] = 0.116769984;
    afStack_1228[0] = 0.116769984;
    afStack_1228[1] = 0.116769984;
    auVar96._8_4_ = 0.116769984;
    auVar96._12_4_ = 0.116769984;
    auVar96._0_4_ = 0.116769984;
    auVar96._4_4_ = 0.116769984;
    auVar96._16_4_ = 0.116769984;
    auVar96._20_4_ = 0.116769984;
    auVar96._24_4_ = 0.116769984;
    auVar96._28_4_ = 0.116769984;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar96);
    local_1850 = ::_ps256_cephes_log_p3;
    local_1ca0 = auVar22._0_8_;
    local_11a0 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_1198 = uStack_1c98;
    uStack_1190 = 0;
    uStack_1188 = 0;
    local_11c0 = local_1ba0;
    uStack_11b8 = uStack_1b98;
    uStack_11b0 = uStack_1b90;
    uStack_11a8 = uStack_1b88;
    local_11e0[0] = -0.12420141;
    local_11e0[1] = -0.12420141;
    afStack_11d8[0] = -0.12420141;
    afStack_11d8[1] = -0.12420141;
    afStack_11d0[0] = -0.12420141;
    afStack_11d0[1] = -0.12420141;
    afStack_11c8[0] = -0.12420141;
    afStack_11c8[1] = -0.12420141;
    auVar97._8_4_ = -0.12420141;
    auVar97._12_4_ = -0.12420141;
    auVar97._0_4_ = -0.12420141;
    auVar97._4_4_ = -0.12420141;
    auVar97._16_4_ = -0.12420141;
    auVar97._20_4_ = -0.12420141;
    auVar97._24_4_ = -0.12420141;
    auVar97._28_4_ = -0.12420141;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar97);
    local_1868 = ::_ps256_cephes_log_p4;
    local_1ca0 = auVar22._0_8_;
    local_1140 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_1138 = uStack_1c98;
    uStack_1130 = 0;
    uStack_1128 = 0;
    local_1160 = local_1ba0;
    uStack_1158 = uStack_1b98;
    uStack_1150 = uStack_1b90;
    uStack_1148 = uStack_1b88;
    local_1180[0] = 0.14249323;
    local_1180[1] = 0.14249323;
    afStack_1178[0] = 0.14249323;
    afStack_1178[1] = 0.14249323;
    afStack_1170[0] = 0.14249323;
    afStack_1170[1] = 0.14249323;
    afStack_1168[0] = 0.14249323;
    afStack_1168[1] = 0.14249323;
    auVar98._8_4_ = 0.14249323;
    auVar98._12_4_ = 0.14249323;
    auVar98._0_4_ = 0.14249323;
    auVar98._4_4_ = 0.14249323;
    auVar98._16_4_ = 0.14249323;
    auVar98._20_4_ = 0.14249323;
    auVar98._24_4_ = 0.14249323;
    auVar98._28_4_ = 0.14249323;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar98);
    local_1880 = ::_ps256_cephes_log_p5;
    local_1ca0 = auVar22._0_8_;
    local_10e0 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_10d8 = uStack_1c98;
    uStack_10d0 = 0;
    uStack_10c8 = 0;
    local_1100 = local_1ba0;
    uStack_10f8 = uStack_1b98;
    uStack_10f0 = uStack_1b90;
    uStack_10e8 = uStack_1b88;
    local_1120[0] = -0.16668057;
    local_1120[1] = -0.16668057;
    afStack_1118[0] = -0.16668057;
    afStack_1118[1] = -0.16668057;
    afStack_1110[0] = -0.16668057;
    afStack_1110[1] = -0.16668057;
    afStack_1108[0] = -0.16668057;
    afStack_1108[1] = -0.16668057;
    auVar99._8_4_ = -0.16668057;
    auVar99._12_4_ = -0.16668057;
    auVar99._0_4_ = -0.16668057;
    auVar99._4_4_ = -0.16668057;
    auVar99._16_4_ = -0.16668057;
    auVar99._20_4_ = -0.16668057;
    auVar99._24_4_ = -0.16668057;
    auVar99._28_4_ = -0.16668057;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar99);
    local_1898 = ::_ps256_cephes_log_p6;
    local_1ca0 = auVar22._0_8_;
    local_1080 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_1078 = uStack_1c98;
    uStack_1070 = 0;
    uStack_1068 = 0;
    local_10a0 = local_1ba0;
    uStack_1098 = uStack_1b98;
    uStack_1090 = uStack_1b90;
    uStack_1088 = uStack_1b88;
    local_10c0[0] = 0.20000714;
    local_10c0[1] = 0.20000714;
    afStack_10b8[0] = 0.20000714;
    afStack_10b8[1] = 0.20000714;
    afStack_10b0[0] = 0.20000714;
    afStack_10b0[1] = 0.20000714;
    afStack_10a8[0] = 0.20000714;
    afStack_10a8[1] = 0.20000714;
    auVar100._8_4_ = 0.20000714;
    auVar100._12_4_ = 0.20000714;
    auVar100._0_4_ = 0.20000714;
    auVar100._4_4_ = 0.20000714;
    auVar100._16_4_ = 0.20000714;
    auVar100._20_4_ = 0.20000714;
    auVar100._24_4_ = 0.20000714;
    auVar100._28_4_ = 0.20000714;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar100);
    local_18b0 = ::_ps256_cephes_log_p7;
    local_1ca0 = auVar22._0_8_;
    local_1020 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_1018 = uStack_1c98;
    uStack_1010 = 0;
    uStack_1008 = 0;
    local_1040 = local_1ba0;
    uStack_1038 = uStack_1b98;
    uStack_1030 = uStack_1b90;
    uStack_1028 = uStack_1b88;
    local_1060[0] = -0.24999994;
    local_1060[1] = -0.24999994;
    afStack_1058[0] = -0.24999994;
    afStack_1058[1] = -0.24999994;
    afStack_1050[0] = -0.24999994;
    afStack_1050[1] = -0.24999994;
    afStack_1048[0] = -0.24999994;
    afStack_1048[1] = -0.24999994;
    auVar101._8_4_ = -0.24999994;
    auVar101._12_4_ = -0.24999994;
    auVar101._0_4_ = -0.24999994;
    auVar101._4_4_ = -0.24999994;
    auVar101._16_4_ = -0.24999994;
    auVar101._20_4_ = -0.24999994;
    auVar101._24_4_ = -0.24999994;
    auVar101._28_4_ = -0.24999994;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar101);
    local_18c8 = ::_ps256_cephes_log_p8;
    local_1ca0 = auVar22._0_8_;
    local_fc0 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_fb8 = uStack_1c98;
    uStack_fb0 = 0;
    uStack_fa8 = 0;
    local_fe0 = local_1ba0;
    uStack_fd8 = uStack_1b98;
    uStack_fd0 = uStack_1b90;
    uStack_fc8 = uStack_1b88;
    local_1000[0] = 0.3333333;
    local_1000[1] = 0.3333333;
    afStack_ff8[0] = 0.3333333;
    afStack_ff8[1] = 0.3333333;
    afStack_ff0[0] = 0.3333333;
    afStack_ff0[1] = 0.3333333;
    afStack_fe8[0] = 0.3333333;
    afStack_fe8[1] = 0.3333333;
    auVar102._8_4_ = 0.3333333;
    auVar102._12_4_ = 0.3333333;
    auVar102._0_4_ = 0.3333333;
    auVar102._4_4_ = 0.3333333;
    auVar102._16_4_ = 0.3333333;
    auVar102._20_4_ = 0.3333333;
    auVar102._24_4_ = 0.3333333;
    auVar102._28_4_ = 0.3333333;
    auVar22 = vfmadd213ps_fma(auVar18,ZEXT1632(auVar22),auVar102);
    local_1ca0 = auVar22._0_8_;
    uVar31 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uVar32 = uStack_1c98;
    uStack_19d0 = 0;
    uStack_19c8 = 0;
    local_1a00 = local_1ba0;
    uStack_19f8 = uStack_1b98;
    uStack_19f0 = uStack_1b90;
    uStack_19e8 = uStack_1b88;
    local_19e0._0_4_ = auVar22._0_4_;
    local_19e0._4_4_ = auVar22._4_4_;
    uStack_19d8._0_4_ = auVar22._8_4_;
    uStack_19d8._4_4_ = auVar22._12_4_;
    local_1ca0._4_4_ = local_19e0._4_4_ * (float)local_1ba0._4_4_;
    local_1ca0._0_4_ = (float)local_19e0 * (float)local_1ba0._0_4_;
    uStack_1c98._0_4_ = (float)uStack_19d8 * (float)uStack_1b18;
    uStack_1c98._4_4_ = uStack_19d8._4_4_ * uStack_1b18._4_4_;
    uStack_1c90._0_4_ = (float)uStack_1b10 * 0.0;
    uStack_1c90._4_4_ = uStack_1b10._4_4_ * 0.0;
    auVar146 = _local_1ca0;
    local_1a20 = local_1ca0;
    uStack_1a18 = uStack_1c98;
    uStack_1c90 = auVar146._16_8_;
    uStack_1a10 = uStack_1c90;
    uStack_1c88 = (ulong)(uint)((float)uStack_1b08 * 0.0);
    uStack_1a08 = uStack_1c88;
    local_1a40 = CONCAT44(fStack_1c7c,local_1c80);
    uStack_1a38 = CONCAT44(fStack_1c74,fStack_1c78);
    uStack_1a30 = CONCAT44(fStack_1c6c,fStack_1c70);
    uStack_1a28 = CONCAT44(fStack_1c64,fStack_1c68);
    uStack_1c88._0_4_ = (float)uStack_1b08 * 0.0 * fStack_1c68;
    local_1ca0._4_4_ = local_19e0._4_4_ * (float)local_1ba0._4_4_ * fStack_1c7c;
    local_1ca0._0_4_ = (float)local_19e0 * (float)local_1ba0._0_4_ * local_1c80;
    uStack_1c98._0_4_ = (float)uStack_19d8 * (float)uStack_1b18 * fStack_1c78;
    uStack_1c98._4_4_ = uStack_19d8._4_4_ * uStack_1b18._4_4_ * fStack_1c74;
    uStack_1c90._0_4_ = (float)uStack_1b10 * 0.0 * fStack_1c70;
    uStack_1c90._4_4_ = uStack_1b10._4_4_ * 0.0 * fStack_1c6c;
    auVar146 = _local_1ca0;
    uStack_1c88._4_4_ = 0;
    auVar16 = _local_1ca0;
    local_18e8 = local_1c20;
    local_18d8 = ::_ps256_cephes_log_q1;
    local_f60 = local_1c20;
    uStack_f58 = uStack_1c18;
    uStack_f50 = uStack_1c10;
    uStack_f48 = uStack_1c08;
    local_f80[0] = -0.00021219444;
    local_f80[1] = -0.00021219444;
    afStack_f78[0] = -0.00021219444;
    afStack_f78[1] = -0.00021219444;
    afStack_f70[0] = -0.00021219444;
    afStack_f70[1] = -0.00021219444;
    afStack_f68[0] = -0.00021219444;
    afStack_f68[1] = -0.00021219444;
    local_fa0 = local_1ca0;
    uStack_f98 = uStack_1c98;
    uStack_1c90 = auVar146._16_8_;
    uStack_f90 = uStack_1c90;
    uStack_1c88 = (ulong)(uint)(float)uStack_1c88;
    uStack_f88 = uStack_1c88;
    auVar103._8_4_ = -0.00021219444;
    auVar103._12_4_ = -0.00021219444;
    auVar103._0_4_ = -0.00021219444;
    auVar103._4_4_ = -0.00021219444;
    auVar103._16_4_ = -0.00021219444;
    auVar103._20_4_ = -0.00021219444;
    auVar103._24_4_ = -0.00021219444;
    auVar103._28_4_ = -0.00021219444;
    auVar22 = vfmadd213ps_fma(auVar103,_local_1c20,auVar16);
    local_1638 = &local_1c80;
    local_1640 = ::_ps256_0p5;
    local_de0 = CONCAT44(fStack_1c7c,local_1c80);
    uStack_dd8 = CONCAT44(fStack_1c74,fStack_1c78);
    uStack_dd0 = CONCAT44(fStack_1c6c,fStack_1c70);
    uStack_dc8 = CONCAT44(fStack_1c64,fStack_1c68);
    auVar143._4_4_ = fStack_1c7c;
    auVar143._0_4_ = local_1c80;
    auVar143._8_4_ = fStack_1c78;
    auVar143._12_4_ = fStack_1c74;
    auVar143._16_4_ = fStack_1c70;
    auVar143._20_4_ = fStack_1c6c;
    auVar143._24_4_ = fStack_1c68;
    auVar143._28_4_ = fStack_1c64;
    local_e00[0] = 0.5;
    local_e00[1] = 0.5;
    afStack_df8[0] = 0.5;
    afStack_df8[1] = 0.5;
    afStack_df0[0] = 0.5;
    afStack_df0[1] = 0.5;
    afStack_de8[0] = 0.5;
    afStack_de8[1] = 0.5;
    local_1ca0 = auVar22._0_8_;
    local_e20 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uStack_e18 = uStack_1c98;
    uStack_e10 = 0;
    uStack_e08 = 0;
    auVar107._8_4_ = 0.5;
    auVar107._12_4_ = 0.5;
    auVar107._0_4_ = 0.5;
    auVar107._4_4_ = 0.5;
    auVar107._16_4_ = 0.5;
    auVar107._20_4_ = 0.5;
    auVar107._24_4_ = 0.5;
    auVar107._28_4_ = 0.5;
    auVar22 = vfnmadd213ps_fma(auVar107,auVar143,ZEXT1632(auVar22));
    local_1b60 = local_1ba0;
    uStack_1b58 = uStack_1b98;
    uStack_1b50 = uStack_1b90;
    uStack_1b48 = uStack_1b88;
    local_1ca0 = auVar22._0_8_;
    uVar33 = local_1ca0;
    uStack_1c98 = auVar22._8_8_;
    uVar34 = uStack_1c98;
    uStack_1b70 = 0;
    uStack_1b68 = 0;
    local_1b80._0_4_ = auVar22._0_4_;
    local_1b80._4_4_ = auVar22._4_4_;
    uStack_1b78._0_4_ = auVar22._8_4_;
    uStack_1b78._4_4_ = auVar22._12_4_;
    local_1ba0._4_4_ = (float)local_1ba0._4_4_ + local_1b80._4_4_;
    local_1ba0._0_4_ = (float)local_1ba0._0_4_ + (float)local_1b80;
    uStack_1b98._0_4_ = (float)uStack_1b18 + (float)uStack_1b78;
    uStack_1b98._4_4_ = uStack_1b18._4_4_ + uStack_1b78._4_4_;
    uStack_1b90._0_4_ = (float)uStack_1b10 + 0.0;
    uStack_1b90._4_4_ = uStack_1b10._4_4_ + 0.0;
    auVar146 = _local_1ba0;
    uStack_1b88._0_4_ = (float)uStack_1b08 + 0.0;
    uStack_1b88._4_4_ = fStack_1c64 + 0.0;
    auVar16 = _local_1ba0;
    local_18f0 = ::_ps256_cephes_log_q2;
    local_f00 = local_1c20;
    uStack_ef8 = uStack_1c18;
    uStack_ef0 = uStack_1c10;
    uStack_ee8 = uStack_1c08;
    local_f20[0] = 0.6933594;
    local_f20[1] = 0.6933594;
    afStack_f18[0] = 0.6933594;
    afStack_f18[1] = 0.6933594;
    afStack_f10[0] = 0.6933594;
    afStack_f10[1] = 0.6933594;
    afStack_f08[0] = 0.6933594;
    afStack_f08[1] = 0.6933594;
    local_f40 = local_1ba0;
    uStack_f38 = uStack_1b98;
    uStack_1b90 = auVar146._16_8_;
    uStack_f30 = uStack_1b90;
    uStack_1b88 = auVar16._24_8_;
    uStack_f28 = uStack_1b88;
    auVar104._8_4_ = 0.6933594;
    auVar104._12_4_ = 0.6933594;
    auVar104._0_4_ = 0.6933594;
    auVar104._4_4_ = 0.6933594;
    auVar104._16_4_ = 0.6933594;
    auVar104._20_4_ = 0.6933594;
    auVar104._24_4_ = 0.6933594;
    auVar104._28_4_ = 0.6933594;
    auVar22 = vfmadd213ps_fma(auVar104,_local_1c20,auVar16);
    local_1ba0 = auVar22._0_8_;
    local_cc0 = local_1ba0;
    uStack_1b98 = auVar22._8_8_;
    uStack_cb8 = uStack_1b98;
    uStack_cb0 = 0;
    uStack_ca8 = 0;
    local_ce0 = local_1c00._0_8_;
    uStack_cd8 = local_1c00._8_8_;
    uStack_cd0 = local_1c00._16_8_;
    uStack_cc8 = local_1c00._24_8_;
    _local_1ca0 = vpor_avx2(ZEXT1632(auVar22),local_1c00);
    local_1f40._0_4_ = (float)local_4720;
    local_1f40._4_4_ = (float)((ulong)local_4720 >> 0x20);
    uStack_1f38._0_4_ = (float)uStack_4718;
    uStack_1f38._4_4_ = (float)((ulong)uStack_4718 >> 0x20);
    uStack_1f30._0_4_ = (float)uStack_4710;
    uStack_1f30._4_4_ = (float)((ulong)uStack_4710 >> 0x20);
    uStack_1f28._0_4_ = (float)uStack_4708;
    uStack_1f28._4_4_ = (undefined4)((ulong)uStack_4708 >> 0x20);
    local_1f60._0_4_ = local_1ca0._0_4_;
    local_1f60._4_4_ = local_1ca0._4_4_;
    uStack_1f58._0_4_ = local_1ca0._8_4_;
    uStack_1f58._4_4_ = local_1ca0._12_4_;
    uStack_1f50._0_4_ = local_1ca0._16_4_;
    uStack_1f50._4_4_ = local_1ca0._20_4_;
    uStack_1f48._0_4_ = local_1ca0._24_4_;
    local_1e40._4_4_ = local_1f40._4_4_ * local_1f60._4_4_;
    local_1e40._0_4_ = (float)local_1f40 * (float)local_1f60;
    uStack_1e38._0_4_ = (float)uStack_1f38 * (float)uStack_1f58;
    uStack_1e38._4_4_ = uStack_1f38._4_4_ * uStack_1f58._4_4_;
    uStack_1e30._0_4_ = (float)uStack_1f30 * (float)uStack_1f50;
    uStack_1e30._4_4_ = uStack_1f30._4_4_ * uStack_1f50._4_4_;
    auVar146 = _local_1e40;
    uStack_1e28._0_4_ = (float)uStack_1f28 * (float)uStack_1f48;
    uStack_1e28._4_4_ = uStack_1f28._4_4_;
    auVar16 = _local_1e40;
    local_1920 = 0;
    uStack_1918 = 0;
    uStack_1910 = 0;
    uStack_1908 = 0;
    local_1ec0 = 0x3f800000;
    uStack_1ebc = 0x3f800000;
    uStack_1eb8 = 0x3f800000;
    uStack_1eb4 = 0x3f800000;
    uStack_1eb0 = 0x3f800000;
    uStack_1eac = 0x3f800000;
    uStack_1ea8 = 0x3f800000;
    uStack_1ea4 = 0x3f800000;
    local_1cc0 = local_1e40;
    uStack_1cb8 = uStack_1e38;
    uStack_1e30 = auVar146._16_8_;
    uStack_1cb0 = uStack_1e30;
    uStack_1e28 = auVar16._24_8_;
    uStack_1ca8 = uStack_1e28;
    local_1ce0 = 0x42b0c0a5;
    uStack_1cdc = 0x42b0c0a5;
    uStack_1cd8 = 0x42b0c0a5;
    uStack_1cd4 = 0x42b0c0a5;
    uStack_1cd0 = 0x42b0c0a5;
    uStack_1ccc = 0x42b0c0a5;
    uStack_1cc8 = 0x42b0c0a5;
    uStack_1cc4 = 0x42b0c0a5;
    auVar157._16_8_ = uStack_1e30;
    auVar157._0_16_ = _local_1e40;
    auVar157._24_8_ = uStack_1e28;
    auVar19._8_4_ = 0x42b0c0a5;
    auVar19._0_8_ = 0x42b0c0a542b0c0a5;
    auVar19._12_4_ = 0x42b0c0a5;
    auVar19._16_4_ = 0x42b0c0a5;
    auVar19._20_4_ = 0x42b0c0a5;
    auVar19._24_4_ = 0x42b0c0a5;
    auVar19._28_4_ = 0x42b0c0a5;
    auVar16 = vminps_avx(auVar157,auVar19);
    local_1e40 = auVar16._0_8_;
    local_1d00 = local_1e40;
    uStack_1e38 = auVar16._8_8_;
    uStack_1cf8 = uStack_1e38;
    uStack_1e30 = auVar16._16_8_;
    uStack_1cf0 = uStack_1e30;
    uStack_1e28 = auVar16._24_8_;
    uStack_1ce8 = uStack_1e28;
    local_1d20 = 0xc2b0c0a5;
    uStack_1d1c = 0xc2b0c0a5;
    uStack_1d18 = 0xc2b0c0a5;
    uStack_1d14 = 0xc2b0c0a5;
    uStack_1d10 = 0xc2b0c0a5;
    uStack_1d0c = 0xc2b0c0a5;
    uStack_1d08 = 0xc2b0c0a5;
    uStack_1d04 = 0xc2b0c0a5;
    auVar18._8_4_ = 0xc2b0c0a5;
    auVar18._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar18._12_4_ = 0xc2b0c0a5;
    auVar18._16_4_ = 0xc2b0c0a5;
    auVar18._20_4_ = 0xc2b0c0a5;
    auVar18._24_4_ = 0xc2b0c0a5;
    auVar18._28_4_ = 0xc2b0c0a5;
    auVar18 = vmaxps_avx(auVar16,auVar18);
    local_1808 = local_1e40;
    local_1770 = ::_ps256_cephes_LOG2EF;
    local_1778 = ::_ps256_0p5;
    local_1e40 = auVar18._0_8_;
    local_1500 = local_1e40;
    uStack_1e38 = auVar18._8_8_;
    uStack_14f8 = uStack_1e38;
    uStack_1e30 = auVar18._16_8_;
    uStack_14f0 = uStack_1e30;
    uStack_1e28 = auVar18._24_8_;
    uStack_14e8 = uStack_1e28;
    local_1520[0] = 1.442695;
    local_1520[1] = 1.442695;
    afStack_1518[0] = 1.442695;
    afStack_1518[1] = 1.442695;
    afStack_1510[0] = 1.442695;
    afStack_1510[1] = 1.442695;
    afStack_1508[0] = 1.442695;
    afStack_1508[1] = 1.442695;
    local_1540[0] = 0.5;
    local_1540[1] = 0.5;
    afStack_1538[0] = 0.5;
    afStack_1538[1] = 0.5;
    afStack_1530[0] = 0.5;
    afStack_1530[1] = 0.5;
    afStack_1528[0] = 0.5;
    afStack_1528[1] = 0.5;
    auVar89._8_4_ = 1.442695;
    auVar89._12_4_ = 1.442695;
    auVar89._0_4_ = 1.442695;
    auVar89._4_4_ = 1.442695;
    auVar89._16_4_ = 1.442695;
    auVar89._20_4_ = 1.442695;
    auVar89._24_4_ = 1.442695;
    auVar89._28_4_ = 1.442695;
    auVar88._8_4_ = 0.5;
    auVar88._12_4_ = 0.5;
    auVar88._0_4_ = 0.5;
    auVar88._4_4_ = 0.5;
    auVar88._16_4_ = 0.5;
    auVar88._20_4_ = 0.5;
    auVar88._24_4_ = 0.5;
    auVar88._28_4_ = 0.5;
    auVar23 = vfmadd213ps_fma(auVar89,auVar18,auVar88);
    auVar19 = vroundps_avx(ZEXT1632(auVar23),1);
    auVar16 = vcmpps_avx(ZEXT1632(auVar23),auVar19,1);
    local_1ee0._0_8_ = auVar16._0_8_;
    local_1680 = local_1ee0._0_8_;
    local_1ee0._8_8_ = auVar16._8_8_;
    uStack_1678 = local_1ee0._8_8_;
    local_1ee0._16_8_ = auVar16._16_8_;
    uStack_1670 = local_1ee0._16_8_;
    local_1ee0._24_8_ = auVar16._24_8_;
    uStack_1668 = local_1ee0._24_8_;
    local_16a0 = 0x3f8000003f800000;
    uStack_1698 = 0x3f8000003f800000;
    uStack_1690 = 0x3f8000003f800000;
    uStack_1688 = 0x3f8000003f800000;
    auVar87._8_8_ = 0x3f8000003f800000;
    auVar87._0_8_ = 0x3f8000003f800000;
    auVar87._16_8_ = 0x3f8000003f800000;
    auVar87._24_8_ = 0x3f8000003f800000;
    local_1ee0 = vpand_avx2(auVar16,auVar87);
    local_1e60 = auVar19._0_8_;
    local_1dc0 = local_1e60;
    uStack_1e58 = auVar19._8_8_;
    uStack_1db8 = uStack_1e58;
    uStack_1e50 = auVar19._16_8_;
    uStack_1db0 = uStack_1e50;
    uStack_1e48 = auVar19._24_8_;
    uStack_1da8 = uStack_1e48;
    local_1de0 = local_1ee0._0_8_;
    uStack_1dd8 = local_1ee0._8_8_;
    uStack_1dd0 = local_1ee0._16_8_;
    uStack_1dc8 = local_1ee0._24_8_;
    local_1e80 = vsubps_avx(auVar19,local_1ee0);
    local_1620 = local_1e80;
    local_1610 = ::_ps256_cephes_exp_C1;
    local_ea0 = local_1e80._0_8_;
    uStack_e98 = local_1e80._8_8_;
    uStack_e90 = local_1e80._16_8_;
    uStack_e88 = local_1e80._24_8_;
    local_ec0[0] = 0.6933594;
    local_ec0[1] = 0.6933594;
    afStack_eb8[0] = 0.6933594;
    afStack_eb8[1] = 0.6933594;
    afStack_eb0[0] = 0.6933594;
    afStack_eb0[1] = 0.6933594;
    afStack_ea8[0] = 0.6933594;
    afStack_ea8[1] = 0.6933594;
    local_ee0 = local_1e40;
    uStack_ed8 = uStack_1e38;
    uStack_ed0 = uStack_1e30;
    uStack_ec8 = uStack_1e28;
    auVar105._8_4_ = 0.6933594;
    auVar105._12_4_ = 0.6933594;
    auVar105._0_4_ = 0.6933594;
    auVar105._4_4_ = 0.6933594;
    auVar105._16_4_ = 0.6933594;
    auVar105._20_4_ = 0.6933594;
    auVar105._24_4_ = 0.6933594;
    auVar105._28_4_ = 0.6933594;
    auVar23 = vfnmadd213ps_fma(auVar105,local_1e80,auVar18);
    local_1628 = ::_ps256_cephes_exp_C2;
    local_e40 = local_1e80._0_8_;
    uStack_e38 = local_1e80._8_8_;
    uStack_e30 = local_1e80._16_8_;
    uStack_e28 = local_1e80._24_8_;
    local_e60[0] = -0.00021219444;
    local_e60[1] = -0.00021219444;
    afStack_e58[0] = -0.00021219444;
    afStack_e58[1] = -0.00021219444;
    afStack_e50[0] = -0.00021219444;
    afStack_e50[1] = -0.00021219444;
    afStack_e48[0] = -0.00021219444;
    afStack_e48[1] = -0.00021219444;
    local_1e40 = auVar23._0_8_;
    local_e80 = local_1e40;
    uStack_1e38 = auVar23._8_8_;
    uStack_e78 = uStack_1e38;
    uStack_e70 = 0;
    uStack_e68 = 0;
    auVar106._8_4_ = -0.00021219444;
    auVar106._12_4_ = -0.00021219444;
    auVar106._0_4_ = -0.00021219444;
    auVar106._4_4_ = -0.00021219444;
    auVar106._16_4_ = -0.00021219444;
    auVar106._20_4_ = -0.00021219444;
    auVar106._24_4_ = -0.00021219444;
    auVar106._28_4_ = -0.00021219444;
    auVar23 = vfnmadd213ps_fma(auVar106,local_1e80,ZEXT1632(auVar23));
    auVar157 = ZEXT1632(auVar23);
    local_1e40 = auVar23._0_8_;
    local_1d60 = local_1e40;
    uStack_1e38 = auVar23._8_8_;
    uStack_1d58 = uStack_1e38;
    uStack_1d50 = 0;
    uStack_1d48 = 0;
    local_1d40._0_4_ = auVar23._0_4_;
    local_1d40._4_4_ = auVar23._4_4_;
    uStack_1d38._0_4_ = auVar23._8_4_;
    uStack_1d38._4_4_ = auVar23._12_4_;
    local_1e60._4_4_ = local_1d40._4_4_ * local_1d40._4_4_;
    local_1e60._0_4_ = (float)local_1d40 * (float)local_1d40;
    local_12e0 = local_1e60;
    uStack_1e58._0_4_ = (float)uStack_1d38 * (float)uStack_1d38;
    uStack_1e58._4_4_ = uStack_1d38._4_4_ * uStack_1d38._4_4_;
    auVar17 = _local_1e60;
    _local_1e60 = ZEXT1632(_local_1e60);
    auVar19 = _local_1e60;
    uStack_1ef8._0_4_ = 0x39506967;
    local_1f00 = (undefined1  [8])0x3950696739506967;
    uStack_1ef8._4_4_ = 0x39506967;
    uStack_1ef0._0_4_ = 0x39506967;
    uStack_1ef0._4_4_ = 0x39506967;
    auVar146 = _local_1f00;
    uStack_1ee8._0_4_ = 0x39506967;
    uStack_1ee8._4_4_ = 0x39506967;
    auVar16 = _local_1f00;
    local_17f8 = local_1f00;
    local_1790 = ::_ps256_cephes_exp_p1;
    local_14a0 = 0x3950696739506967;
    uStack_1498 = uStack_1ef8;
    uStack_1ef0 = auVar146._16_8_;
    uStack_1490 = uStack_1ef0;
    uStack_1ee8 = auVar16._24_8_;
    uStack_1488 = uStack_1ee8;
    local_14c0 = local_1e40;
    uStack_14b8 = uStack_1e38;
    uStack_14b0 = 0;
    uStack_14a8 = 0;
    local_14e0[0] = 0.0013981999;
    local_14e0[1] = 0.0013981999;
    afStack_14d8[0] = 0.0013981999;
    afStack_14d8[1] = 0.0013981999;
    afStack_14d0[0] = 0.0013981999;
    afStack_14d0[1] = 0.0013981999;
    afStack_14c8[0] = 0.0013981999;
    afStack_14c8[1] = 0.0013981999;
    auVar90._8_4_ = 0.0013981999;
    auVar90._12_4_ = 0.0013981999;
    auVar90._0_4_ = 0.0013981999;
    auVar90._4_4_ = 0.0013981999;
    auVar90._16_4_ = 0.0013981999;
    auVar90._20_4_ = 0.0013981999;
    auVar90._24_4_ = 0.0013981999;
    auVar90._28_4_ = 0.0013981999;
    auVar23 = vfmadd213ps_fma(auVar157,auVar16,auVar90);
    local_17a8 = ::_ps256_cephes_exp_p2;
    local_1f00 = auVar23._0_8_;
    local_1440 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uStack_1438 = uStack_1ef8;
    uStack_1430 = 0;
    uStack_1428 = 0;
    local_1460 = local_1e40;
    uStack_1458 = uStack_1e38;
    uStack_1450 = 0;
    uStack_1448 = 0;
    local_1480[0] = 0.008333452;
    local_1480[1] = 0.008333452;
    afStack_1478[0] = 0.008333452;
    afStack_1478[1] = 0.008333452;
    afStack_1470[0] = 0.008333452;
    afStack_1470[1] = 0.008333452;
    afStack_1468[0] = 0.008333452;
    afStack_1468[1] = 0.008333452;
    auVar91._8_4_ = 0.008333452;
    auVar91._12_4_ = 0.008333452;
    auVar91._0_4_ = 0.008333452;
    auVar91._4_4_ = 0.008333452;
    auVar91._16_4_ = 0.008333452;
    auVar91._20_4_ = 0.008333452;
    auVar91._24_4_ = 0.008333452;
    auVar91._28_4_ = 0.008333452;
    auVar23 = vfmadd213ps_fma(auVar157,ZEXT1632(auVar23),auVar91);
    local_17c0 = ::_ps256_cephes_exp_p3;
    local_1f00 = auVar23._0_8_;
    local_13e0 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uStack_13d8 = uStack_1ef8;
    uStack_13d0 = 0;
    uStack_13c8 = 0;
    local_1400 = local_1e40;
    uStack_13f8 = uStack_1e38;
    uStack_13f0 = 0;
    uStack_13e8 = 0;
    local_1420[0] = 0.041665796;
    local_1420[1] = 0.041665796;
    afStack_1418[0] = 0.041665796;
    afStack_1418[1] = 0.041665796;
    afStack_1410[0] = 0.041665796;
    afStack_1410[1] = 0.041665796;
    afStack_1408[0] = 0.041665796;
    afStack_1408[1] = 0.041665796;
    auVar92._8_4_ = 0.041665796;
    auVar92._12_4_ = 0.041665796;
    auVar92._0_4_ = 0.041665796;
    auVar92._4_4_ = 0.041665796;
    auVar92._16_4_ = 0.041665796;
    auVar92._20_4_ = 0.041665796;
    auVar92._24_4_ = 0.041665796;
    auVar92._28_4_ = 0.041665796;
    auVar23 = vfmadd213ps_fma(auVar157,ZEXT1632(auVar23),auVar92);
    local_17d8 = ::_ps256_cephes_exp_p4;
    local_1f00 = auVar23._0_8_;
    local_1380 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uStack_1378 = uStack_1ef8;
    uStack_1370 = 0;
    uStack_1368 = 0;
    local_13a0 = local_1e40;
    uStack_1398 = uStack_1e38;
    uStack_1390 = 0;
    uStack_1388 = 0;
    local_13c0[0] = 0.16666666;
    local_13c0[1] = 0.16666666;
    afStack_13b8[0] = 0.16666666;
    afStack_13b8[1] = 0.16666666;
    afStack_13b0[0] = 0.16666666;
    afStack_13b0[1] = 0.16666666;
    afStack_13a8[0] = 0.16666666;
    afStack_13a8[1] = 0.16666666;
    auVar93._8_4_ = 0.16666666;
    auVar93._12_4_ = 0.16666666;
    auVar93._0_4_ = 0.16666666;
    auVar93._4_4_ = 0.16666666;
    auVar93._16_4_ = 0.16666666;
    auVar93._20_4_ = 0.16666666;
    auVar93._24_4_ = 0.16666666;
    auVar93._28_4_ = 0.16666666;
    auVar23 = vfmadd213ps_fma(auVar157,ZEXT1632(auVar23),auVar93);
    local_17f0 = ::_ps256_cephes_exp_p5;
    local_1f00 = auVar23._0_8_;
    local_1320 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uStack_1318 = uStack_1ef8;
    uStack_1310 = 0;
    uStack_1308 = 0;
    local_1340 = local_1e40;
    uStack_1338 = uStack_1e38;
    uStack_1330 = 0;
    uStack_1328 = 0;
    local_1360[0] = 0.5;
    local_1360[1] = 0.5;
    afStack_1358[0] = 0.5;
    afStack_1358[1] = 0.5;
    afStack_1350[0] = 0.5;
    afStack_1350[1] = 0.5;
    afStack_1348[0] = 0.5;
    afStack_1348[1] = 0.5;
    auVar94._8_4_ = 0.5;
    auVar94._12_4_ = 0.5;
    auVar94._0_4_ = 0.5;
    auVar94._4_4_ = 0.5;
    auVar94._16_4_ = 0.5;
    auVar94._20_4_ = 0.5;
    auVar94._24_4_ = 0.5;
    auVar94._28_4_ = 0.5;
    auVar23 = vfmadd213ps_fma(auVar157,ZEXT1632(auVar23),auVar94);
    local_1800 = local_1e60;
    local_1f00 = auVar23._0_8_;
    local_12c0 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uStack_12b8 = uStack_1ef8;
    uStack_12b0 = 0;
    uStack_12a8 = 0;
    uStack_1e58 = auVar17._8_8_;
    uStack_12d8 = uStack_1e58;
    uStack_12d0 = 0;
    uStack_12c8 = 0;
    local_1300 = local_1e40;
    uStack_12f8 = uStack_1e38;
    uStack_12f0 = 0;
    uStack_12e8 = 0;
    auVar23 = vfmadd213ps_fma(auVar19,ZEXT1632(auVar23),auVar157);
    local_1f00 = auVar23._0_8_;
    uVar35 = local_1f00;
    uStack_1ef8 = auVar23._8_8_;
    uVar36 = uStack_1ef8;
    uStack_1df0 = 0;
    uStack_1de8 = 0;
    local_1e20 = 0x3f8000003f800000;
    uStack_1e18 = 0x3f8000003f800000;
    uStack_1e10 = 0x3f8000003f800000;
    uStack_1e08 = 0x3f8000003f800000;
    local_1e00._0_4_ = auVar23._0_4_;
    local_1e00._4_4_ = auVar23._4_4_;
    uStack_1df8._0_4_ = auVar23._8_4_;
    uStack_1df8._4_4_ = auVar23._12_4_;
    local_1f00._4_4_ = local_1e00._4_4_ + 1.0;
    local_1f00._0_4_ = (float)local_1e00 + 1.0;
    uStack_1ef8._0_4_ = (float)uStack_1df8 + 1.0;
    uStack_1ef8._4_4_ = uStack_1df8._4_4_ + 1.0;
    uStack_1ef0._0_4_ = 0x3f800000;
    uStack_1ef0._4_4_ = 0x3f800000;
    auVar146 = _local_1f00;
    uStack_1ee8._0_4_ = 0x3f800000;
    uStack_1ee8._4_4_ = 0x3f800000;
    auVar18 = _local_1f00;
    local_1600._0_4_ = local_1e80._0_4_;
    local_1600._4_4_ = local_1e80._4_4_;
    uStack_15f8._0_4_ = local_1e80._8_4_;
    uStack_15f8._4_4_ = local_1e80._12_4_;
    uStack_15f0._0_4_ = local_1e80._16_4_;
    uStack_15f0._4_4_ = local_1e80._20_4_;
    uStack_15e8._0_4_ = local_1e80._24_4_;
    uStack_15e8._4_4_ = local_1e80._28_4_;
    local_1ea0._4_4_ = (int)local_1600._4_4_;
    local_1ea0._0_4_ = (int)(float)local_1600;
    local_1ea0._8_4_ = (int)(float)uStack_15f8;
    local_1ea0._12_4_ = (int)uStack_15f8._4_4_;
    local_1ea0._16_4_ = (int)(float)uStack_15f0;
    local_1ea0._20_4_ = (int)uStack_15f0._4_4_;
    auVar149 = local_1ea0._0_24_;
    local_1ea0._24_4_ = (int)(float)uStack_15e8;
    local_1ea0._28_4_ = (int)uStack_15e8._4_4_;
    auVar16 = local_1ea0;
    local_15c0 = local_1ea0._0_8_;
    uStack_15b8 = local_1ea0._8_8_;
    local_1ea0._16_8_ = auVar149._16_8_;
    uStack_15b0 = local_1ea0._16_8_;
    local_1ea0._24_8_ = auVar16._24_8_;
    uStack_15a8 = local_1ea0._24_8_;
    local_15e0 = 0x7f0000007f;
    uStack_15d8 = 0x7f0000007f;
    uStack_15d0 = 0x7f0000007f;
    uStack_15c8 = 0x7f0000007f;
    local_da0 = local_1ea0._0_8_;
    uStack_d98 = local_1ea0._8_8_;
    uStack_d90 = local_1ea0._16_8_;
    uStack_d88 = local_1ea0._24_8_;
    local_dc0 = 0x7f0000007f;
    uStack_db8 = 0x7f0000007f;
    uStack_db0 = 0x7f0000007f;
    uStack_da8 = 0x7f0000007f;
    auVar109._16_8_ = local_1ea0._16_8_;
    auVar109._0_16_ = local_1ea0._0_16_;
    auVar109._24_8_ = local_1ea0._24_8_;
    auVar108._8_8_ = 0x7f0000007f;
    auVar108._0_8_ = 0x7f0000007f;
    auVar108._16_8_ = 0x7f0000007f;
    auVar108._24_8_ = 0x7f0000007f;
    auVar16 = vpaddd_avx2(auVar109,auVar108);
    local_1ea0._0_8_ = auVar16._0_8_;
    local_1580 = local_1ea0._0_8_;
    local_1ea0._8_8_ = auVar16._8_8_;
    uStack_1578 = local_1ea0._8_8_;
    local_1ea0._16_8_ = auVar16._16_8_;
    uStack_1570 = local_1ea0._16_8_;
    local_1ea0._24_8_ = auVar16._24_8_;
    uStack_1568 = local_1ea0._24_8_;
    local_1584 = 0x17;
    local_d60 = local_1ea0._0_8_;
    uStack_d58 = local_1ea0._8_8_;
    uStack_d50 = local_1ea0._16_8_;
    uStack_d48 = local_1ea0._24_8_;
    local_d64 = 0x17;
    local_1ea0 = vpslld_avx2(auVar16,ZEXT416(0x17));
    local_1560 = local_1ea0._0_8_;
    uStack_1558 = local_1ea0._8_8_;
    uStack_1550 = local_1ea0._16_8_;
    uStack_1548 = local_1ea0._24_8_;
    local_1f20 = local_1ea0._0_8_;
    uStack_1f18 = local_1ea0._8_8_;
    uStack_1f10 = local_1ea0._16_8_;
    uStack_1f08 = local_1ea0._24_8_;
    local_1d80 = local_1f00;
    uStack_1d78 = uStack_1ef8;
    uStack_1ef0 = auVar146._16_8_;
    uStack_1d70 = uStack_1ef0;
    uStack_1ee8 = auVar18._24_8_;
    uStack_1d68 = uStack_1ee8;
    local_1da0._0_4_ = local_1ea0._0_4_;
    local_1da0._4_4_ = local_1ea0._4_4_;
    uStack_1d98._0_4_ = local_1ea0._8_4_;
    uStack_1d98._4_4_ = local_1ea0._12_4_;
    uStack_1d90._0_4_ = local_1ea0._16_4_;
    uStack_1d90._4_4_ = local_1ea0._20_4_;
    uStack_1d88._0_4_ = local_1ea0._24_4_;
    local_1f00._4_4_ = (local_1e00._4_4_ + 1.0) * local_1da0._4_4_;
    local_1f00._0_4_ = ((float)local_1e00 + 1.0) * (float)local_1da0;
    uStack_1ef8._0_4_ = ((float)uStack_1df8 + 1.0) * (float)uStack_1d98;
    uStack_1ef8._4_4_ = (uStack_1df8._4_4_ + 1.0) * uStack_1d98._4_4_;
    uStack_1ef0._0_4_ = (float)uStack_1d90 * 1.0;
    uStack_1ef0._4_4_ = uStack_1d90._4_4_ * 1.0;
    auVar146 = _local_1f00;
    uStack_1ee8._0_4_ = (float)uStack_1d88 * 1.0;
    uStack_1ee8._4_4_ = 0x3f800000;
    auVar16 = _local_1f00;
    local_46c0 = local_1f00;
    uStack_46b8 = uStack_1ef8;
    uStack_1ef0 = auVar146._16_8_;
    uStack_46b0 = uStack_1ef0;
    uStack_1ee8 = auVar16._24_8_;
    uStack_46a8 = uStack_1ee8;
    local_44a8 = local_4568;
    local_44e0 = local_1f00;
    uStack_44d8 = uStack_1ef8;
    uStack_44d0 = uStack_1ef0;
    uStack_44c8 = uStack_1ee8;
    *(undefined1 (*) [8])local_4568 = local_1f00;
    *(undefined8 *)(local_4568 + 2) = uStack_1ef8;
    *(undefined8 *)(local_4568 + 4) = uStack_1ef0;
    *(undefined8 *)(local_4568 + 6) = uStack_1ee8;
    local_4560 = (undefined1 (*) [64])(*local_4560 + 0x20);
    local_4568 = local_4568 + 8;
    local_1f80 = local_46a0;
    uStack_1f78 = uStack_4698;
    uStack_1f70 = uStack_4690;
    uStack_1f68 = uStack_4688;
    local_1f60 = local_1ca0;
    uStack_1f58 = uStack_1c98;
    uStack_1f50 = uStack_1c90;
    uStack_1f48 = uStack_1c88;
    local_1f40 = local_1fa0;
    uStack_1f38 = uStack_1f98;
    uStack_1f30 = uStack_1f90;
    uStack_1f28 = uStack_1f88;
    _local_1f00 = auVar16;
    _local_1e60 = auVar19;
    _local_1e40 = auVar157;
    local_1e00 = uVar35;
    uStack_1df8 = uVar36;
    local_1da0 = local_1ea0._0_8_;
    uStack_1d98 = local_1ea0._8_8_;
    uStack_1d90 = local_1ea0._16_8_;
    uStack_1d88 = local_1ea0._24_8_;
    local_1d40 = local_1d60;
    uStack_1d38 = uStack_1d58;
    uStack_1d30 = uStack_1d50;
    uStack_1d28 = uStack_1d48;
    _local_1ba0 = ZEXT1632(auVar22);
    local_1b80 = uVar33;
    uStack_1b78 = uVar34;
    local_1b40 = local_1c60._0_8_;
    uStack_1b38 = local_1c60._8_8_;
    uStack_1b30 = local_1c60._16_8_;
    uStack_1b28 = local_1c60._24_8_;
    local_1b20 = uVar27;
    uStack_1b18 = uVar28;
    uStack_1b10 = uVar29;
    uStack_1b08 = uVar30;
    local_1ae0 = uVar21;
    uStack_1ad8 = uVar24;
    uStack_1ad0 = uVar25;
    uStack_1ac8 = uVar26;
    local_19e0 = uVar31;
    uStack_19d8 = uVar32;
    local_19a0 = local_19c0;
    uStack_1998 = uStack_19b8;
    uStack_1990 = uStack_19b0;
    uStack_1988 = uStack_19a8;
    uStack_1950 = uStack_4690;
    uStack_1948 = uStack_4688;
    local_18d0 = local_18e8;
    local_18c0 = local_18f8;
    local_18b8 = local_18e0;
    local_18a8 = local_18f8;
    local_18a0 = local_18e0;
    local_1890 = local_18f8;
    local_1888 = local_18e0;
    local_1878 = local_18f8;
    local_1870 = local_18e0;
    local_1860 = local_18f8;
    local_1858 = local_18e0;
    local_1848 = local_18f8;
    local_1840 = local_18e0;
    local_1830 = local_18f8;
    local_1828 = local_18e0;
    local_1818 = local_18f8;
    local_1810 = local_18e0;
    local_17e8 = local_1808;
    local_17e0 = local_17f8;
    local_17d0 = local_1808;
    local_17c8 = local_17f8;
    local_17b8 = local_1808;
    local_17b0 = local_17f8;
    local_17a0 = local_1808;
    local_1798 = local_17f8;
    local_1788 = local_1808;
    local_1780 = local_17f8;
    local_1768 = local_1808;
    local_1648 = local_18e0;
    local_1630 = local_1808;
    local_1618 = local_1808;
    local_1608 = local_1620;
    local_1600 = local_1e80._0_8_;
    uStack_15f8 = local_1e80._8_8_;
    uStack_15f0 = local_1e80._16_8_;
    uStack_15e8 = local_1e80._24_8_;
  }
  for (; local_456c = in_ECX, local_457c + 3 < in_ECX; local_457c = local_457c + 4) {
    local_44a0 = local_4560;
    local_46d0 = *(undefined8 *)*local_4560;
    uStack_46c8 = *(undefined8 *)(*local_4560 + 8);
    local_b68 = local_4571;
    local_b70 = &local_4590;
    local_b78 = &local_46d0;
    local_b60 = local_46f0;
    uStack_b58 = uStack_46e8;
    local_940 = 0x3f800000;
    uStack_93c = 0x3f800000;
    uStack_938 = 0x3f800000;
    uStack_934 = 0x3f800000;
    local_7f0 = (undefined1  [16])0x0;
    local_140 = 0;
    uStack_138 = 0;
    local_950 = vcmpps_avx(*(undefined1 (*) [16])*local_4560,ZEXT816(0),2);
    local_810 = 0x800000;
    uStack_80c = 0x800000;
    uStack_808 = 0x800000;
    uStack_804 = 0x800000;
    auVar114._8_4_ = 0x800000;
    auVar114._0_8_ = 0x80000000800000;
    auVar114._12_4_ = 0x800000;
    auVar22 = vmaxps_avx(*(undefined1 (*) [16])*local_4560,auVar114);
    local_920 = auVar22._0_8_;
    local_100 = local_920;
    uStack_918 = auVar22._8_8_;
    uStack_f8 = uStack_918;
    local_110 = local_920;
    uStack_108 = uStack_918;
    local_114 = 0x17;
    auVar17 = vpsrld_avx(auVar22,ZEXT416(0x17));
    local_720 = local_920;
    uStack_718 = uStack_918;
    local_730 = 0x807fffff;
    uStack_72c = 0x807fffff;
    uStack_728 = 0x807fffff;
    uStack_724 = 0x807fffff;
    auVar118._8_4_ = 0x807fffff;
    auVar118._0_8_ = 0x807fffff807fffff;
    auVar118._12_4_ = 0x807fffff;
    auVar22 = vpand_avx(auVar22,auVar118);
    local_920 = auVar22._0_8_;
    local_c0 = local_920;
    uStack_918 = auVar22._8_8_;
    uStack_b8 = uStack_918;
    local_d0 = 0x3f000000;
    uStack_cc = 0x3f000000;
    uStack_c8 = 0x3f000000;
    uStack_c4 = 0x3f000000;
    auVar140._8_4_ = 0x3f000000;
    auVar140._0_8_ = 0x3f0000003f000000;
    auVar140._12_4_ = 0x3f000000;
    auVar23 = vpor_avx(auVar22,auVar140);
    local_930._0_8_ = auVar17._0_8_;
    local_a0 = local_930._0_8_;
    local_930._8_8_ = auVar17._8_8_;
    uStack_98 = local_930._8_8_;
    local_b0 = 0x7f0000007f;
    uStack_a8 = 0x7f0000007f;
    auVar141._8_8_ = 0x7f0000007f;
    auVar141._0_8_ = 0x7f0000007f;
    local_930 = vpsubd_avx(auVar17,auVar141);
    local_7b0 = local_930._0_8_;
    uStack_7a8 = local_930._8_8_;
    auVar22 = vcvtdq2ps_avx(local_930);
    local_960 = auVar22._0_8_;
    uVar21 = local_960;
    uStack_958 = auVar22._8_8_;
    uVar24 = uStack_958;
    local_8d0 = 0x3f8000003f800000;
    uStack_8c8 = 0x3f8000003f800000;
    local_8c0._0_4_ = auVar22._0_4_;
    local_8c0._4_4_ = auVar22._4_4_;
    uStack_8b8._0_4_ = auVar22._8_4_;
    uStack_8b8._4_4_ = auVar22._12_4_;
    local_960._4_4_ = local_8c0._4_4_ + 1.0;
    local_960._0_4_ = (float)local_8c0 + 1.0;
    uStack_958._0_4_ = (float)uStack_8b8 + 1.0;
    uStack_958._4_4_ = uStack_8b8._4_4_ + 1.0;
    local_920 = auVar23._0_8_;
    local_80 = local_920;
    uStack_918 = auVar23._8_8_;
    uStack_78 = uStack_918;
    local_90 = 0x3f3504f3;
    uStack_8c = 0x3f3504f3;
    uStack_88 = 0x3f3504f3;
    uStack_84 = 0x3f3504f3;
    auVar142._8_4_ = 0x3f3504f3;
    auVar142._0_8_ = 0x3f3504f33f3504f3;
    auVar142._12_4_ = 0x3f3504f3;
    local_970 = vcmpps_avx(auVar23,auVar142,1);
    local_740 = local_920;
    uStack_738 = uStack_918;
    local_750 = local_970._0_8_;
    uStack_748 = local_970._8_8_;
    local_980 = vpand_avx(auVar23,local_970);
    local_880 = local_920;
    uStack_878 = uStack_918;
    local_890 = 0x3f8000003f800000;
    uStack_888 = 0x3f8000003f800000;
    auVar113._8_8_ = 0x3f8000003f800000;
    auVar113._0_8_ = 0x3f8000003f800000;
    auVar22 = vsubps_avx(auVar23,auVar113);
    local_8a0 = local_960;
    uStack_898 = uStack_958;
    local_760 = 0x3f8000003f800000;
    uStack_758 = 0x3f8000003f800000;
    local_770 = local_970._0_8_;
    uStack_768 = local_970._8_8_;
    auVar117._8_8_ = 0x3f8000003f800000;
    auVar117._0_8_ = 0x3f8000003f800000;
    local_8b0 = vpand_avx(auVar117,local_970);
    auVar112._8_8_ = uStack_958;
    auVar112._0_8_ = local_960;
    _local_960 = vsubps_avx(auVar112,local_8b0);
    local_920 = auVar22._0_8_;
    uVar25 = local_920;
    uStack_918 = auVar22._8_8_;
    uVar26 = uStack_918;
    local_8e0._0_4_ = auVar22._0_4_;
    local_8e0._4_4_ = auVar22._4_4_;
    uStack_8d8._0_4_ = auVar22._8_4_;
    uStack_8d8._4_4_ = auVar22._12_4_;
    local_8f0._0_4_ = local_980._0_4_;
    local_8f0._4_4_ = local_980._4_4_;
    uStack_8e8._0_4_ = local_980._8_4_;
    uStack_8e8._4_4_ = local_980._12_4_;
    local_920._0_4_ = (float)local_8e0 + (float)local_8f0;
    local_920._4_4_ = local_8e0._4_4_ + local_8f0._4_4_;
    uStack_8d8._0_4_ = (float)uStack_8d8 + (float)uStack_8e8;
    uStack_8d8._4_4_ = uStack_8d8._4_4_ + uStack_8e8._4_4_;
    uStack_918._0_4_ = (float)uStack_8d8;
    uStack_918._4_4_ = uStack_8d8._4_4_;
    local_830 = local_920;
    uStack_828 = uStack_918;
    local_990 = (float)local_920._0_4_ * (float)local_920._0_4_;
    fStack_98c = (float)local_920._4_4_ * (float)local_920._4_4_;
    fStack_988 = (float)uStack_8d8 * (float)uStack_8d8;
    fStack_984 = uStack_8d8._4_4_ * uStack_8d8._4_4_;
    uStack_998._0_4_ = 0x3d9021bb;
    local_9a0 = (undefined1  [8])0x3d9021bb3d9021bb;
    uStack_998._4_4_ = 0x3d9021bb;
    local_6e8 = local_9a0;
    local_6a0 = local_920;
    local_5c8 = ::_ps_cephes_log_p1;
    local_300 = 0x3d9021bb3d9021bb;
    uStack_2f8 = uStack_998;
    local_310 = local_920;
    uStack_308 = uStack_918;
    local_320[0] = -0.1151461;
    local_320[1] = -0.1151461;
    afStack_318[0] = -0.1151461;
    afStack_318[1] = -0.1151461;
    auVar130._8_4_ = -0.1151461;
    auVar130._12_4_ = -0.1151461;
    auVar130._0_4_ = -0.1151461;
    auVar130._4_4_ = -0.1151461;
    auVar22 = vfmadd213ps_fma(_local_920,_local_9a0,auVar130);
    local_5e0 = ::_ps_cephes_log_p2;
    local_9a0 = auVar22._0_8_;
    local_2d0 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_2c8 = uStack_998;
    local_2e0 = local_920;
    uStack_2d8 = uStack_918;
    local_2f0[0] = 0.116769984;
    local_2f0[1] = 0.116769984;
    afStack_2e8[0] = 0.116769984;
    afStack_2e8[1] = 0.116769984;
    auVar131._8_4_ = 0.116769984;
    auVar131._12_4_ = 0.116769984;
    auVar131._0_4_ = 0.116769984;
    auVar131._4_4_ = 0.116769984;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar131);
    local_5f8 = ::_ps_cephes_log_p3;
    local_9a0 = auVar22._0_8_;
    local_2a0 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_298 = uStack_998;
    local_2b0 = local_920;
    uStack_2a8 = uStack_918;
    local_2c0[0] = -0.12420141;
    local_2c0[1] = -0.12420141;
    afStack_2b8[0] = -0.12420141;
    afStack_2b8[1] = -0.12420141;
    auVar132._8_4_ = -0.12420141;
    auVar132._12_4_ = -0.12420141;
    auVar132._0_4_ = -0.12420141;
    auVar132._4_4_ = -0.12420141;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar132);
    local_610 = ::_ps_cephes_log_p4;
    local_9a0 = auVar22._0_8_;
    local_270 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_268 = uStack_998;
    local_280 = local_920;
    uStack_278 = uStack_918;
    local_290[0] = 0.14249323;
    local_290[1] = 0.14249323;
    afStack_288[0] = 0.14249323;
    afStack_288[1] = 0.14249323;
    auVar133._8_4_ = 0.14249323;
    auVar133._12_4_ = 0.14249323;
    auVar133._0_4_ = 0.14249323;
    auVar133._4_4_ = 0.14249323;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar133);
    local_628 = ::_ps_cephes_log_p5;
    local_9a0 = auVar22._0_8_;
    local_240 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_238 = uStack_998;
    local_250 = local_920;
    uStack_248 = uStack_918;
    local_260[0] = -0.16668057;
    local_260[1] = -0.16668057;
    afStack_258[0] = -0.16668057;
    afStack_258[1] = -0.16668057;
    auVar134._8_4_ = -0.16668057;
    auVar134._12_4_ = -0.16668057;
    auVar134._0_4_ = -0.16668057;
    auVar134._4_4_ = -0.16668057;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar134);
    local_640 = ::_ps_cephes_log_p6;
    local_9a0 = auVar22._0_8_;
    local_210 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_208 = uStack_998;
    local_220 = local_920;
    uStack_218 = uStack_918;
    local_230[0] = 0.20000714;
    local_230[1] = 0.20000714;
    afStack_228[0] = 0.20000714;
    afStack_228[1] = 0.20000714;
    auVar135._8_4_ = 0.20000714;
    auVar135._12_4_ = 0.20000714;
    auVar135._0_4_ = 0.20000714;
    auVar135._4_4_ = 0.20000714;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar135);
    local_658 = ::_ps_cephes_log_p7;
    local_9a0 = auVar22._0_8_;
    local_1e0 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_1d8 = uStack_998;
    local_1f0 = local_920;
    uStack_1e8 = uStack_918;
    local_200[0] = -0.24999994;
    local_200[1] = -0.24999994;
    afStack_1f8[0] = -0.24999994;
    afStack_1f8[1] = -0.24999994;
    auVar136._8_4_ = -0.24999994;
    auVar136._12_4_ = -0.24999994;
    auVar136._0_4_ = -0.24999994;
    auVar136._4_4_ = -0.24999994;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar136);
    local_670 = ::_ps_cephes_log_p8;
    local_9a0 = auVar22._0_8_;
    local_1b0 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_1a8 = uStack_998;
    local_1c0 = local_920;
    uStack_1b8 = uStack_918;
    local_1d0[0] = 0.3333333;
    local_1d0[1] = 0.3333333;
    afStack_1c8[0] = 0.3333333;
    afStack_1c8[1] = 0.3333333;
    auVar137._8_4_ = 0.3333333;
    auVar137._12_4_ = 0.3333333;
    auVar137._0_4_ = 0.3333333;
    auVar137._4_4_ = 0.3333333;
    auVar22 = vfmadd213ps_fma(_local_920,auVar22,auVar137);
    local_9a0 = auVar22._0_8_;
    uVar27 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uVar28 = uStack_998;
    local_850 = local_920;
    uStack_848 = uStack_918;
    local_840._0_4_ = auVar22._0_4_;
    local_840._4_4_ = auVar22._4_4_;
    uStack_838._0_4_ = auVar22._8_4_;
    uStack_838._4_4_ = auVar22._12_4_;
    local_9a0._4_4_ = local_840._4_4_ * (float)local_920._4_4_;
    local_9a0._0_4_ = (float)local_840 * (float)local_920._0_4_;
    uStack_998._0_4_ = (float)uStack_838 * (float)uStack_8d8;
    uStack_998._4_4_ = uStack_838._4_4_ * uStack_8d8._4_4_;
    local_860 = local_9a0;
    uStack_858 = uStack_998;
    local_870 = CONCAT44(fStack_98c,local_990);
    uStack_868 = CONCAT44(fStack_984,fStack_988);
    local_9a0._4_4_ = local_840._4_4_ * (float)local_920._4_4_ * fStack_98c;
    local_9a0._0_4_ = (float)local_840 * (float)local_920._0_4_ * local_990;
    uStack_998._0_4_ = (float)uStack_838 * (float)uStack_8d8 * fStack_988;
    uStack_998._4_4_ = uStack_838._4_4_ * uStack_8d8._4_4_ * fStack_984;
    local_690 = local_960;
    local_680 = ::_ps_cephes_log_q1;
    local_180 = local_960;
    uStack_178 = uStack_958;
    local_190[0] = -0.00021219444;
    local_190[1] = -0.00021219444;
    afStack_188[0] = -0.00021219444;
    afStack_188[1] = -0.00021219444;
    local_1a0 = local_9a0;
    uStack_198 = uStack_998;
    auVar138._8_4_ = -0.00021219444;
    auVar138._12_4_ = -0.00021219444;
    auVar138._0_4_ = -0.00021219444;
    auVar138._4_4_ = -0.00021219444;
    auVar22 = vfmadd213ps_fma(auVar138,_local_960,_local_9a0);
    local_6d8 = &local_990;
    local_6e0 = ::_ps_0p5;
    local_450 = CONCAT44(fStack_98c,local_990);
    uStack_448 = CONCAT44(fStack_984,fStack_988);
    auVar144._4_4_ = fStack_98c;
    auVar144._0_4_ = local_990;
    auVar144._8_4_ = fStack_988;
    auVar144._12_4_ = fStack_984;
    local_460[0] = 0.5;
    local_460[1] = 0.5;
    afStack_458[0] = 0.5;
    afStack_458[1] = 0.5;
    local_9a0 = auVar22._0_8_;
    local_470 = local_9a0;
    uStack_998 = auVar22._8_8_;
    uStack_468 = uStack_998;
    auVar124._8_4_ = 0.5;
    auVar124._12_4_ = 0.5;
    auVar124._0_4_ = 0.5;
    auVar124._4_4_ = 0.5;
    _local_9a0 = vfnmadd213ps_fma(auVar124,auVar144,auVar22);
    local_900 = local_920;
    uStack_8f8 = uStack_918;
    local_910._0_4_ = local_9a0._0_4_;
    local_910._4_4_ = local_9a0._4_4_;
    uStack_908._0_4_ = local_9a0._8_4_;
    uStack_908._4_4_ = local_9a0._12_4_;
    local_920._4_4_ = (float)local_920._4_4_ + local_910._4_4_;
    local_920._0_4_ = (float)local_920._0_4_ + (float)local_910;
    uStack_918._0_4_ = (float)uStack_8d8 + (float)uStack_908;
    uStack_918._4_4_ = uStack_8d8._4_4_ + uStack_908._4_4_;
    local_698 = ::_ps_cephes_log_q2;
    local_150 = local_960;
    uStack_148 = uStack_958;
    local_160[0] = 0.6933594;
    local_160[1] = 0.6933594;
    afStack_158[0] = 0.6933594;
    afStack_158[1] = 0.6933594;
    local_170 = local_920;
    uStack_168 = uStack_918;
    auVar139._8_4_ = 0.6933594;
    auVar139._12_4_ = 0.6933594;
    auVar139._0_4_ = 0.6933594;
    auVar139._4_4_ = 0.6933594;
    auVar22 = vfmadd213ps_fma(auVar139,_local_960,_local_920);
    local_920 = auVar22._0_8_;
    local_e0 = local_920;
    uStack_918 = auVar22._8_8_;
    uStack_d8 = uStack_918;
    local_f0 = local_950._0_8_;
    uStack_e8 = local_950._8_8_;
    _local_920 = vpor_avx(auVar22,local_950);
    local_b30._0_4_ = (float)local_46f0;
    local_b30._4_4_ = (float)((ulong)local_46f0 >> 0x20);
    uStack_b28._0_4_ = (float)uStack_46e8;
    uStack_b28._4_4_ = (float)((ulong)uStack_46e8 >> 0x20);
    local_b40._0_4_ = local_920._0_4_;
    local_b40._4_4_ = local_920._4_4_;
    uStack_b38._0_4_ = local_920._8_4_;
    uStack_b38._4_4_ = local_920._12_4_;
    local_ab0._4_4_ = local_b30._4_4_ * local_b40._4_4_;
    local_ab0._0_4_ = (float)local_b30 * (float)local_b40;
    uStack_aa8._0_4_ = (float)uStack_b28 * (float)uStack_b38;
    uStack_aa8._4_4_ = uStack_b28._4_4_ * uStack_b38._4_4_;
    local_7e0 = (undefined1  [16])0x0;
    local_af0 = 0x3f800000;
    uStack_aec = 0x3f800000;
    uStack_ae8 = 0x3f800000;
    uStack_ae4 = 0x3f800000;
    local_9b0 = local_ab0;
    uStack_9a8 = uStack_aa8;
    local_9c0 = 0x42b0c0a5;
    uStack_9bc = 0x42b0c0a5;
    uStack_9b8 = 0x42b0c0a5;
    uStack_9b4 = 0x42b0c0a5;
    auVar17._8_8_ = uStack_aa8;
    auVar17._0_8_ = local_ab0;
    auVar22._8_4_ = 0x42b0c0a5;
    auVar22._0_8_ = 0x42b0c0a542b0c0a5;
    auVar22._12_4_ = 0x42b0c0a5;
    auVar22 = vminps_avx(auVar17,auVar22);
    local_ab0 = auVar22._0_8_;
    local_9d0 = local_ab0;
    uStack_aa8 = auVar22._8_8_;
    uStack_9c8 = uStack_aa8;
    local_9e0 = 0xc2b0c0a5;
    uStack_9dc = 0xc2b0c0a5;
    uStack_9d8 = 0xc2b0c0a5;
    uStack_9d4 = 0xc2b0c0a5;
    auVar23._8_4_ = 0xc2b0c0a5;
    auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
    auVar23._12_4_ = 0xc2b0c0a5;
    auVar17 = vmaxps_avx(auVar22,auVar23);
    local_ab0 = auVar17._0_8_;
    uVar29 = local_ab0;
    uStack_aa8 = auVar17._8_8_;
    uVar30 = uStack_aa8;
    local_a00 = 0x3fb8aa3b;
    uStack_9fc = 0x3fb8aa3b;
    uStack_9f8 = 0x3fb8aa3b;
    uStack_9f4 = 0x3fb8aa3b;
    local_9f0._0_4_ = auVar17._0_4_;
    local_9f0._4_4_ = auVar17._4_4_;
    uStack_9e8._0_4_ = auVar17._8_4_;
    uStack_9e8._4_4_ = auVar17._12_4_;
    local_ad0._4_4_ = local_9f0._4_4_ * 1.442695;
    local_ad0._0_4_ = (float)local_9f0 * 1.442695;
    uStack_ac8._0_4_ = (float)uStack_9e8 * 1.442695;
    uStack_ac8._4_4_ = uStack_9e8._4_4_ * 1.442695;
    local_a70 = local_ad0;
    uStack_a68 = uStack_ac8;
    local_a80 = 0x3f000000;
    uStack_a7c = 0x3f000000;
    uStack_a78 = 0x3f000000;
    uStack_a74 = 0x3f000000;
    local_ad0._0_4_ = (float)local_9f0 * 1.442695 + 0.5;
    local_ad0._4_4_ = local_9f0._4_4_ * 1.442695 + 0.5;
    fVar158 = (float)uStack_9e8 * 1.442695 + 0.5;
    fVar159 = uStack_9e8._4_4_ * 1.442695 + 0.5;
    uStack_ac8._0_4_ = fVar158;
    uStack_ac8._4_4_ = fVar159;
    local_7c0 = local_ad0;
    uStack_7b8 = uStack_ac8;
    local_ae0._4_4_ = (int)(float)local_ad0._4_4_;
    local_ae0._0_4_ = (int)(float)local_ad0._0_4_;
    local_ae0._8_4_ = (int)fVar158;
    local_ae0._12_4_ = (int)fVar159;
    local_7a0 = local_ae0._0_8_;
    uStack_798 = local_ae0._8_8_;
    auVar115._8_8_ = local_ae0._8_8_;
    auVar115._0_8_ = local_ae0._0_8_;
    auVar23 = vcvtdq2ps_avx(auVar115);
    local_ac0 = auVar23._0_8_;
    local_780 = local_ac0;
    uStack_ab8 = auVar23._8_8_;
    uStack_778 = uStack_ab8;
    local_790 = local_ad0;
    uStack_788 = uStack_ac8;
    auVar116._8_8_ = uStack_ac8;
    auVar116._0_8_ = local_ad0;
    auVar22 = vcmpps_avx(auVar116,auVar23,1);
    local_b00._0_8_ = auVar22._0_8_;
    local_700 = local_b00._0_8_;
    local_b00._8_8_ = auVar22._8_8_;
    uStack_6f8 = local_b00._8_8_;
    local_710 = 0x3f8000003f800000;
    uStack_708 = 0x3f8000003f800000;
    auVar119._8_8_ = 0x3f8000003f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    local_b00 = vpand_avx(auVar22,auVar119);
    local_a50 = local_ac0;
    uStack_a48 = uStack_ab8;
    local_a60 = local_b00._0_8_;
    uStack_a58 = local_b00._8_8_;
    _local_ad0 = vsubps_avx(auVar23,local_b00);
    local_6c0 = local_ad0;
    local_6b0 = ::_ps_cephes_exp_C1;
    local_6d0 = local_ab0;
    local_4b0 = local_ad0;
    uStack_4a8 = uStack_ac8;
    local_4c0[0] = 0.6933594;
    local_4c0[1] = 0.6933594;
    afStack_4b8[0] = 0.6933594;
    afStack_4b8[1] = 0.6933594;
    local_4d0 = local_ab0;
    uStack_4c8 = uStack_aa8;
    auVar122._8_4_ = 0.6933594;
    auVar122._12_4_ = 0.6933594;
    auVar122._0_4_ = 0.6933594;
    auVar122._4_4_ = 0.6933594;
    auVar22 = vfnmadd213ps_fma(auVar122,_local_ad0,auVar17);
    local_6c8 = ::_ps_cephes_exp_C2;
    local_480 = local_ad0;
    uStack_478 = uStack_ac8;
    local_490[0] = -0.00021219444;
    local_490[1] = -0.00021219444;
    afStack_488[0] = -0.00021219444;
    afStack_488[1] = -0.00021219444;
    local_ab0 = auVar22._0_8_;
    local_4a0 = local_ab0;
    uStack_aa8 = auVar22._8_8_;
    uStack_498 = uStack_aa8;
    auVar123._8_4_ = -0.00021219444;
    auVar123._12_4_ = -0.00021219444;
    auVar123._0_4_ = -0.00021219444;
    auVar123._4_4_ = -0.00021219444;
    _local_ab0 = vfnmadd213ps_fma(auVar123,_local_ad0,auVar22);
    local_a20 = local_ab0;
    uStack_a18 = uStack_aa8;
    local_a10._0_4_ = local_ab0._0_4_;
    local_a10._4_4_ = local_ab0._4_4_;
    uStack_a08._0_4_ = local_ab0._8_4_;
    uStack_a08._4_4_ = local_ab0._12_4_;
    local_ac0._4_4_ = local_a10._4_4_ * local_a10._4_4_;
    local_ac0._0_4_ = (float)local_a10 * (float)local_a10;
    uStack_ab8._0_4_ = (float)uStack_a08 * (float)uStack_a08;
    uStack_ab8._4_4_ = uStack_a08._4_4_ * uStack_a08._4_4_;
    uStack_b08._0_4_ = 0x39506967;
    local_b10 = (undefined1  [8])0x3950696739506967;
    uStack_b08._4_4_ = 0x39506967;
    local_5a0 = local_b10;
    local_538 = ::_ps_cephes_exp_p1;
    local_420 = 0x3950696739506967;
    uStack_418 = uStack_b08;
    local_430 = local_ab0;
    uStack_428 = uStack_aa8;
    local_440[0] = 0.0013981999;
    local_440[1] = 0.0013981999;
    afStack_438[0] = 0.0013981999;
    afStack_438[1] = 0.0013981999;
    auVar125._8_4_ = 0.0013981999;
    auVar125._12_4_ = 0.0013981999;
    auVar125._0_4_ = 0.0013981999;
    auVar125._4_4_ = 0.0013981999;
    auVar22 = vfmadd213ps_fma(_local_ab0,_local_b10,auVar125);
    local_550 = ::_ps_cephes_exp_p2;
    local_b10 = auVar22._0_8_;
    local_3f0 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uStack_3e8 = uStack_b08;
    local_400 = local_ab0;
    uStack_3f8 = uStack_aa8;
    local_410[0] = 0.008333452;
    local_410[1] = 0.008333452;
    afStack_408[0] = 0.008333452;
    afStack_408[1] = 0.008333452;
    auVar126._8_4_ = 0.008333452;
    auVar126._12_4_ = 0.008333452;
    auVar126._0_4_ = 0.008333452;
    auVar126._4_4_ = 0.008333452;
    auVar22 = vfmadd213ps_fma(_local_ab0,auVar22,auVar126);
    local_568 = ::_ps_cephes_exp_p3;
    local_b10 = auVar22._0_8_;
    local_3c0 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uStack_3b8 = uStack_b08;
    local_3d0 = local_ab0;
    uStack_3c8 = uStack_aa8;
    local_3e0[0] = 0.041665796;
    local_3e0[1] = 0.041665796;
    afStack_3d8[0] = 0.041665796;
    afStack_3d8[1] = 0.041665796;
    auVar127._8_4_ = 0.041665796;
    auVar127._12_4_ = 0.041665796;
    auVar127._0_4_ = 0.041665796;
    auVar127._4_4_ = 0.041665796;
    auVar22 = vfmadd213ps_fma(_local_ab0,auVar22,auVar127);
    local_580 = ::_ps_cephes_exp_p4;
    local_b10 = auVar22._0_8_;
    local_390 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uStack_388 = uStack_b08;
    local_3a0 = local_ab0;
    uStack_398 = uStack_aa8;
    local_3b0[0] = 0.16666666;
    local_3b0[1] = 0.16666666;
    afStack_3a8[0] = 0.16666666;
    afStack_3a8[1] = 0.16666666;
    auVar128._8_4_ = 0.16666666;
    auVar128._12_4_ = 0.16666666;
    auVar128._0_4_ = 0.16666666;
    auVar128._4_4_ = 0.16666666;
    auVar22 = vfmadd213ps_fma(_local_ab0,auVar22,auVar128);
    local_598 = ::_ps_cephes_exp_p5;
    local_b10 = auVar22._0_8_;
    local_360 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uStack_358 = uStack_b08;
    local_370 = local_ab0;
    uStack_368 = uStack_aa8;
    local_380[0] = 0.5;
    local_380[1] = 0.5;
    afStack_378[0] = 0.5;
    afStack_378[1] = 0.5;
    auVar129._8_4_ = 0.5;
    auVar129._12_4_ = 0.5;
    auVar129._0_4_ = 0.5;
    auVar129._4_4_ = 0.5;
    auVar22 = vfmadd213ps_fma(_local_ab0,auVar22,auVar129);
    local_5a8 = local_ac0;
    local_b10 = auVar22._0_8_;
    local_330 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uStack_328 = uStack_b08;
    local_340 = local_ac0;
    uStack_338 = uStack_ab8;
    local_350 = local_ab0;
    uStack_348 = uStack_aa8;
    auVar22 = vfmadd213ps_fma(_local_ac0,auVar22,_local_ab0);
    local_b10 = auVar22._0_8_;
    uVar31 = local_b10;
    uStack_b08 = auVar22._8_8_;
    uVar32 = uStack_b08;
    local_aa0 = 0x3f8000003f800000;
    uStack_a98 = 0x3f8000003f800000;
    local_a90._0_4_ = auVar22._0_4_;
    local_a90._4_4_ = auVar22._4_4_;
    uStack_a88._0_4_ = auVar22._8_4_;
    uStack_a88._4_4_ = auVar22._12_4_;
    local_b10._4_4_ = local_a90._4_4_ + 1.0;
    local_b10._0_4_ = (float)local_a90 + 1.0;
    uStack_b08._0_4_ = (float)uStack_a88 + 1.0;
    uStack_b08._4_4_ = uStack_a88._4_4_ + 1.0;
    local_7d0._0_4_ = local_ad0._0_4_;
    local_7d0._4_4_ = local_ad0._4_4_;
    uStack_7c8._0_4_ = local_ad0._8_4_;
    uStack_7c8._4_4_ = local_ad0._12_4_;
    local_ae0._4_4_ = (int)local_7d0._4_4_;
    local_ae0._0_4_ = (int)(float)local_7d0;
    local_ae0._8_4_ = (int)(float)uStack_7c8;
    local_ae0._12_4_ = (int)uStack_7c8._4_4_;
    local_510 = local_ae0._0_8_;
    uStack_508 = local_ae0._8_8_;
    local_520 = 0x7f0000007f;
    uStack_518 = 0x7f0000007f;
    auVar121._8_8_ = local_ae0._8_8_;
    auVar121._0_8_ = local_ae0._0_8_;
    auVar120._8_8_ = 0x7f0000007f;
    auVar120._0_8_ = 0x7f0000007f;
    auVar22 = vpaddd_avx(auVar121,auVar120);
    local_ae0._0_8_ = auVar22._0_8_;
    local_4f0 = local_ae0._0_8_;
    local_ae0._8_8_ = auVar22._8_8_;
    uStack_4e8 = local_ae0._8_8_;
    local_4f4 = 0x17;
    local_ae0 = vpslld_avx(auVar22,ZEXT416(0x17));
    local_4e0 = local_ae0._0_8_;
    uStack_4d8 = local_ae0._8_8_;
    local_b20 = local_ae0._0_8_;
    uStack_b18 = local_ae0._8_8_;
    local_a30 = local_b10;
    uStack_a28 = uStack_b08;
    local_a40._0_4_ = local_ae0._0_4_;
    local_a40._4_4_ = local_ae0._4_4_;
    uStack_a38._0_4_ = local_ae0._8_4_;
    uStack_a38._4_4_ = local_ae0._12_4_;
    local_b10._4_4_ = (local_a90._4_4_ + 1.0) * local_a40._4_4_;
    local_b10._0_4_ = ((float)local_a90 + 1.0) * (float)local_a40;
    uStack_b08._0_4_ = ((float)uStack_a88 + 1.0) * (float)uStack_a38;
    uStack_b08._4_4_ = (uStack_a88._4_4_ + 1.0) * uStack_a38._4_4_;
    local_4478 = local_4568;
    local_4490 = local_b10;
    uStack_4488 = uStack_b08;
    *(undefined1 (*) [8])local_4568 = local_b10;
    *(undefined8 *)(local_4568 + 2) = uStack_b08;
    local_4560 = (undefined1 (*) [64])(*local_4560 + 0x10);
    local_4568 = local_4568 + 4;
    local_b50 = local_46d0;
    uStack_b48 = uStack_46c8;
    local_b40 = local_920;
    uStack_b38 = uStack_918;
    local_b30 = local_b60;
    uStack_b28 = uStack_b58;
    local_a90 = uVar31;
    uStack_a88 = uVar32;
    local_a40 = local_ae0._0_8_;
    uStack_a38 = local_ae0._8_8_;
    local_a10 = local_a20;
    uStack_a08 = uStack_a18;
    local_9f0 = uVar29;
    uStack_9e8 = uVar30;
    local_910 = local_9a0;
    uStack_908 = uStack_998;
    local_8f0 = local_980._0_8_;
    uStack_8e8 = local_980._8_8_;
    local_8e0 = uVar25;
    uStack_8d8 = uVar26;
    local_8c0 = uVar21;
    uStack_8b8 = uVar24;
    local_840 = uVar27;
    uStack_838 = uVar28;
    local_820 = local_830;
    uStack_818 = uStack_828;
    local_800 = local_46d0;
    uStack_7f8 = uStack_46c8;
    local_7d0 = local_ad0;
    uStack_7c8 = uStack_ac8;
    local_6b8 = local_6d0;
    local_6a8 = local_6c0;
    local_688 = local_6e8;
    local_678 = local_690;
    local_668 = local_6a0;
    local_660 = local_6e8;
    local_650 = local_6a0;
    local_648 = local_6e8;
    local_638 = local_6a0;
    local_630 = local_6e8;
    local_620 = local_6a0;
    local_618 = local_6e8;
    local_608 = local_6a0;
    local_600 = local_6e8;
    local_5f0 = local_6a0;
    local_5e8 = local_6e8;
    local_5d8 = local_6a0;
    local_5d0 = local_6e8;
    local_5c0 = local_6a0;
    local_5b8 = local_6e8;
    local_5b0 = local_6d0;
    local_590 = local_6d0;
    local_588 = local_5a0;
    local_578 = local_6d0;
    local_570 = local_5a0;
    local_560 = local_6d0;
    local_558 = local_5a0;
    local_548 = local_6d0;
    local_540 = local_5a0;
    local_530 = local_6d0;
    local_528 = local_5a0;
    local_130 = local_46d0;
    uStack_128 = uStack_46c8;
  }
  for (; local_457c < local_456c; local_457c = local_457c + 1) {
    local_58 = local_4571;
    local_60 = &local_4578;
    local_68 = local_4560;
    fVar158 = powf(*(float *)*local_4560,local_4578);
    *local_4568 = fVar158;
    local_4560 = (undefined1 (*) [64])(*local_4560 + 4);
    local_4568 = local_4568 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_a(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float a = *ptr;

    int i = 0;
#if __SSE2__
    __m128 _a_128 = (elempack == 4) ? _mm_loadu_ps(ptr) : _mm_set1_ps(a);
#if __AVX__
    __m256 _a_256 = (elempack == 8) ? _mm256_loadu_ps(ptr) : _mm256_insertf128_ps(_mm256_castps128_ps256(_a_128), _a_128, 1);
#if __AVX512F__
    __m512 _a_512 = (elempack == 16) ? _mm512_loadu_ps(ptr) : _mm512_insertf32x8(_mm512_castps256_ps512(_a_256), _a_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _b = _mm512_loadu_ps(ptr1);
        __m512 _outp = op.func_pack16(_a_512, _b);
        _mm512_storeu_ps(outptr, _outp);
        ptr1 += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _b = _mm256_loadu_ps(ptr1);
        __m256 _outp = op.func_pack8(_a_256, _b);
        _mm256_storeu_ps(outptr, _outp);
        ptr1 += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _b = _mm_loadu_ps(ptr1);
        __m128 _outp = op.func_pack4(_a_128, _b);
        _mm_storeu_ps(outptr, _outp);
        ptr1 += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(a, *ptr1);
        ptr1 += 1;
        outptr += 1;
    }
}